

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  RTCFilterFunctionN p_Var22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  ulong uVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  uint uVar105;
  ulong uVar106;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar107;
  uint uVar108;
  uint uVar109;
  uint uVar110;
  long lVar111;
  ulong uVar112;
  byte bVar113;
  bool bVar114;
  byte bVar115;
  float fVar116;
  float fVar144;
  float fVar145;
  __m128 a;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar147;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar146;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar174;
  float fVar179;
  float fVar185;
  float fVar188;
  float fVar190;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar175;
  float fVar176;
  float fVar182;
  undefined1 auVar163 [32];
  float fVar177;
  float fVar180;
  float fVar183;
  float fVar186;
  undefined1 auVar164 [32];
  float fVar178;
  float fVar181;
  float fVar184;
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar192;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar218;
  float fVar222;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar208 [16];
  undefined1 auVar215 [32];
  float fVar223;
  float fVar245;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar243;
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar249;
  float fVar269;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar266;
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar257 [32];
  float fVar268;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar273;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [28];
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar292;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar305;
  undefined1 auVar296 [28];
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar306;
  undefined1 auVar307 [16];
  undefined1 auVar308 [28];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar318;
  float fVar321;
  float fVar322;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar327 [32];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  float s;
  float fVar332;
  float fVar340;
  float fVar341;
  undefined1 auVar333 [16];
  float fVar345;
  float fVar348;
  float fVar351;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar355;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar370;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [64];
  float fVar371;
  float fVar372;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar381;
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar383;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar390 [16];
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar397;
  float fVar400;
  float fVar408;
  float fVar411;
  float fVar414;
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar398;
  float fVar399;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar409;
  float fVar410;
  float fVar412;
  float fVar413;
  float fVar415;
  float fVar416;
  float fVar417;
  undefined1 auVar396 [32];
  undefined1 auVar420 [16];
  float fVar418;
  float fVar419;
  float fVar427;
  float fVar428;
  float fVar432;
  float fVar433;
  float fVar434;
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar426 [32];
  undefined1 auVar435 [16];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float fVar441;
  float fVar442;
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [8];
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  RTCHitN local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  uint local_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  uint uStack_7a0;
  uint uStack_79c;
  uint uStack_798;
  uint uStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar17 = prim[1];
  uVar106 = (ulong)(byte)PVar17;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 10)));
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 10)));
  lVar107 = uVar106 * 0x25;
  auVar199 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 6)));
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 10)));
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar17 * 0x10 + 6)));
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar17 * 0x10 + 10)));
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x11 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x11 + 10)));
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar31 = vsubps_avx(auVar31,*(undefined1 (*) [16])(prim + lVar107 + 6));
  fVar223 = *(float *)(prim + lVar107 + 0x12);
  local_bb0._4_4_ = fVar223 * auVar31._4_4_;
  local_bb0._0_4_ = fVar223 * auVar31._0_4_;
  fStack_ba8 = fVar223 * auVar31._8_4_;
  fStack_ba4 = fVar223 * auVar31._12_4_;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 6)));
  auVar333._0_4_ = fVar223 * auVar32._0_4_;
  auVar333._4_4_ = fVar223 * auVar32._4_4_;
  auVar333._8_4_ = fVar223 * auVar32._8_4_;
  auVar333._12_4_ = fVar223 * auVar32._12_4_;
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 10)));
  auVar356._16_16_ = auVar35;
  auVar356._0_16_ = auVar34;
  auVar128._16_16_ = auVar36;
  auVar128._0_16_ = auVar150;
  auVar257._16_16_ = auVar38;
  auVar257._0_16_ = auVar37;
  auVar237._16_16_ = auVar252;
  auVar237._0_16_ = auVar199;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 10)));
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 10)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar23 = vcvtdq2ps_avx(auVar257);
  auVar309._16_16_ = auVar194;
  auVar309._0_16_ = auVar227;
  auVar24 = vcvtdq2ps_avx(auVar309);
  auVar310._16_16_ = auVar196;
  auVar310._0_16_ = auVar120;
  auVar25 = vcvtdq2ps_avx(auVar310);
  auVar391._16_16_ = auVar32;
  auVar391._0_16_ = auVar31;
  auVar421._16_16_ = auVar35;
  auVar421._0_16_ = auVar34;
  auVar323._16_16_ = auVar36;
  auVar323._0_16_ = auVar150;
  auVar31 = vshufps_avx(auVar333,auVar333,0x55);
  auVar34 = vshufps_avx(auVar333,auVar333,0xaa);
  fVar176 = auVar34._0_4_;
  fVar245 = auVar34._4_4_;
  fVar288 = auVar34._8_4_;
  fVar268 = auVar34._12_4_;
  fVar286 = auVar31._0_4_;
  fVar185 = auVar31._4_4_;
  fVar244 = auVar31._8_4_;
  fVar287 = auVar31._12_4_;
  auVar26 = vcvtdq2ps_avx(auVar356);
  auVar27 = vcvtdq2ps_avx(auVar237);
  auVar28 = vcvtdq2ps_avx(auVar391);
  auVar29 = vcvtdq2ps_avx(auVar421);
  auVar30 = vcvtdq2ps_avx(auVar323);
  auVar31 = vshufps_avx(auVar333,auVar333,0);
  fVar223 = auVar31._0_4_;
  fVar273 = auVar31._4_4_;
  fVar175 = auVar31._8_4_;
  fVar243 = auVar31._12_4_;
  auVar436._0_4_ = fVar223 * auVar26._0_4_ + fVar286 * auVar128._0_4_ + fVar176 * auVar23._0_4_;
  auVar436._4_4_ = fVar273 * auVar26._4_4_ + fVar185 * auVar128._4_4_ + fVar245 * auVar23._4_4_;
  auVar436._8_4_ = fVar175 * auVar26._8_4_ + fVar244 * auVar128._8_4_ + fVar288 * auVar23._8_4_;
  auVar436._12_4_ = fVar243 * auVar26._12_4_ + fVar287 * auVar128._12_4_ + fVar268 * auVar23._12_4_;
  auVar436._16_4_ = fVar223 * auVar26._16_4_ + fVar286 * auVar128._16_4_ + fVar176 * auVar23._16_4_;
  auVar436._20_4_ = fVar273 * auVar26._20_4_ + fVar185 * auVar128._20_4_ + fVar245 * auVar23._20_4_;
  auVar436._24_4_ = fVar175 * auVar26._24_4_ + fVar244 * auVar128._24_4_ + fVar288 * auVar23._24_4_;
  auVar436._28_4_ = auVar35._12_4_ + 0.0;
  auVar422._0_4_ = fVar223 * auVar27._0_4_ + fVar286 * auVar24._0_4_ + fVar176 * auVar25._0_4_;
  auVar422._4_4_ = fVar273 * auVar27._4_4_ + fVar185 * auVar24._4_4_ + fVar245 * auVar25._4_4_;
  auVar422._8_4_ = fVar175 * auVar27._8_4_ + fVar244 * auVar24._8_4_ + fVar288 * auVar25._8_4_;
  auVar422._12_4_ = fVar243 * auVar27._12_4_ + fVar287 * auVar24._12_4_ + fVar268 * auVar25._12_4_;
  auVar422._16_4_ = fVar223 * auVar27._16_4_ + fVar286 * auVar24._16_4_ + fVar176 * auVar25._16_4_;
  auVar422._20_4_ = fVar273 * auVar27._20_4_ + fVar185 * auVar24._20_4_ + fVar245 * auVar25._20_4_;
  auVar422._24_4_ = fVar175 * auVar27._24_4_ + fVar244 * auVar24._24_4_ + fVar288 * auVar25._24_4_;
  auVar422._28_4_ = 0;
  auVar392._0_4_ = fVar286 * auVar29._0_4_ + fVar176 * auVar30._0_4_ + fVar223 * auVar28._0_4_;
  auVar392._4_4_ = fVar185 * auVar29._4_4_ + fVar245 * auVar30._4_4_ + fVar273 * auVar28._4_4_;
  auVar392._8_4_ = fVar244 * auVar29._8_4_ + fVar288 * auVar30._8_4_ + fVar175 * auVar28._8_4_;
  auVar392._12_4_ = fVar287 * auVar29._12_4_ + fVar268 * auVar30._12_4_ + fVar243 * auVar28._12_4_;
  auVar392._16_4_ = fVar286 * auVar29._16_4_ + fVar176 * auVar30._16_4_ + fVar223 * auVar28._16_4_;
  auVar392._20_4_ = fVar185 * auVar29._20_4_ + fVar245 * auVar30._20_4_ + fVar273 * auVar28._20_4_;
  auVar392._24_4_ = fVar244 * auVar29._24_4_ + fVar288 * auVar30._24_4_ + fVar175 * auVar28._24_4_;
  auVar392._28_4_ = auVar35._12_4_ + auVar32._12_4_ + 0.0;
  auVar31 = vshufps_avx(_local_bb0,_local_bb0,0x55);
  auVar32 = vshufps_avx(_local_bb0,_local_bb0,0xaa);
  fVar286 = auVar32._0_4_;
  fVar185 = auVar32._4_4_;
  fVar244 = auVar32._8_4_;
  fVar287 = auVar32._12_4_;
  fVar223 = auVar31._0_4_;
  fVar273 = auVar31._4_4_;
  fVar175 = auVar31._8_4_;
  fVar243 = auVar31._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  _local_a20 = ZEXT1632(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar106 * 7 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 0xe);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar150 = vshufps_avx(_local_bb0,_local_bb0,0);
  fVar176 = auVar150._0_4_;
  fVar245 = auVar150._4_4_;
  fVar288 = auVar150._8_4_;
  fVar246 = auVar150._12_4_;
  auVar160._0_4_ = fVar176 * auVar26._0_4_ + auVar128._0_4_ * fVar223 + fVar286 * auVar23._0_4_;
  auVar160._4_4_ = fVar245 * auVar26._4_4_ + auVar128._4_4_ * fVar273 + fVar185 * auVar23._4_4_;
  auVar160._8_4_ = fVar288 * auVar26._8_4_ + auVar128._8_4_ * fVar175 + fVar244 * auVar23._8_4_;
  auVar160._12_4_ = fVar246 * auVar26._12_4_ + auVar128._12_4_ * fVar243 + fVar287 * auVar23._12_4_;
  auVar160._16_4_ = fVar176 * auVar26._16_4_ + auVar128._16_4_ * fVar223 + fVar286 * auVar23._16_4_;
  auVar160._20_4_ = fVar245 * auVar26._20_4_ + auVar128._20_4_ * fVar273 + fVar185 * auVar23._20_4_;
  auVar160._24_4_ = fVar288 * auVar26._24_4_ + auVar128._24_4_ * fVar175 + fVar244 * auVar23._24_4_;
  auVar160._28_4_ = fVar243 + auVar25._28_4_ + auVar23._28_4_;
  auVar129._0_4_ = fVar223 * auVar24._0_4_ + fVar286 * auVar25._0_4_ + fVar176 * auVar27._0_4_;
  auVar129._4_4_ = fVar273 * auVar24._4_4_ + fVar185 * auVar25._4_4_ + fVar245 * auVar27._4_4_;
  auVar129._8_4_ = fVar175 * auVar24._8_4_ + fVar244 * auVar25._8_4_ + fVar288 * auVar27._8_4_;
  auVar129._12_4_ = fVar243 * auVar24._12_4_ + fVar287 * auVar25._12_4_ + fVar246 * auVar27._12_4_;
  auVar129._16_4_ = fVar223 * auVar24._16_4_ + fVar286 * auVar25._16_4_ + fVar176 * auVar27._16_4_;
  auVar129._20_4_ = fVar273 * auVar24._20_4_ + fVar185 * auVar25._20_4_ + fVar245 * auVar27._20_4_;
  auVar129._24_4_ = fVar175 * auVar24._24_4_ + fVar244 * auVar25._24_4_ + fVar288 * auVar27._24_4_;
  auVar129._28_4_ = auVar30._28_4_ + fVar268 + fVar243;
  auVar375._8_4_ = 0x7fffffff;
  auVar375._0_8_ = 0x7fffffff7fffffff;
  auVar375._12_4_ = 0x7fffffff;
  auVar375._16_4_ = 0x7fffffff;
  auVar375._20_4_ = 0x7fffffff;
  auVar375._24_4_ = 0x7fffffff;
  auVar375._28_4_ = 0x7fffffff;
  auVar439._8_4_ = 0x219392ef;
  auVar439._0_8_ = 0x219392ef219392ef;
  auVar439._12_4_ = 0x219392ef;
  auVar439._16_4_ = 0x219392ef;
  auVar439._20_4_ = 0x219392ef;
  auVar439._24_4_ = 0x219392ef;
  auVar439._28_4_ = 0x219392ef;
  auVar128 = vandps_avx(auVar436,auVar375);
  auVar128 = vcmpps_avx(auVar128,auVar439,1);
  auVar23 = vblendvps_avx(auVar436,auVar439,auVar128);
  auVar128 = vandps_avx(auVar422,auVar375);
  auVar128 = vcmpps_avx(auVar128,auVar439,1);
  auVar24 = vblendvps_avx(auVar422,auVar439,auVar128);
  auVar128 = vandps_avx(auVar392,auVar375);
  auVar128 = vcmpps_avx(auVar128,auVar439,1);
  auVar128 = vblendvps_avx(auVar392,auVar439,auVar128);
  auVar209._0_4_ = fVar176 * auVar28._0_4_ + auVar29._0_4_ * fVar223 + auVar30._0_4_ * fVar286;
  auVar209._4_4_ = fVar245 * auVar28._4_4_ + auVar29._4_4_ * fVar273 + auVar30._4_4_ * fVar185;
  auVar209._8_4_ = fVar288 * auVar28._8_4_ + auVar29._8_4_ * fVar175 + auVar30._8_4_ * fVar244;
  auVar209._12_4_ = fVar246 * auVar28._12_4_ + auVar29._12_4_ * fVar243 + auVar30._12_4_ * fVar287;
  auVar209._16_4_ = fVar176 * auVar28._16_4_ + auVar29._16_4_ * fVar223 + auVar30._16_4_ * fVar286;
  auVar209._20_4_ = fVar245 * auVar28._20_4_ + auVar29._20_4_ * fVar273 + auVar30._20_4_ * fVar185;
  auVar209._24_4_ = fVar288 * auVar28._24_4_ + auVar29._24_4_ * fVar175 + auVar30._24_4_ * fVar244;
  auVar209._28_4_ = auVar28._28_4_ + fVar243 + fVar287;
  auVar25 = vrcpps_avx(auVar23);
  fVar223 = auVar25._0_4_;
  fVar243 = auVar25._4_4_;
  auVar26._4_4_ = auVar23._4_4_ * fVar243;
  auVar26._0_4_ = auVar23._0_4_ * fVar223;
  fVar244 = auVar25._8_4_;
  auVar26._8_4_ = auVar23._8_4_ * fVar244;
  fVar245 = auVar25._12_4_;
  auVar26._12_4_ = auVar23._12_4_ * fVar245;
  fVar246 = auVar25._16_4_;
  auVar26._16_4_ = auVar23._16_4_ * fVar246;
  fVar247 = auVar25._20_4_;
  auVar26._20_4_ = auVar23._20_4_ * fVar247;
  fVar248 = auVar25._24_4_;
  auVar26._24_4_ = auVar23._24_4_ * fVar248;
  auVar26._28_4_ = auVar23._28_4_;
  auVar423._8_4_ = 0x3f800000;
  auVar423._0_8_ = 0x3f8000003f800000;
  auVar423._12_4_ = 0x3f800000;
  auVar423._16_4_ = 0x3f800000;
  auVar423._20_4_ = 0x3f800000;
  auVar423._24_4_ = 0x3f800000;
  auVar423._28_4_ = 0x3f800000;
  auVar27 = vsubps_avx(auVar423,auVar26);
  auVar26 = vrcpps_avx(auVar24);
  fVar223 = fVar223 + fVar223 * auVar27._0_4_;
  fVar243 = fVar243 + fVar243 * auVar27._4_4_;
  fVar244 = fVar244 + fVar244 * auVar27._8_4_;
  fVar245 = fVar245 + fVar245 * auVar27._12_4_;
  fVar246 = fVar246 + fVar246 * auVar27._16_4_;
  fVar247 = fVar247 + fVar247 * auVar27._20_4_;
  fVar248 = fVar248 + fVar248 * auVar27._24_4_;
  fVar249 = auVar26._0_4_;
  fVar266 = auVar26._4_4_;
  auVar23._4_4_ = fVar266 * auVar24._4_4_;
  auVar23._0_4_ = fVar249 * auVar24._0_4_;
  fVar267 = auVar26._8_4_;
  auVar23._8_4_ = fVar267 * auVar24._8_4_;
  fVar269 = auVar26._12_4_;
  auVar23._12_4_ = fVar269 * auVar24._12_4_;
  fVar270 = auVar26._16_4_;
  auVar23._16_4_ = fVar270 * auVar24._16_4_;
  fVar271 = auVar26._20_4_;
  auVar23._20_4_ = fVar271 * auVar24._20_4_;
  fVar272 = auVar26._24_4_;
  auVar23._24_4_ = fVar272 * auVar24._24_4_;
  auVar23._28_4_ = auVar27._28_4_;
  auVar24 = vsubps_avx(auVar423,auVar23);
  fVar249 = fVar249 + fVar249 * auVar24._0_4_;
  fVar266 = fVar266 + fVar266 * auVar24._4_4_;
  fVar267 = fVar267 + fVar267 * auVar24._8_4_;
  fVar269 = fVar269 + fVar269 * auVar24._12_4_;
  fVar270 = fVar270 + fVar270 * auVar24._16_4_;
  fVar271 = fVar271 + fVar271 * auVar24._20_4_;
  fVar272 = fVar272 + fVar272 * auVar24._24_4_;
  auVar23 = vrcpps_avx(auVar128);
  fVar273 = auVar23._0_4_;
  fVar286 = auVar23._4_4_;
  auVar28._4_4_ = auVar128._4_4_ * fVar286;
  auVar28._0_4_ = auVar128._0_4_ * fVar273;
  fVar287 = auVar23._8_4_;
  auVar28._8_4_ = auVar128._8_4_ * fVar287;
  fVar288 = auVar23._12_4_;
  auVar28._12_4_ = auVar128._12_4_ * fVar288;
  fVar289 = auVar23._16_4_;
  auVar28._16_4_ = auVar128._16_4_ * fVar289;
  fVar290 = auVar23._20_4_;
  auVar28._20_4_ = auVar128._20_4_ * fVar290;
  fVar291 = auVar23._24_4_;
  auVar28._24_4_ = auVar128._24_4_ * fVar291;
  auVar28._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar423,auVar28);
  fVar273 = auVar128._0_4_ * fVar273 + fVar273;
  fVar286 = auVar128._4_4_ * fVar286 + fVar286;
  fVar287 = auVar128._8_4_ * fVar287 + fVar287;
  fVar288 = auVar128._12_4_ * fVar288 + fVar288;
  fVar289 = auVar128._16_4_ * fVar289 + fVar289;
  fVar290 = auVar128._20_4_ * fVar290 + fVar290;
  fVar291 = auVar128._24_4_ * fVar291 + fVar291;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar106 * 9 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar37 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar107 + 0x16)) *
                                        *(float *)(prim + lVar107 + 0x1a))),0);
  auVar311._16_16_ = auVar32;
  auVar311._0_16_ = auVar31;
  auVar128 = vcvtdq2ps_avx(auVar311);
  auVar324._16_16_ = auVar35;
  auVar324._0_16_ = auVar34;
  auVar23 = vcvtdq2ps_avx(auVar324);
  auVar23 = vsubps_avx(auVar23,auVar128);
  fVar175 = auVar37._0_4_;
  fVar185 = auVar37._4_4_;
  fVar176 = auVar37._8_4_;
  fVar268 = auVar37._12_4_;
  auVar312._0_4_ = auVar23._0_4_ * fVar175 + auVar128._0_4_;
  auVar312._4_4_ = auVar23._4_4_ * fVar185 + auVar128._4_4_;
  auVar312._8_4_ = auVar23._8_4_ * fVar176 + auVar128._8_4_;
  auVar312._12_4_ = auVar23._12_4_ * fVar268 + auVar128._12_4_;
  auVar312._16_4_ = auVar23._16_4_ * fVar175 + auVar128._16_4_;
  auVar312._20_4_ = auVar23._20_4_ * fVar185 + auVar128._20_4_;
  auVar312._24_4_ = auVar23._24_4_ * fVar176 + auVar128._24_4_;
  auVar312._28_4_ = auVar23._28_4_ + auVar128._28_4_;
  auVar325._16_16_ = auVar36;
  auVar325._0_16_ = auVar150;
  auVar128 = vcvtdq2ps_avx(auVar325);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 6);
  auVar31 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 0xe);
  auVar32 = vpmovsxwd_avx(auVar38);
  auVar334._16_16_ = auVar32;
  auVar334._0_16_ = auVar31;
  auVar23 = vcvtdq2ps_avx(auVar334);
  auVar23 = vsubps_avx(auVar23,auVar128);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 6);
  auVar31 = vpmovsxwd_avx(auVar199);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar252);
  auVar326._0_4_ = auVar128._0_4_ + auVar23._0_4_ * fVar175;
  auVar326._4_4_ = auVar128._4_4_ + auVar23._4_4_ * fVar185;
  auVar326._8_4_ = auVar128._8_4_ + auVar23._8_4_ * fVar176;
  auVar326._12_4_ = auVar128._12_4_ + auVar23._12_4_ * fVar268;
  auVar326._16_4_ = auVar128._16_4_ + auVar23._16_4_ * fVar175;
  auVar326._20_4_ = auVar128._20_4_ + auVar23._20_4_ * fVar185;
  auVar326._24_4_ = auVar128._24_4_ + auVar23._24_4_ * fVar176;
  auVar326._28_4_ = auVar128._28_4_ + auVar23._28_4_;
  auVar335._16_16_ = auVar32;
  auVar335._0_16_ = auVar31;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar106 * 0x16 + 6);
  auVar31 = vpmovsxwd_avx(auVar227);
  auVar128 = vcvtdq2ps_avx(auVar335);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar106 * 0x16 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar194);
  auVar357._16_16_ = auVar32;
  auVar357._0_16_ = auVar31;
  auVar23 = vcvtdq2ps_avx(auVar357);
  auVar23 = vsubps_avx(auVar23,auVar128);
  auVar336._0_4_ = auVar128._0_4_ + auVar23._0_4_ * fVar175;
  auVar336._4_4_ = auVar128._4_4_ + auVar23._4_4_ * fVar185;
  auVar336._8_4_ = auVar128._8_4_ + auVar23._8_4_ * fVar176;
  auVar336._12_4_ = auVar128._12_4_ + auVar23._12_4_ * fVar268;
  auVar336._16_4_ = auVar128._16_4_ + auVar23._16_4_ * fVar175;
  auVar336._20_4_ = auVar128._20_4_ + auVar23._20_4_ * fVar185;
  auVar336._24_4_ = auVar128._24_4_ + auVar23._24_4_ * fVar176;
  auVar336._28_4_ = auVar128._28_4_ + auVar23._28_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar106 * 0x14 + 6);
  auVar31 = vpmovsxwd_avx(auVar120);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar106 * 0x14 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar196);
  auVar358._16_16_ = auVar32;
  auVar358._0_16_ = auVar31;
  auVar128 = vcvtdq2ps_avx(auVar358);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 6);
  auVar31 = vpmovsxwd_avx(auVar152);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar9);
  auVar376._16_16_ = auVar32;
  auVar376._0_16_ = auVar31;
  auVar23 = vcvtdq2ps_avx(auVar376);
  auVar23 = vsubps_avx(auVar23,auVar128);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 6);
  auVar31 = vpmovsxwd_avx(auVar10);
  auVar359._0_4_ = auVar128._0_4_ + auVar23._0_4_ * fVar175;
  auVar359._4_4_ = auVar128._4_4_ + auVar23._4_4_ * fVar185;
  auVar359._8_4_ = auVar128._8_4_ + auVar23._8_4_ * fVar176;
  auVar359._12_4_ = auVar128._12_4_ + auVar23._12_4_ * fVar268;
  auVar359._16_4_ = auVar128._16_4_ + auVar23._16_4_ * fVar175;
  auVar359._20_4_ = auVar128._20_4_ + auVar23._20_4_ * fVar185;
  auVar359._24_4_ = auVar128._24_4_ + auVar23._24_4_ * fVar176;
  auVar359._28_4_ = auVar128._28_4_ + auVar23._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 0xe);
  auVar32 = vpmovsxwd_avx(auVar11);
  auVar377._16_16_ = auVar32;
  auVar377._0_16_ = auVar31;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar106 * 0x21 + 6);
  auVar31 = vpmovsxwd_avx(auVar155);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar106 * 0x21 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar12);
  auVar393._16_16_ = auVar32;
  auVar393._0_16_ = auVar31;
  auVar128 = vcvtdq2ps_avx(auVar377);
  auVar23 = vcvtdq2ps_avx(auVar393);
  auVar23 = vsubps_avx(auVar23,auVar128);
  auVar378._0_4_ = auVar128._0_4_ + auVar23._0_4_ * fVar175;
  auVar378._4_4_ = auVar128._4_4_ + auVar23._4_4_ * fVar185;
  auVar378._8_4_ = auVar128._8_4_ + auVar23._8_4_ * fVar176;
  auVar378._12_4_ = auVar128._12_4_ + auVar23._12_4_ * fVar268;
  auVar378._16_4_ = auVar128._16_4_ + auVar23._16_4_ * fVar175;
  auVar378._20_4_ = auVar128._20_4_ + auVar23._20_4_ * fVar185;
  auVar378._24_4_ = auVar128._24_4_ + auVar23._24_4_ * fVar176;
  auVar378._28_4_ = auVar128._28_4_ + auVar23._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar106 * 0x1f + 6);
  auVar31 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar106 * 0x1f + 0xe);
  auVar32 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 6);
  auVar34 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar16);
  auVar394._16_16_ = auVar32;
  auVar394._0_16_ = auVar31;
  auVar424._16_16_ = auVar35;
  auVar424._0_16_ = auVar34;
  auVar128 = vcvtdq2ps_avx(auVar394);
  auVar23 = vcvtdq2ps_avx(auVar424);
  auVar23 = vsubps_avx(auVar23,auVar128);
  auVar395._0_4_ = auVar128._0_4_ + auVar23._0_4_ * fVar175;
  auVar395._4_4_ = auVar128._4_4_ + auVar23._4_4_ * fVar185;
  auVar395._8_4_ = auVar128._8_4_ + auVar23._8_4_ * fVar176;
  auVar395._12_4_ = auVar128._12_4_ + auVar23._12_4_ * fVar268;
  auVar395._16_4_ = auVar128._16_4_ + auVar23._16_4_ * fVar175;
  auVar395._20_4_ = auVar128._20_4_ + auVar23._20_4_ * fVar185;
  auVar395._24_4_ = auVar128._24_4_ + auVar23._24_4_ * fVar176;
  auVar395._28_4_ = auVar128._28_4_ + fVar268;
  auVar128 = vsubps_avx(auVar312,auVar160);
  auVar293._0_4_ = fVar223 * auVar128._0_4_;
  auVar293._4_4_ = fVar243 * auVar128._4_4_;
  auVar293._8_4_ = fVar244 * auVar128._8_4_;
  auVar293._12_4_ = fVar245 * auVar128._12_4_;
  auVar29._16_4_ = fVar246 * auVar128._16_4_;
  auVar29._0_16_ = auVar293;
  auVar29._20_4_ = fVar247 * auVar128._20_4_;
  auVar29._24_4_ = fVar248 * auVar128._24_4_;
  auVar29._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar326,auVar160);
  auVar224._0_4_ = fVar223 * auVar128._0_4_;
  auVar224._4_4_ = fVar243 * auVar128._4_4_;
  auVar224._8_4_ = fVar244 * auVar128._8_4_;
  auVar224._12_4_ = fVar245 * auVar128._12_4_;
  auVar30._16_4_ = fVar246 * auVar128._16_4_;
  auVar30._0_16_ = auVar224;
  auVar30._20_4_ = fVar247 * auVar128._20_4_;
  auVar30._24_4_ = fVar248 * auVar128._24_4_;
  auVar30._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  auVar128 = vsubps_avx(auVar336,auVar129);
  auVar148._0_4_ = fVar249 * auVar128._0_4_;
  auVar148._4_4_ = fVar266 * auVar128._4_4_;
  auVar148._8_4_ = fVar267 * auVar128._8_4_;
  auVar148._12_4_ = fVar269 * auVar128._12_4_;
  auVar25._16_4_ = fVar270 * auVar128._16_4_;
  auVar25._0_16_ = auVar148;
  auVar25._20_4_ = fVar271 * auVar128._20_4_;
  auVar25._24_4_ = fVar272 * auVar128._24_4_;
  auVar25._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar359,auVar129);
  auVar250._0_4_ = fVar249 * auVar128._0_4_;
  auVar250._4_4_ = fVar266 * auVar128._4_4_;
  auVar250._8_4_ = fVar267 * auVar128._8_4_;
  auVar250._12_4_ = fVar269 * auVar128._12_4_;
  auVar27._16_4_ = fVar270 * auVar128._16_4_;
  auVar27._0_16_ = auVar250;
  auVar27._20_4_ = fVar271 * auVar128._20_4_;
  auVar27._24_4_ = fVar272 * auVar128._24_4_;
  auVar27._28_4_ = auVar26._28_4_ + auVar24._28_4_;
  auVar128 = vsubps_avx(auVar378,auVar209);
  auVar117._0_4_ = fVar273 * auVar128._0_4_;
  auVar117._4_4_ = fVar286 * auVar128._4_4_;
  auVar117._8_4_ = fVar287 * auVar128._8_4_;
  auVar117._12_4_ = fVar288 * auVar128._12_4_;
  auVar24._16_4_ = fVar289 * auVar128._16_4_;
  auVar24._0_16_ = auVar117;
  auVar24._20_4_ = fVar290 * auVar128._20_4_;
  auVar24._24_4_ = fVar291 * auVar128._24_4_;
  auVar24._28_4_ = auVar128._28_4_;
  auVar128 = vsubps_avx(auVar395,auVar209);
  auVar193._0_4_ = fVar273 * auVar128._0_4_;
  auVar193._4_4_ = fVar286 * auVar128._4_4_;
  auVar193._8_4_ = fVar287 * auVar128._8_4_;
  auVar193._12_4_ = fVar288 * auVar128._12_4_;
  auVar39._16_4_ = fVar289 * auVar128._16_4_;
  auVar39._0_16_ = auVar193;
  auVar39._20_4_ = fVar290 * auVar128._20_4_;
  auVar39._24_4_ = fVar291 * auVar128._24_4_;
  auVar39._28_4_ = auVar128._28_4_;
  auVar31 = vpminsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar32 = vpminsd_avx(auVar293,auVar224);
  auVar327._16_16_ = auVar31;
  auVar327._0_16_ = auVar32;
  auVar31 = vpminsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar32 = vpminsd_avx(auVar148,auVar250);
  auVar337._16_16_ = auVar31;
  auVar337._0_16_ = auVar32;
  auVar128 = vmaxps_avx(auVar327,auVar337);
  auVar31 = vpminsd_avx(auVar24._16_16_,auVar39._16_16_);
  auVar32 = vpminsd_avx(auVar117,auVar193);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar440._4_4_ = uVar8;
  auVar440._0_4_ = uVar8;
  auVar440._8_4_ = uVar8;
  auVar440._12_4_ = uVar8;
  auVar440._16_4_ = uVar8;
  auVar440._20_4_ = uVar8;
  auVar440._24_4_ = uVar8;
  auVar440._28_4_ = uVar8;
  auVar425._16_16_ = auVar31;
  auVar425._0_16_ = auVar32;
  auVar23 = vmaxps_avx(auVar425,auVar440);
  auVar128 = vmaxps_avx(auVar128,auVar23);
  local_380._4_4_ = auVar128._4_4_ * 0.99999964;
  local_380._0_4_ = auVar128._0_4_ * 0.99999964;
  local_380._8_4_ = auVar128._8_4_ * 0.99999964;
  local_380._12_4_ = auVar128._12_4_ * 0.99999964;
  local_380._16_4_ = auVar128._16_4_ * 0.99999964;
  local_380._20_4_ = auVar128._20_4_ * 0.99999964;
  local_380._24_4_ = auVar128._24_4_ * 0.99999964;
  local_380._28_4_ = auVar128._28_4_;
  auVar31 = vpmaxsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar32 = vpmaxsd_avx(auVar293,auVar224);
  auVar238._16_16_ = auVar31;
  auVar238._0_16_ = auVar32;
  auVar31 = vpmaxsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar32 = vpmaxsd_avx(auVar148,auVar250);
  auVar161._16_16_ = auVar31;
  auVar161._0_16_ = auVar32;
  auVar128 = vminps_avx(auVar238,auVar161);
  auVar31 = vpmaxsd_avx(auVar24._16_16_,auVar39._16_16_);
  auVar32 = vpmaxsd_avx(auVar117,auVar193);
  auVar130._16_16_ = auVar31;
  auVar130._0_16_ = auVar32;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar210._4_4_ = uVar8;
  auVar210._0_4_ = uVar8;
  auVar210._8_4_ = uVar8;
  auVar210._12_4_ = uVar8;
  auVar210._16_4_ = uVar8;
  auVar210._20_4_ = uVar8;
  auVar210._24_4_ = uVar8;
  auVar210._28_4_ = uVar8;
  auVar23 = vminps_avx(auVar130,auVar210);
  auVar128 = vminps_avx(auVar128,auVar23);
  auVar40._4_4_ = auVar128._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar128._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar128._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar128._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar128._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar128._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar128._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar128._28_4_;
  auVar128 = vcmpps_avx(local_380,auVar40,2);
  auVar31 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar162._16_16_ = auVar31;
  auVar162._0_16_ = auVar31;
  auVar23 = vcvtdq2ps_avx(auVar162);
  auVar23 = vcmpps_avx(_DAT_01f7b060,auVar23,1);
  auVar128 = vandps_avx(auVar128,auVar23);
  uVar110 = vmovmskps_avx(auVar128);
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_5e0 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
  local_8d0 = prim;
LAB_00b35e02:
  local_8c8 = (ulong)uVar110;
  if (local_8c8 == 0) {
LAB_00b38b2b:
    return local_8c8 != 0;
  }
  lVar107 = 0;
  if (local_8c8 != 0) {
    for (; (uVar110 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
    }
  }
  uVar110 = *(uint *)(local_8d0 + 2);
  pGVar18 = (context->scene->geometries).items[uVar110].ptr;
  uVar106 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                            (ulong)*(uint *)(local_8d0 + lVar107 * 4 + 6) *
                            pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar223 = (pGVar18->time_range).lower;
  fVar223 = pGVar18->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar223) / ((pGVar18->time_range).upper - fVar223));
  auVar31 = vroundss_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),9);
  auVar31 = vminss_avx(auVar31,ZEXT416((uint)(pGVar18->fnumTimeSegments + -1.0)));
  auVar31 = vmaxss_avx(ZEXT816(0) << 0x20,auVar31);
  fVar223 = fVar223 - auVar31._0_4_;
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar111 = (long)(int)auVar31._0_4_ * 0x38;
  lVar20 = *(long *)(_Var19 + lVar111);
  lVar21 = *(long *)(_Var19 + 0x10 + lVar111);
  auVar31 = vshufps_avx(ZEXT416((uint)(1.0 - fVar223)),ZEXT416((uint)(1.0 - fVar223)),0);
  pfVar1 = (float *)(lVar20 + lVar21 * uVar106);
  fVar286 = auVar31._0_4_;
  fVar185 = auVar31._4_4_;
  fVar244 = auVar31._8_4_;
  fVar287 = auVar31._12_4_;
  pfVar2 = (float *)(lVar20 + lVar21 * (uVar106 + 1));
  pfVar3 = (float *)(lVar20 + lVar21 * (uVar106 + 2));
  pfVar4 = (float *)(lVar20 + lVar21 * (uVar106 + 3));
  lVar20 = *(long *)(_Var19 + 0x38 + lVar111);
  lVar21 = *(long *)(_Var19 + 0x48 + lVar111);
  auVar31 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
  pfVar5 = (float *)(lVar20 + uVar106 * lVar21);
  fVar176 = auVar31._0_4_;
  fVar245 = auVar31._4_4_;
  fVar288 = auVar31._8_4_;
  fVar268 = auVar31._12_4_;
  pfVar6 = (float *)(lVar20 + (uVar106 + 1) * lVar21);
  pfVar7 = (float *)(lVar20 + (uVar106 + 2) * lVar21);
  auVar251._0_4_ = fVar176 * *pfVar5 + fVar286 * *pfVar1;
  auVar251._4_4_ = fVar245 * pfVar5[1] + fVar185 * pfVar1[1];
  auVar251._8_4_ = fVar288 * pfVar5[2] + fVar244 * pfVar1[2];
  auVar251._12_4_ = fVar268 * pfVar5[3] + fVar287 * pfVar1[3];
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar32 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar330 = ZEXT1664(auVar32);
  fVar223 = *(float *)(ray + k * 4 + 0x40);
  auVar390._4_4_ = fVar223;
  auVar390._0_4_ = fVar223;
  auVar390._8_4_ = fVar223;
  auVar390._12_4_ = fVar223;
  fStack_710 = fVar223;
  _local_720 = auVar390;
  fStack_70c = fVar223;
  fStack_708 = fVar223;
  fStack_704 = fVar223;
  fVar273 = *(float *)(ray + k * 4 + 0x50);
  auVar420._4_4_ = fVar273;
  auVar420._0_4_ = fVar273;
  auVar420._8_4_ = fVar273;
  auVar420._12_4_ = fVar273;
  fStack_750 = fVar273;
  _local_760 = auVar420;
  fStack_74c = fVar273;
  fStack_748 = fVar273;
  fStack_744 = fVar273;
  auVar274._0_4_ = fVar286 * *pfVar2 + fVar176 * *pfVar6;
  auVar274._4_4_ = fVar185 * pfVar2[1] + fVar245 * pfVar6[1];
  auVar274._8_4_ = fVar244 * pfVar2[2] + fVar288 * pfVar6[2];
  auVar274._12_4_ = fVar287 * pfVar2[3] + fVar268 * pfVar6[3];
  auVar31 = vunpcklps_avx(auVar390,auVar420);
  fVar175 = *(float *)(ray + k * 4 + 0x60);
  auVar435._4_4_ = fVar175;
  auVar435._0_4_ = fVar175;
  auVar435._8_4_ = fVar175;
  auVar435._12_4_ = fVar175;
  fStack_730 = fVar175;
  _local_740 = auVar435;
  fStack_72c = fVar175;
  fStack_728 = fVar175;
  fStack_724 = fVar175;
  _local_950 = vinsertps_avx(auVar31,auVar435,0x28);
  auVar363 = ZEXT1664(_local_950);
  auVar118._0_4_ = (auVar251._0_4_ + auVar274._0_4_) * 0.5;
  auVar118._4_4_ = (auVar251._4_4_ + auVar274._4_4_) * 0.5;
  auVar118._8_4_ = (auVar251._8_4_ + auVar274._8_4_) * 0.5;
  auVar118._12_4_ = (auVar251._12_4_ + auVar274._12_4_) * 0.5;
  auVar31 = vsubps_avx(auVar118,auVar32);
  auVar31 = vdpps_avx(auVar31,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar225._0_4_ = fVar286 * *pfVar3 + fVar176 * *pfVar7;
  auVar225._4_4_ = fVar185 * pfVar3[1] + fVar245 * pfVar7[1];
  auVar225._8_4_ = fVar244 * pfVar3[2] + fVar288 * pfVar7[2];
  auVar225._12_4_ = fVar287 * pfVar3[3] + fVar268 * pfVar7[3];
  auVar34 = vrcpss_avx(local_960,local_960);
  fVar243 = auVar31._0_4_ * auVar34._0_4_ * (2.0 - local_960._0_4_ * auVar34._0_4_);
  auVar34 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
  auVar294._0_4_ = auVar32._0_4_ + local_950._0_4_ * auVar34._0_4_;
  auVar294._4_4_ = auVar32._4_4_ + local_950._4_4_ * auVar34._4_4_;
  auVar294._8_4_ = auVar32._8_4_ + local_950._8_4_ * auVar34._8_4_;
  auVar294._12_4_ = auVar32._12_4_ + local_950._12_4_ * auVar34._12_4_;
  auVar31 = vblendps_avx(auVar294,_DAT_01f45a50,8);
  auVar36 = vsubps_avx(auVar251,auVar31);
  auVar35 = vsubps_avx(auVar225,auVar31);
  pfVar1 = (float *)(lVar20 + lVar21 * (uVar106 + 3));
  auVar149._0_4_ = fVar286 * *pfVar4 + fVar176 * *pfVar1;
  auVar149._4_4_ = fVar185 * pfVar4[1] + fVar245 * pfVar1[1];
  auVar149._8_4_ = fVar244 * pfVar4[2] + fVar288 * pfVar1[2];
  auVar149._12_4_ = fVar287 * pfVar4[3] + fVar268 * pfVar1[3];
  auVar37 = vsubps_avx(auVar274,auVar31);
  auVar38 = vsubps_avx(auVar149,auVar31);
  auVar31 = vshufps_avx(auVar36,auVar36,0);
  register0x00001250 = auVar31;
  _local_4e0 = auVar31;
  auVar31 = vshufps_avx(auVar36,auVar36,0x55);
  register0x00001250 = auVar31;
  _local_1e0 = auVar31;
  auVar31 = vshufps_avx(auVar36,auVar36,0xaa);
  register0x00001250 = auVar31;
  _local_200 = auVar31;
  auVar31 = vshufps_avx(auVar36,auVar36,0xff);
  register0x00001290 = auVar31;
  _local_220 = auVar31;
  auVar31 = vshufps_avx(auVar37,auVar37,0);
  register0x00001290 = auVar31;
  _local_500 = auVar31;
  auVar31 = vshufps_avx(auVar37,auVar37,0x55);
  register0x00001290 = auVar31;
  _local_520 = auVar31;
  auVar31 = vshufps_avx(auVar37,auVar37,0xaa);
  register0x00001290 = auVar31;
  _local_540 = auVar31;
  auVar31 = vshufps_avx(auVar37,auVar37,0xff);
  register0x00001290 = auVar31;
  _local_240 = auVar31;
  auVar31 = vshufps_avx(auVar35,auVar35,0);
  auVar32 = vshufps_avx(auVar35,auVar35,0x55);
  register0x00001290 = auVar32;
  _local_560 = auVar32;
  auVar32 = vshufps_avx(auVar35,auVar35,0xaa);
  register0x00001290 = auVar32;
  _local_580 = auVar32;
  _local_a20 = auVar35;
  auVar32 = vshufps_avx(auVar35,auVar35,0xff);
  register0x00001290 = auVar32;
  _local_5a0 = auVar32;
  auVar32 = vshufps_avx(auVar38,auVar38,0);
  auVar35 = vshufps_avx(auVar38,auVar38,0x55);
  auVar150 = vshufps_avx(auVar38,auVar38,0xaa);
  register0x00001290 = auVar150;
  _local_5c0 = auVar150;
  auVar150 = vshufps_avx(auVar38,auVar38,0xff);
  register0x00001290 = auVar150;
  _local_260 = auVar150;
  auVar150 = ZEXT416((uint)(fVar223 * fVar223 + fVar273 * fVar273 + fVar175 * fVar175));
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  local_280._16_16_ = auVar150;
  local_280._0_16_ = auVar150;
  auVar265 = ZEXT3264(local_280);
  fVar223 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar243);
  auVar150 = vshufps_avx(ZEXT416((uint)(fVar223 - fVar243)),ZEXT416((uint)(fVar223 - fVar243)),0);
  local_360._16_16_ = auVar150;
  local_360._0_16_ = auVar150;
  local_830 = vpshufd_avx(ZEXT416(uVar110),0);
  local_840 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar107 * 4 + 6)),0);
  register0x00001210 = auVar34;
  _local_940 = auVar34;
  uVar108 = 0;
  bVar113 = 0;
  local_c88 = 1;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  local_600 = vandps_avx(local_280,auVar132);
  auVar34 = vsqrtss_avx(local_960,local_960);
  auVar150 = vsqrtss_avx(local_960,local_960);
  local_650 = ZEXT816(0x3f80000000000000);
  do {
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = 0x3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar279._16_4_ = 0x3f800000;
    auVar279._20_4_ = 0x3f800000;
    auVar279._24_4_ = 0x3f800000;
    auVar279._28_4_ = 0x3f800000;
    auVar199 = vmovshdup_avx(local_650);
    auVar227 = vsubps_avx(auVar199,local_650);
    auVar199 = vshufps_avx(local_650,local_650,0);
    local_a00._16_16_ = auVar199;
    local_a00._0_16_ = auVar199;
    auVar252 = vshufps_avx(auVar227,auVar227,0);
    local_860._16_16_ = auVar252;
    local_860._0_16_ = auVar252;
    fVar146 = auVar252._0_4_;
    fVar174 = auVar252._4_4_;
    fVar179 = auVar252._8_4_;
    fVar182 = auVar252._12_4_;
    fVar116 = auVar199._0_4_;
    auVar239._0_4_ = fVar116 + fVar146 * 0.0;
    fVar144 = auVar199._4_4_;
    auVar239._4_4_ = fVar144 + fVar174 * 0.14285715;
    fVar145 = auVar199._8_4_;
    auVar239._8_4_ = fVar145 + fVar179 * 0.2857143;
    fStack_a24 = auVar199._12_4_;
    auVar239._12_4_ = fStack_a24 + fVar182 * 0.42857146;
    auVar239._16_4_ = fVar116 + fVar146 * 0.5714286;
    auVar239._20_4_ = fVar144 + fVar174 * 0.71428573;
    auVar239._24_4_ = fVar145 + fVar179 * 0.8571429;
    auVar239._28_4_ = fStack_a24 + fVar182;
    auVar128 = vsubps_avx(auVar279,auVar239);
    local_a40._4_4_ = auVar239._4_4_ * auVar239._4_4_;
    local_a40._0_4_ = auVar239._0_4_ * auVar239._0_4_;
    fStack_a38 = auVar239._8_4_ * auVar239._8_4_;
    fStack_a34 = auVar239._12_4_ * auVar239._12_4_;
    fStack_a30 = auVar239._16_4_ * auVar239._16_4_;
    fStack_a2c = auVar239._20_4_ * auVar239._20_4_;
    fStack_a28 = auVar239._24_4_ * auVar239._24_4_;
    fVar245 = auVar239._0_4_ * 3.0;
    fVar288 = auVar239._4_4_ * 3.0;
    fVar268 = auVar239._8_4_ * 3.0;
    fVar246 = auVar239._12_4_ * 3.0;
    fVar289 = auVar239._16_4_ * 3.0;
    fVar247 = auVar239._20_4_ * 3.0;
    fVar290 = auVar239._24_4_ * 3.0;
    fVar322 = auVar265._28_4_ + -5.0;
    fVar273 = auVar128._0_4_;
    auVar331._0_4_ = fVar273 * fVar273;
    fVar175 = auVar128._4_4_;
    auVar331._4_4_ = fVar175 * fVar175;
    fVar243 = auVar128._8_4_;
    auVar331._8_4_ = fVar243 * fVar243;
    fVar286 = auVar128._12_4_;
    auVar331._12_4_ = fVar286 * fVar286;
    fVar185 = auVar128._16_4_;
    auVar331._16_4_ = fVar185 * fVar185;
    fVar244 = auVar128._20_4_;
    auVar331._20_4_ = fVar244 * fVar244;
    fVar287 = auVar128._24_4_;
    auVar331._28_36_ = auVar330._28_36_;
    auVar331._24_4_ = fVar287 * fVar287;
    fVar176 = auVar128._28_4_;
    fVar248 = (auVar331._0_4_ * (fVar273 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar291 = (auVar331._4_4_ * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar249 = (auVar331._8_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar266 = (auVar331._12_4_ * (fVar286 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar267 = (auVar331._16_4_ * (fVar185 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar269 = (auVar331._20_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar270 = (auVar331._24_4_ * (fVar287 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar271 = -fVar273 * auVar239._0_4_ * auVar239._0_4_ * 0.5;
    fVar272 = -fVar175 * auVar239._4_4_ * auVar239._4_4_ * 0.5;
    fVar341 = -fVar243 * auVar239._8_4_ * auVar239._8_4_ * 0.5;
    fVar343 = -fVar286 * auVar239._12_4_ * auVar239._12_4_ * 0.5;
    fVar345 = -fVar185 * auVar239._16_4_ * auVar239._16_4_ * 0.5;
    fVar348 = -fVar244 * auVar239._20_4_ * auVar239._20_4_ * 0.5;
    fVar351 = -fVar287 * auVar239._24_4_ * auVar239._24_4_ * 0.5;
    fVar350 = auVar32._0_4_;
    fVar353 = auVar32._4_4_;
    fVar400 = auVar32._8_4_;
    fVar404 = auVar32._12_4_;
    fVar371 = auVar35._0_4_;
    fVar441 = auVar35._4_4_;
    fVar442 = auVar35._8_4_;
    fVar347 = auVar35._12_4_;
    fVar418 = auVar31._0_4_;
    fVar304 = auVar31._4_4_;
    fVar428 = auVar31._8_4_;
    fVar430 = auVar31._12_4_;
    fVar370 = auVar363._28_4_ + fVar430;
    fVar419 = (auVar239._0_4_ * auVar239._0_4_ * (fVar245 + -5.0) + 2.0) * 0.5;
    fVar427 = (auVar239._4_4_ * auVar239._4_4_ * (fVar288 + -5.0) + 2.0) * 0.5;
    fVar429 = (auVar239._8_4_ * auVar239._8_4_ * (fVar268 + -5.0) + 2.0) * 0.5;
    fVar431 = (auVar239._12_4_ * auVar239._12_4_ * (fVar246 + -5.0) + 2.0) * 0.5;
    fVar432 = (auVar239._16_4_ * auVar239._16_4_ * (fVar289 + -5.0) + 2.0) * 0.5;
    fVar433 = (auVar239._20_4_ * auVar239._20_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar434 = (auVar239._24_4_ * auVar239._24_4_ * (fVar290 + -5.0) + 2.0) * 0.5;
    fVar417 = -auVar239._28_4_;
    fVar387 = -auVar239._0_4_ * fVar273 * fVar273 * 0.5;
    fVar397 = -auVar239._4_4_ * fVar175 * fVar175 * 0.5;
    fVar401 = -auVar239._8_4_ * fVar243 * fVar243 * 0.5;
    fVar405 = -auVar239._12_4_ * fVar286 * fVar286 * 0.5;
    fVar408 = -auVar239._16_4_ * fVar185 * fVar185 * 0.5;
    fVar411 = -auVar239._20_4_ * fVar244 * fVar244 * 0.5;
    fVar414 = -auVar239._24_4_ * fVar287 * fVar287 * 0.5;
    fVar332 = fVar387 * (float)local_4e0._0_4_ +
              fVar419 * (float)local_500._0_4_ + fVar350 * fVar271 + fVar418 * fVar248;
    fVar340 = fVar397 * (float)local_4e0._4_4_ +
              fVar427 * (float)local_500._4_4_ + fVar353 * fVar272 + fVar304 * fVar291;
    fVar342 = fVar401 * fStack_4d8 + fVar429 * fStack_4f8 + fVar400 * fVar341 + fVar428 * fVar249;
    fVar344 = fVar405 * fStack_4d4 + fVar431 * fStack_4f4 + fVar404 * fVar343 + fVar430 * fVar266;
    fVar346 = fVar408 * fStack_4d0 + fVar432 * fStack_4f0 + fVar350 * fVar345 + fVar418 * fVar267;
    fVar349 = fVar411 * fStack_4cc + fVar433 * fStack_4ec + fVar353 * fVar348 + fVar304 * fVar269;
    fVar352 = fVar414 * fStack_4c8 + fVar434 * fStack_4e8 + fVar400 * fVar351 + fVar428 * fVar270;
    fVar354 = fVar430 + 2.0 + -fVar176 + fVar370;
    local_920 = (float)local_1e0._0_4_ * fVar387 +
                fVar419 * (float)local_520._0_4_ +
                fVar371 * fVar271 + fVar248 * (float)local_560._0_4_;
    fStack_91c = (float)local_1e0._4_4_ * fVar397 +
                 fVar427 * (float)local_520._4_4_ +
                 fVar441 * fVar272 + fVar291 * (float)local_560._4_4_;
    fStack_918 = fStack_1d8 * fVar401 +
                 fVar429 * fStack_518 + fVar442 * fVar341 + fVar249 * fStack_558;
    fStack_914 = fStack_1d4 * fVar405 +
                 fVar431 * fStack_514 + fVar347 * fVar343 + fVar266 * fStack_554;
    fStack_910 = fStack_1d0 * fVar408 +
                 fVar432 * fStack_510 + fVar371 * fVar345 + fVar267 * fStack_550;
    fStack_90c = fStack_1cc * fVar411 +
                 fVar433 * fStack_50c + fVar441 * fVar348 + fVar269 * fStack_54c;
    fStack_908 = fStack_1c8 * fVar414 +
                 fVar434 * fStack_508 + fVar442 * fVar351 + fVar270 * fStack_548;
    fStack_904 = fVar354 + fVar370 + fVar347 + fVar430;
    fVar192 = (float)local_200._0_4_ * fVar387 +
              fVar419 * (float)local_540._0_4_ +
              fVar271 * (float)local_5c0._0_4_ + fVar248 * (float)local_580._0_4_;
    fVar216 = (float)local_200._4_4_ * fVar397 +
              fVar427 * (float)local_540._4_4_ +
              fVar272 * (float)local_5c0._4_4_ + fVar291 * (float)local_580._4_4_;
    fVar217 = fStack_1f8 * fVar401 +
              fVar429 * fStack_538 + fVar341 * fStack_5b8 + fVar249 * fStack_578;
    fVar218 = fStack_1f4 * fVar405 +
              fVar431 * fStack_534 + fVar343 * fStack_5b4 + fVar266 * fStack_574;
    fVar219 = fStack_1f0 * fVar408 +
              fVar432 * fStack_530 + fVar345 * fStack_5b0 + fVar267 * fStack_570;
    fVar220 = fStack_1ec * fVar411 +
              fVar433 * fStack_52c + fVar348 * fStack_5ac + fVar269 * fStack_56c;
    fVar221 = fStack_1e8 * fVar414 +
              fVar434 * fStack_528 + fVar351 * fStack_5a8 + fVar270 * fStack_568;
    fVar222 = fStack_904 + fVar347 + fVar430 + fVar404 + fVar430;
    local_880._0_4_ =
         (float)local_220._0_4_ * fVar387 +
         (float)local_240._0_4_ * fVar419 +
         fVar271 * (float)local_260._0_4_ + fVar248 * (float)local_5a0._0_4_;
    local_880._4_4_ =
         (float)local_220._4_4_ * fVar397 +
         (float)local_240._4_4_ * fVar427 +
         fVar272 * (float)local_260._4_4_ + fVar291 * (float)local_5a0._4_4_;
    local_880._8_4_ =
         fStack_218 * fVar401 + fStack_238 * fVar429 + fVar341 * fStack_258 + fVar249 * fStack_598;
    local_880._12_4_ =
         fStack_214 * fVar405 + fStack_234 * fVar431 + fVar343 * fStack_254 + fVar266 * fStack_594;
    local_880._16_4_ =
         fStack_210 * fVar408 + fStack_230 * fVar432 + fVar345 * fStack_250 + fVar267 * fStack_590;
    local_880._20_4_ =
         fStack_20c * fVar411 + fStack_22c * fVar433 + fVar348 * fStack_24c + fVar269 * fStack_58c;
    local_880._24_4_ =
         fStack_208 * fVar414 + fStack_228 * fVar434 + fVar351 * fStack_248 + fVar270 * fStack_588;
    local_880._28_4_ = fStack_904 + fVar430 + 2.0 + -fVar176 + -3.0;
    auVar41._4_4_ = (fVar175 + fVar175) * auVar239._4_4_;
    auVar41._0_4_ = (fVar273 + fVar273) * auVar239._0_4_;
    auVar41._8_4_ = (fVar243 + fVar243) * auVar239._8_4_;
    auVar41._12_4_ = (fVar286 + fVar286) * auVar239._12_4_;
    auVar41._16_4_ = (fVar185 + fVar185) * auVar239._16_4_;
    auVar41._20_4_ = (fVar244 + fVar244) * auVar239._20_4_;
    auVar41._24_4_ = (fVar287 + fVar287) * auVar239._24_4_;
    auVar41._28_4_ = auVar239._28_4_ + auVar239._28_4_;
    auVar128 = vsubps_avx(auVar41,auVar331._0_32_);
    fVar272 = auVar265._28_4_ + 2.0;
    auVar42._4_4_ = (fVar175 + fVar175) * (fVar288 + 2.0);
    auVar42._0_4_ = (fVar273 + fVar273) * (fVar245 + 2.0);
    auVar42._8_4_ = (fVar243 + fVar243) * (fVar268 + 2.0);
    auVar42._12_4_ = (fVar286 + fVar286) * (fVar246 + 2.0);
    auVar42._16_4_ = (fVar185 + fVar185) * (fVar289 + 2.0);
    auVar42._20_4_ = (fVar244 + fVar244) * (fVar247 + 2.0);
    auVar42._24_4_ = (fVar287 + fVar287) * (fVar290 + 2.0);
    auVar42._28_4_ = fVar272;
    auVar43._4_4_ = fVar175 * fVar175 * 3.0;
    auVar43._0_4_ = fVar273 * fVar273 * 3.0;
    auVar43._8_4_ = fVar243 * fVar243 * 3.0;
    auVar43._12_4_ = fVar286 * fVar286 * 3.0;
    auVar43._16_4_ = fVar185 * fVar185 * 3.0;
    auVar43._20_4_ = fVar244 * fVar244 * 3.0;
    auVar43._24_4_ = fVar287 * fVar287 * 3.0;
    auVar43._28_4_ = fVar176;
    auVar23 = vsubps_avx(auVar42,auVar43);
    auVar24 = vsubps_avx(_local_a40,auVar41);
    fVar348 = auVar128._0_4_ * 0.5;
    fVar351 = auVar128._4_4_ * 0.5;
    fVar370 = auVar128._8_4_ * 0.5;
    fVar387 = auVar128._12_4_ * 0.5;
    fVar397 = auVar128._16_4_ * 0.5;
    fVar401 = auVar128._20_4_ * 0.5;
    fVar405 = auVar128._24_4_ * 0.5;
    fVar266 = (auVar239._0_4_ * fVar245 + (auVar239._0_4_ + auVar239._0_4_) * (fVar245 + -5.0)) *
              0.5;
    fVar267 = (auVar239._4_4_ * fVar288 + (auVar239._4_4_ + auVar239._4_4_) * (fVar288 + -5.0)) *
              0.5;
    fVar269 = (auVar239._8_4_ * fVar268 + (auVar239._8_4_ + auVar239._8_4_) * (fVar268 + -5.0)) *
              0.5;
    fVar270 = (auVar239._12_4_ * fVar246 + (auVar239._12_4_ + auVar239._12_4_) * (fVar246 + -5.0)) *
              0.5;
    fVar341 = (auVar239._16_4_ * fVar289 + (auVar239._16_4_ + auVar239._16_4_) * (fVar289 + -5.0)) *
              0.5;
    fVar343 = (auVar239._20_4_ * fVar247 + (auVar239._20_4_ + auVar239._20_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar345 = (auVar239._24_4_ * fVar290 + (auVar239._24_4_ + auVar239._24_4_) * (fVar290 + -5.0)) *
              0.5;
    fVar273 = auVar23._0_4_ * 0.5;
    fVar175 = auVar23._4_4_ * 0.5;
    fVar243 = auVar23._8_4_ * 0.5;
    fVar286 = auVar23._12_4_ * 0.5;
    fVar185 = auVar23._16_4_ * 0.5;
    fVar244 = auVar23._20_4_ * 0.5;
    fVar288 = auVar23._24_4_ * 0.5;
    fVar287 = auVar24._0_4_ * 0.5;
    fVar245 = auVar24._4_4_ * 0.5;
    fVar268 = auVar24._8_4_ * 0.5;
    fVar246 = auVar24._12_4_ * 0.5;
    fVar289 = auVar24._16_4_ * 0.5;
    fVar247 = auVar24._20_4_ * 0.5;
    fVar249 = auVar24._24_4_ * 0.5;
    fVar272 = fVar272 + auVar239._28_4_ + fVar322 + auVar23._28_4_ + auVar24._28_4_;
    auVar199 = vpermilps_avx(ZEXT416((uint)(auVar227._0_4_ * 0.04761905)),0);
    fVar248 = auVar199._0_4_;
    fVar306 = fVar248 * (fVar348 * (float)local_4e0._0_4_ +
                        fVar266 * (float)local_500._0_4_ + fVar273 * fVar418 + fVar287 * fVar350);
    fVar291 = auVar199._4_4_;
    fVar316 = fVar291 * (fVar351 * (float)local_4e0._4_4_ +
                        fVar267 * (float)local_500._4_4_ + fVar175 * fVar304 + fVar245 * fVar353);
    auVar44._4_4_ = fVar316;
    auVar44._0_4_ = fVar306;
    fVar271 = auVar199._8_4_;
    fVar317 = fVar271 * (fVar370 * fStack_4d8 +
                        fVar269 * fStack_4f8 + fVar243 * fVar428 + fVar268 * fVar400);
    auVar44._8_4_ = fVar317;
    fVar290 = auVar199._12_4_;
    fVar318 = fVar290 * (fVar387 * fStack_4d4 +
                        fVar270 * fStack_4f4 + fVar286 * fVar430 + fVar246 * fVar404);
    auVar44._12_4_ = fVar318;
    fVar319 = fVar248 * (fVar397 * fStack_4d0 +
                        fVar341 * fStack_4f0 + fVar185 * fVar418 + fVar289 * fVar350);
    auVar44._16_4_ = fVar319;
    fVar320 = fVar291 * (fVar401 * fStack_4cc +
                        fVar343 * fStack_4ec + fVar244 * fVar304 + fVar247 * fVar353);
    auVar44._20_4_ = fVar320;
    fVar321 = fVar271 * (fVar405 * fStack_4c8 +
                        fVar345 * fStack_4e8 + fVar288 * fVar428 + fVar249 * fVar400);
    auVar44._24_4_ = fVar321;
    auVar44._28_4_ = fVar176 + fVar176 + auVar128._28_4_ + fVar176 + fVar176 + fVar322;
    fVar372 = fVar248 * ((float)local_1e0._0_4_ * fVar348 +
                        fVar266 * (float)local_520._0_4_ +
                        fVar273 * (float)local_560._0_4_ + fVar287 * fVar371);
    fVar381 = fVar291 * ((float)local_1e0._4_4_ * fVar351 +
                        fVar267 * (float)local_520._4_4_ +
                        fVar175 * (float)local_560._4_4_ + fVar245 * fVar441);
    auVar45._4_4_ = fVar381;
    auVar45._0_4_ = fVar372;
    fVar382 = fVar271 * (fStack_1d8 * fVar370 +
                        fVar269 * fStack_518 + fVar243 * fStack_558 + fVar268 * fVar442);
    auVar45._8_4_ = fVar382;
    fVar383 = fVar290 * (fStack_1d4 * fVar387 +
                        fVar270 * fStack_514 + fVar286 * fStack_554 + fVar246 * fVar347);
    auVar45._12_4_ = fVar383;
    fVar384 = fVar248 * (fStack_1d0 * fVar397 +
                        fVar341 * fStack_510 + fVar185 * fStack_550 + fVar289 * fVar371);
    auVar45._16_4_ = fVar384;
    fVar385 = fVar291 * (fStack_1cc * fVar401 +
                        fVar343 * fStack_50c + fVar244 * fStack_54c + fVar247 * fVar441);
    auVar45._20_4_ = fVar385;
    fVar386 = fVar271 * (fStack_1c8 * fVar405 +
                        fVar345 * fStack_508 + fVar288 * fStack_548 + fVar249 * fVar442);
    auVar45._24_4_ = fVar386;
    auVar45._28_4_ = fStack_1e4;
    fVar388 = fVar248 * ((float)local_200._0_4_ * fVar348 +
                        fVar273 * (float)local_580._0_4_ + fVar287 * (float)local_5c0._0_4_ +
                        fVar266 * (float)local_540._0_4_);
    fVar398 = fVar291 * ((float)local_200._4_4_ * fVar351 +
                        fVar175 * (float)local_580._4_4_ + fVar245 * (float)local_5c0._4_4_ +
                        fVar267 * (float)local_540._4_4_);
    auVar46._4_4_ = fVar398;
    auVar46._0_4_ = fVar388;
    fVar402 = fVar271 * (fStack_1f8 * fVar370 +
                        fVar243 * fStack_578 + fVar268 * fStack_5b8 + fVar269 * fStack_538);
    auVar46._8_4_ = fVar402;
    fVar406 = fVar290 * (fStack_1f4 * fVar387 +
                        fVar286 * fStack_574 + fVar246 * fStack_5b4 + fVar270 * fStack_534);
    auVar46._12_4_ = fVar406;
    fVar409 = fVar248 * (fStack_1f0 * fVar397 +
                        fVar185 * fStack_570 + fVar289 * fStack_5b0 + fVar341 * fStack_530);
    auVar46._16_4_ = fVar409;
    fVar412 = fVar291 * (fStack_1ec * fVar401 +
                        fVar244 * fStack_56c + fVar247 * fStack_5ac + fVar343 * fStack_52c);
    auVar46._20_4_ = fVar412;
    fVar415 = fVar271 * (fStack_1e8 * fVar405 +
                        fVar288 * fStack_568 + fVar249 * fStack_5a8 + fVar345 * fStack_528);
    auVar46._24_4_ = fVar415;
    auVar46._28_4_ = fVar417;
    fVar287 = fVar248 * ((float)local_220._0_4_ * fVar348 +
                        (float)local_240._0_4_ * fVar266 +
                        fVar273 * (float)local_5a0._0_4_ + (float)local_260._0_4_ * fVar287);
    fVar176 = fVar291 * ((float)local_220._4_4_ * fVar351 +
                        (float)local_240._4_4_ * fVar267 +
                        fVar175 * (float)local_5a0._4_4_ + (float)local_260._4_4_ * fVar245);
    auVar47._4_4_ = fVar176;
    auVar47._0_4_ = fVar287;
    fVar245 = fVar271 * (fStack_218 * fVar370 +
                        fStack_238 * fVar269 + fVar243 * fStack_598 + fStack_258 * fVar268);
    auVar47._8_4_ = fVar245;
    fVar290 = fVar290 * (fStack_214 * fVar387 +
                        fStack_234 * fVar270 + fVar286 * fStack_594 + fStack_254 * fVar246);
    auVar47._12_4_ = fVar290;
    fVar248 = fVar248 * (fStack_210 * fVar397 +
                        fStack_230 * fVar341 + fVar185 * fStack_590 + fStack_250 * fVar289);
    auVar47._16_4_ = fVar248;
    fVar291 = fVar291 * (fStack_20c * fVar401 +
                        fStack_22c * fVar343 + fVar244 * fStack_58c + fStack_24c * fVar247);
    auVar47._20_4_ = fVar291;
    fVar271 = fVar271 * (fStack_208 * fVar405 +
                        fStack_228 * fVar345 + fVar288 * fStack_588 + fStack_248 * fVar249);
    auVar47._24_4_ = fVar271;
    auVar47._28_4_ = fVar272;
    auVar102._4_4_ = fStack_91c;
    auVar102._0_4_ = local_920;
    auVar102._8_4_ = fStack_918;
    auVar102._12_4_ = fStack_914;
    auVar102._16_4_ = fStack_910;
    auVar102._20_4_ = fStack_90c;
    auVar102._24_4_ = fStack_908;
    auVar102._28_4_ = fStack_904;
    auVar128 = vperm2f128_avx(auVar102,auVar102,1);
    auVar128 = vshufps_avx(auVar128,auVar102,0x30);
    auVar25 = vshufps_avx(auVar102,auVar128,0x29);
    auVar98._4_4_ = fVar216;
    auVar98._0_4_ = fVar192;
    auVar98._8_4_ = fVar217;
    auVar98._12_4_ = fVar218;
    auVar98._16_4_ = fVar219;
    auVar98._20_4_ = fVar220;
    auVar98._24_4_ = fVar221;
    auVar98._28_4_ = fVar222;
    auVar128 = vperm2f128_avx(auVar98,auVar98,1);
    auVar128 = vshufps_avx(auVar128,auVar98,0x30);
    auVar26 = vshufps_avx(auVar98,auVar128,0x29);
    auVar23 = vsubps_avx(local_880,auVar47);
    auVar128 = vperm2f128_avx(auVar23,auVar23,1);
    auVar128 = vshufps_avx(auVar128,auVar23,0x30);
    auVar27 = vshufps_avx(auVar23,auVar128,0x29);
    local_2a0 = vsubps_avx(auVar25,auVar102);
    auVar30 = vsubps_avx(auVar26,auVar98);
    fVar175 = local_2a0._0_4_;
    fVar288 = local_2a0._4_4_;
    auVar48._4_4_ = fVar398 * fVar288;
    auVar48._0_4_ = fVar388 * fVar175;
    fVar249 = local_2a0._8_4_;
    auVar48._8_4_ = fVar402 * fVar249;
    fVar343 = local_2a0._12_4_;
    auVar48._12_4_ = fVar406 * fVar343;
    fVar405 = local_2a0._16_4_;
    auVar48._16_4_ = fVar409 * fVar405;
    fVar400 = local_2a0._20_4_;
    auVar48._20_4_ = fVar412 * fVar400;
    fVar427 = local_2a0._24_4_;
    auVar48._24_4_ = fVar415 * fVar427;
    auVar48._28_4_ = auVar23._28_4_;
    fVar243 = auVar30._0_4_;
    fVar268 = auVar30._4_4_;
    auVar49._4_4_ = fVar381 * fVar268;
    auVar49._0_4_ = fVar372 * fVar243;
    fVar266 = auVar30._8_4_;
    auVar49._8_4_ = fVar382 * fVar266;
    fVar345 = auVar30._12_4_;
    auVar49._12_4_ = fVar383 * fVar345;
    fVar322 = auVar30._16_4_;
    auVar49._16_4_ = fVar384 * fVar322;
    fVar404 = auVar30._20_4_;
    auVar49._20_4_ = fVar385 * fVar404;
    fVar428 = auVar30._24_4_;
    auVar49._24_4_ = fVar386 * fVar428;
    auVar49._28_4_ = auVar128._28_4_;
    auVar29 = vsubps_avx(auVar49,auVar48);
    auVar100._4_4_ = fVar340;
    auVar100._0_4_ = fVar332;
    auVar100._8_4_ = fVar342;
    auVar100._12_4_ = fVar344;
    auVar100._16_4_ = fVar346;
    auVar100._20_4_ = fVar349;
    auVar100._24_4_ = fVar352;
    auVar100._28_4_ = fVar354;
    auVar128 = vperm2f128_avx(auVar100,auVar100,1);
    auVar128 = vshufps_avx(auVar128,auVar100,0x30);
    auVar28 = vshufps_avx(auVar100,auVar128,0x29);
    local_2c0 = vsubps_avx(auVar28,auVar100);
    auVar50._4_4_ = fVar268 * fVar316;
    auVar50._0_4_ = fVar243 * fVar306;
    auVar50._8_4_ = fVar266 * fVar317;
    auVar50._12_4_ = fVar345 * fVar318;
    auVar50._16_4_ = fVar322 * fVar319;
    auVar50._20_4_ = fVar404 * fVar320;
    auVar50._24_4_ = fVar428 * fVar321;
    auVar50._28_4_ = auVar128._28_4_;
    fVar286 = local_2c0._0_4_;
    fVar246 = local_2c0._4_4_;
    auVar51._4_4_ = fVar398 * fVar246;
    auVar51._0_4_ = fVar388 * fVar286;
    fVar267 = local_2c0._8_4_;
    auVar51._8_4_ = fVar402 * fVar267;
    fVar348 = local_2c0._12_4_;
    auVar51._12_4_ = fVar406 * fVar348;
    fVar371 = local_2c0._16_4_;
    auVar51._16_4_ = fVar409 * fVar371;
    fVar408 = local_2c0._20_4_;
    auVar51._20_4_ = fVar412 * fVar408;
    fVar429 = local_2c0._24_4_;
    auVar51._24_4_ = fVar415 * fVar429;
    auVar51._28_4_ = fStack_904;
    auVar39 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ = fVar381 * fVar246;
    auVar52._0_4_ = fVar372 * fVar286;
    auVar52._8_4_ = fVar382 * fVar267;
    auVar52._12_4_ = fVar383 * fVar348;
    auVar52._16_4_ = fVar384 * fVar371;
    auVar52._20_4_ = fVar385 * fVar408;
    auVar52._24_4_ = fVar386 * fVar429;
    auVar52._28_4_ = fStack_904;
    auVar53._4_4_ = fVar288 * fVar316;
    auVar53._0_4_ = fVar175 * fVar306;
    auVar53._8_4_ = fVar249 * fVar317;
    auVar53._12_4_ = fVar343 * fVar318;
    auVar53._16_4_ = fVar405 * fVar319;
    auVar53._20_4_ = fVar400 * fVar320;
    auVar53._24_4_ = fVar427 * fVar321;
    auVar53._28_4_ = fVar354;
    auVar40 = vsubps_avx(auVar53,auVar52);
    fVar273 = auVar40._28_4_;
    auVar240._0_4_ = fVar286 * fVar286 + fVar175 * fVar175 + fVar243 * fVar243;
    auVar240._4_4_ = fVar246 * fVar246 + fVar288 * fVar288 + fVar268 * fVar268;
    auVar240._8_4_ = fVar267 * fVar267 + fVar249 * fVar249 + fVar266 * fVar266;
    auVar240._12_4_ = fVar348 * fVar348 + fVar343 * fVar343 + fVar345 * fVar345;
    auVar240._16_4_ = fVar371 * fVar371 + fVar405 * fVar405 + fVar322 * fVar322;
    auVar240._20_4_ = fVar408 * fVar408 + fVar400 * fVar400 + fVar404 * fVar404;
    auVar240._24_4_ = fVar429 * fVar429 + fVar427 * fVar427 + fVar428 * fVar428;
    auVar240._28_4_ = fVar273 + fVar273 + auVar29._28_4_;
    auVar128 = vrcpps_avx(auVar240);
    fVar341 = auVar128._0_4_;
    fVar387 = auVar128._4_4_;
    auVar54._4_4_ = fVar387 * auVar240._4_4_;
    auVar54._0_4_ = fVar341 * auVar240._0_4_;
    fVar397 = auVar128._8_4_;
    auVar54._8_4_ = fVar397 * auVar240._8_4_;
    fVar401 = auVar128._12_4_;
    auVar54._12_4_ = fVar401 * auVar240._12_4_;
    fVar347 = auVar128._16_4_;
    auVar54._16_4_ = fVar347 * auVar240._16_4_;
    fVar350 = auVar128._20_4_;
    auVar54._20_4_ = fVar350 * auVar240._20_4_;
    fVar353 = auVar128._24_4_;
    auVar54._24_4_ = fVar353 * auVar240._24_4_;
    auVar54._28_4_ = fVar354;
    auVar211._8_4_ = 0x3f800000;
    auVar211._0_8_ = 0x3f8000003f800000;
    auVar211._12_4_ = 0x3f800000;
    auVar211._16_4_ = 0x3f800000;
    auVar211._20_4_ = 0x3f800000;
    auVar211._24_4_ = 0x3f800000;
    auVar211._28_4_ = 0x3f800000;
    auVar129 = vsubps_avx(auVar211,auVar54);
    fVar341 = fVar341 + fVar341 * auVar129._0_4_;
    fVar387 = fVar387 + fVar387 * auVar129._4_4_;
    fVar397 = fVar397 + fVar397 * auVar129._8_4_;
    fVar401 = fVar401 + fVar401 * auVar129._12_4_;
    fVar347 = fVar347 + fVar347 * auVar129._16_4_;
    fVar350 = fVar350 + fVar350 * auVar129._20_4_;
    fVar353 = fVar353 + fVar353 * auVar129._24_4_;
    auVar23 = vperm2f128_avx(auVar45,auVar45,1);
    auVar23 = vshufps_avx(auVar23,auVar45,0x30);
    local_980 = vshufps_avx(auVar45,auVar23,0x29);
    auVar23 = vperm2f128_avx(auVar46,auVar46,1);
    auVar23 = vshufps_avx(auVar23,auVar46,0x30);
    auVar24 = vshufps_avx(auVar46,auVar23,0x29);
    fVar389 = auVar24._0_4_;
    fVar399 = auVar24._4_4_;
    auVar55._4_4_ = fVar399 * fVar288;
    auVar55._0_4_ = fVar389 * fVar175;
    fVar403 = auVar24._8_4_;
    auVar55._8_4_ = fVar403 * fVar249;
    fVar407 = auVar24._12_4_;
    auVar55._12_4_ = fVar407 * fVar343;
    fVar410 = auVar24._16_4_;
    auVar55._16_4_ = fVar410 * fVar405;
    fVar413 = auVar24._20_4_;
    auVar55._20_4_ = fVar413 * fVar400;
    fVar416 = auVar24._24_4_;
    auVar55._24_4_ = fVar416 * fVar427;
    auVar55._28_4_ = auVar23._28_4_;
    fVar185 = local_980._0_4_;
    fVar289 = local_980._4_4_;
    auVar56._4_4_ = fVar268 * fVar289;
    auVar56._0_4_ = fVar243 * fVar185;
    fVar269 = local_980._8_4_;
    auVar56._8_4_ = fVar266 * fVar269;
    fVar351 = local_980._12_4_;
    auVar56._12_4_ = fVar345 * fVar351;
    fVar441 = local_980._16_4_;
    auVar56._16_4_ = fVar322 * fVar441;
    fVar411 = local_980._20_4_;
    auVar56._20_4_ = fVar404 * fVar411;
    fVar430 = local_980._24_4_;
    auVar56._24_4_ = fVar428 * fVar430;
    auVar56._28_4_ = fStack_1e4;
    auVar130 = vsubps_avx(auVar56,auVar55);
    auVar23 = vperm2f128_avx(auVar44,auVar44,1);
    auVar23 = vshufps_avx(auVar23,auVar44,0x30);
    local_9a0 = vshufps_avx(auVar44,auVar23,0x29);
    fVar244 = local_9a0._0_4_;
    fVar247 = local_9a0._4_4_;
    auVar57._4_4_ = fVar268 * fVar247;
    auVar57._0_4_ = fVar243 * fVar244;
    fVar270 = local_9a0._8_4_;
    auVar57._8_4_ = fVar266 * fVar270;
    fVar370 = local_9a0._12_4_;
    auVar57._12_4_ = fVar345 * fVar370;
    fVar442 = local_9a0._16_4_;
    auVar57._16_4_ = fVar322 * fVar442;
    fVar414 = local_9a0._20_4_;
    auVar57._20_4_ = fVar404 * fVar414;
    fVar431 = local_9a0._24_4_;
    auVar57._24_4_ = fVar428 * fVar431;
    auVar57._28_4_ = auVar23._28_4_;
    auVar58._4_4_ = fVar399 * fVar246;
    auVar58._0_4_ = fVar389 * fVar286;
    auVar58._8_4_ = fVar403 * fVar267;
    auVar58._12_4_ = fVar407 * fVar348;
    auVar58._16_4_ = fVar410 * fVar371;
    auVar58._20_4_ = fVar413 * fVar408;
    uVar109 = auVar24._28_4_;
    auVar58._24_4_ = fVar416 * fVar429;
    auVar58._28_4_ = uVar109;
    auVar23 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ = fVar246 * fVar289;
    auVar59._0_4_ = fVar286 * fVar185;
    auVar59._8_4_ = fVar267 * fVar269;
    auVar59._12_4_ = fVar348 * fVar351;
    auVar59._16_4_ = fVar371 * fVar441;
    auVar59._20_4_ = fVar408 * fVar411;
    auVar59._24_4_ = fVar429 * fVar430;
    auVar59._28_4_ = uVar109;
    auVar60._4_4_ = fVar288 * fVar247;
    auVar60._0_4_ = fVar175 * fVar244;
    auVar60._8_4_ = fVar249 * fVar270;
    auVar60._12_4_ = fVar343 * fVar370;
    auVar60._16_4_ = fVar405 * fVar442;
    auVar60._20_4_ = fVar400 * fVar414;
    auVar60._24_4_ = fVar427 * fVar431;
    auVar60._28_4_ = fStack_1c4;
    auVar131 = vsubps_avx(auVar60,auVar59);
    auVar61._4_4_ =
         fVar387 * (auVar29._4_4_ * auVar29._4_4_ +
                   auVar40._4_4_ * auVar40._4_4_ + auVar39._4_4_ * auVar39._4_4_);
    auVar61._0_4_ =
         fVar341 * (auVar29._0_4_ * auVar29._0_4_ +
                   auVar40._0_4_ * auVar40._0_4_ + auVar39._0_4_ * auVar39._0_4_);
    auVar61._8_4_ =
         fVar397 * (auVar29._8_4_ * auVar29._8_4_ +
                   auVar40._8_4_ * auVar40._8_4_ + auVar39._8_4_ * auVar39._8_4_);
    auVar61._12_4_ =
         fVar401 * (auVar29._12_4_ * auVar29._12_4_ +
                   auVar40._12_4_ * auVar40._12_4_ + auVar39._12_4_ * auVar39._12_4_);
    auVar61._16_4_ =
         fVar347 * (auVar29._16_4_ * auVar29._16_4_ +
                   auVar40._16_4_ * auVar40._16_4_ + auVar39._16_4_ * auVar39._16_4_);
    auVar61._20_4_ =
         fVar350 * (auVar29._20_4_ * auVar29._20_4_ +
                   auVar40._20_4_ * auVar40._20_4_ + auVar39._20_4_ * auVar39._20_4_);
    auVar61._24_4_ =
         fVar353 * (auVar29._24_4_ * auVar29._24_4_ +
                   auVar40._24_4_ * auVar40._24_4_ + auVar39._24_4_ * auVar39._24_4_);
    auVar61._28_4_ = auVar29._28_4_ + fVar273 + auVar39._28_4_;
    auVar62._4_4_ =
         (auVar130._4_4_ * auVar130._4_4_ +
         auVar23._4_4_ * auVar23._4_4_ + auVar131._4_4_ * auVar131._4_4_) * fVar387;
    auVar62._0_4_ =
         (auVar130._0_4_ * auVar130._0_4_ +
         auVar23._0_4_ * auVar23._0_4_ + auVar131._0_4_ * auVar131._0_4_) * fVar341;
    auVar62._8_4_ =
         (auVar130._8_4_ * auVar130._8_4_ +
         auVar23._8_4_ * auVar23._8_4_ + auVar131._8_4_ * auVar131._8_4_) * fVar397;
    auVar62._12_4_ =
         (auVar130._12_4_ * auVar130._12_4_ +
         auVar23._12_4_ * auVar23._12_4_ + auVar131._12_4_ * auVar131._12_4_) * fVar401;
    auVar62._16_4_ =
         (auVar130._16_4_ * auVar130._16_4_ +
         auVar23._16_4_ * auVar23._16_4_ + auVar131._16_4_ * auVar131._16_4_) * fVar347;
    auVar62._20_4_ =
         (auVar130._20_4_ * auVar130._20_4_ +
         auVar23._20_4_ * auVar23._20_4_ + auVar131._20_4_ * auVar131._20_4_) * fVar350;
    auVar62._24_4_ =
         (auVar130._24_4_ * auVar130._24_4_ +
         auVar23._24_4_ * auVar23._24_4_ + auVar131._24_4_ * auVar131._24_4_) * fVar353;
    auVar62._28_4_ = auVar128._28_4_ + auVar129._28_4_;
    auVar128 = vmaxps_avx(auVar61,auVar62);
    auVar23 = vperm2f128_avx(local_880,local_880,1);
    auVar23 = vshufps_avx(auVar23,local_880,0x30);
    auVar29 = vshufps_avx(local_880,auVar23,0x29);
    auVar163._0_4_ = (float)local_880._0_4_ + fVar287;
    auVar163._4_4_ = local_880._4_4_ + fVar176;
    auVar163._8_4_ = local_880._8_4_ + fVar245;
    auVar163._12_4_ = local_880._12_4_ + fVar290;
    auVar163._16_4_ = local_880._16_4_ + fVar248;
    auVar163._20_4_ = local_880._20_4_ + fVar291;
    auVar163._24_4_ = local_880._24_4_ + fVar271;
    auVar163._28_4_ = local_880._28_4_ + fVar272;
    auVar23 = vmaxps_avx(local_880,auVar163);
    auVar24 = vmaxps_avx(auVar27,auVar29);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar24 = vrsqrtps_avx(auVar240);
    fVar273 = auVar24._0_4_;
    fVar287 = auVar24._4_4_;
    fVar176 = auVar24._8_4_;
    fVar245 = auVar24._12_4_;
    fVar290 = auVar24._16_4_;
    fVar248 = auVar24._20_4_;
    fVar291 = auVar24._24_4_;
    auVar63._4_4_ = fVar287 * fVar287 * fVar287 * auVar240._4_4_ * 0.5;
    auVar63._0_4_ = fVar273 * fVar273 * fVar273 * auVar240._0_4_ * 0.5;
    auVar63._8_4_ = fVar176 * fVar176 * fVar176 * auVar240._8_4_ * 0.5;
    auVar63._12_4_ = fVar245 * fVar245 * fVar245 * auVar240._12_4_ * 0.5;
    auVar63._16_4_ = fVar290 * fVar290 * fVar290 * auVar240._16_4_ * 0.5;
    auVar63._20_4_ = fVar248 * fVar248 * fVar248 * auVar240._20_4_ * 0.5;
    auVar63._24_4_ = fVar291 * fVar291 * fVar291 * auVar240._24_4_ * 0.5;
    auVar63._28_4_ = auVar240._28_4_;
    auVar64._4_4_ = fVar287 * 1.5;
    auVar64._0_4_ = fVar273 * 1.5;
    auVar64._8_4_ = fVar176 * 1.5;
    auVar64._12_4_ = fVar245 * 1.5;
    auVar64._16_4_ = fVar290 * 1.5;
    auVar64._20_4_ = fVar248 * 1.5;
    auVar64._24_4_ = fVar291 * 1.5;
    auVar64._28_4_ = auVar24._28_4_;
    local_3e0 = vsubps_avx(auVar64,auVar63);
    local_9c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
    auVar99._4_4_ = fVar216;
    auVar99._0_4_ = fVar192;
    auVar99._8_4_ = fVar217;
    auVar99._12_4_ = fVar218;
    auVar99._16_4_ = fVar219;
    auVar99._20_4_ = fVar220;
    auVar99._24_4_ = fVar221;
    auVar99._28_4_ = fVar222;
    local_9e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
    fVar287 = local_9e0._0_4_;
    fVar290 = local_9e0._4_4_;
    fVar271 = local_9e0._8_4_;
    fVar387 = local_9e0._12_4_;
    fVar347 = local_9e0._16_4_;
    fVar418 = local_9e0._20_4_;
    fVar432 = local_9e0._24_4_;
    fVar355 = local_9c0._0_4_;
    fVar364 = local_9c0._4_4_;
    fVar365 = local_9c0._8_4_;
    fVar366 = local_9c0._12_4_;
    fVar367 = local_9c0._16_4_;
    fVar368 = local_9c0._20_4_;
    fVar369 = local_9c0._24_4_;
    auVar101._4_4_ = fVar340;
    auVar101._0_4_ = fVar332;
    auVar101._8_4_ = fVar342;
    auVar101._12_4_ = fVar344;
    auVar101._16_4_ = fVar346;
    auVar101._20_4_ = fVar349;
    auVar101._24_4_ = fVar352;
    auVar101._28_4_ = fVar354;
    auVar39 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
    fVar176 = auVar39._0_4_;
    fVar248 = auVar39._4_4_;
    fVar272 = auVar39._8_4_;
    fVar397 = auVar39._12_4_;
    fVar350 = auVar39._16_4_;
    fVar419 = auVar39._20_4_;
    fVar433 = auVar39._24_4_;
    auVar338._0_4_ =
         (float)local_720._0_4_ * fVar176 +
         fVar355 * (float)local_760._0_4_ + (float)local_740._0_4_ * fVar287;
    auVar338._4_4_ =
         (float)local_720._4_4_ * fVar248 +
         fVar364 * (float)local_760._4_4_ + (float)local_740._4_4_ * fVar290;
    auVar338._8_4_ = fStack_718 * fVar272 + fVar365 * fStack_758 + fStack_738 * fVar271;
    auVar338._12_4_ = fStack_714 * fVar397 + fVar366 * fStack_754 + fStack_734 * fVar387;
    auVar338._16_4_ = fStack_710 * fVar350 + fVar367 * fStack_750 + fStack_730 * fVar347;
    auVar338._20_4_ = fStack_70c * fVar419 + fVar368 * fStack_74c + fStack_72c * fVar418;
    auVar338._24_4_ = fStack_708 * fVar433 + fVar369 * fStack_748 + fStack_728 * fVar432;
    auVar338._28_4_ = auVar131._28_4_ + auVar24._28_4_ + auVar240._28_4_;
    auVar396._0_4_ = fVar176 * fVar176 + fVar355 * fVar355 + fVar287 * fVar287;
    auVar396._4_4_ = fVar248 * fVar248 + fVar364 * fVar364 + fVar290 * fVar290;
    auVar396._8_4_ = fVar272 * fVar272 + fVar365 * fVar365 + fVar271 * fVar271;
    auVar396._12_4_ = fVar397 * fVar397 + fVar366 * fVar366 + fVar387 * fVar387;
    auVar396._16_4_ = fVar350 * fVar350 + fVar367 * fVar367 + fVar347 * fVar347;
    auVar396._20_4_ = fVar419 * fVar419 + fVar368 * fVar368 + fVar418 * fVar418;
    auVar396._24_4_ = fVar433 * fVar433 + fVar369 * fVar369 + fVar432 * fVar432;
    auVar396._28_4_ = fStack_1c4 + fStack_1c4 + auVar131._28_4_;
    fVar245 = local_3e0._0_4_;
    fVar291 = local_3e0._4_4_;
    fVar341 = local_3e0._8_4_;
    fVar401 = local_3e0._12_4_;
    fVar353 = local_3e0._16_4_;
    fVar304 = local_3e0._20_4_;
    fVar434 = local_3e0._24_4_;
    auVar130 = local_2c0;
    local_620._0_4_ =
         (float)local_720._0_4_ * fVar286 * fVar245 +
         fVar175 * fVar245 * (float)local_760._0_4_ + fVar243 * fVar245 * (float)local_740._0_4_;
    local_620._4_4_ =
         (float)local_720._4_4_ * fVar246 * fVar291 +
         fVar288 * fVar291 * (float)local_760._4_4_ + fVar268 * fVar291 * (float)local_740._4_4_;
    local_620._8_4_ =
         fStack_718 * fVar267 * fVar341 +
         fVar249 * fVar341 * fStack_758 + fVar266 * fVar341 * fStack_738;
    local_620._12_4_ =
         fStack_714 * fVar348 * fVar401 +
         fVar343 * fVar401 * fStack_754 + fVar345 * fVar401 * fStack_734;
    local_620._16_4_ =
         fStack_710 * fVar371 * fVar353 +
         fVar405 * fVar353 * fStack_750 + fVar322 * fVar353 * fStack_730;
    local_620._20_4_ =
         fStack_70c * fVar408 * fVar304 +
         fVar400 * fVar304 * fStack_74c + fVar404 * fVar304 * fStack_72c;
    local_620._24_4_ =
         fStack_708 * fVar429 * fVar434 +
         fVar427 * fVar434 * fStack_748 + fVar428 * fVar434 * fStack_728;
    local_620._28_4_ = fStack_704 + fStack_744 + fStack_724;
    auVar363 = ZEXT864(0) << 0x20;
    fVar273 = fStack_704 + fStack_744 + fStack_724;
    local_640._0_4_ =
         fVar176 * fVar286 * fVar245 + fVar355 * fVar175 * fVar245 + fVar243 * fVar245 * fVar287;
    local_640._4_4_ =
         fVar248 * fVar246 * fVar291 + fVar364 * fVar288 * fVar291 + fVar268 * fVar291 * fVar290;
    local_640._8_4_ =
         fVar272 * fVar267 * fVar341 + fVar365 * fVar249 * fVar341 + fVar266 * fVar341 * fVar271;
    local_640._12_4_ =
         fVar397 * fVar348 * fVar401 + fVar366 * fVar343 * fVar401 + fVar345 * fVar401 * fVar387;
    local_640._16_4_ =
         fVar350 * fVar371 * fVar353 + fVar367 * fVar405 * fVar353 + fVar322 * fVar353 * fVar347;
    local_640._20_4_ =
         fVar419 * fVar408 * fVar304 + fVar368 * fVar400 * fVar304 + fVar404 * fVar304 * fVar418;
    local_640._24_4_ =
         fVar433 * fVar429 * fVar434 + fVar369 * fVar427 * fVar434 + fVar428 * fVar434 * fVar432;
    local_640._28_4_ = fStack_744 + fVar273;
    auVar65._4_4_ = local_620._4_4_ * local_640._4_4_;
    auVar65._0_4_ = local_620._0_4_ * local_640._0_4_;
    auVar65._8_4_ = local_620._8_4_ * local_640._8_4_;
    auVar65._12_4_ = local_620._12_4_ * local_640._12_4_;
    auVar65._16_4_ = local_620._16_4_ * local_640._16_4_;
    auVar65._20_4_ = local_620._20_4_ * local_640._20_4_;
    auVar65._24_4_ = local_620._24_4_ * local_640._24_4_;
    auVar65._28_4_ = fVar273;
    auVar39 = vsubps_avx(auVar338,auVar65);
    auVar66._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar66._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar66._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar66._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar66._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar66._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar66._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar66._28_4_ = fStack_744;
    auVar40 = vsubps_avx(auVar396,auVar66);
    auVar24 = vsqrtps_avx(auVar128);
    fVar273 = (auVar24._0_4_ + auVar23._0_4_) * 1.0000002;
    fVar177 = (auVar24._4_4_ + auVar23._4_4_) * 1.0000002;
    fVar180 = (auVar24._8_4_ + auVar23._8_4_) * 1.0000002;
    fVar183 = (auVar24._12_4_ + auVar23._12_4_) * 1.0000002;
    fVar186 = (auVar24._16_4_ + auVar23._16_4_) * 1.0000002;
    fVar188 = (auVar24._20_4_ + auVar23._20_4_) * 1.0000002;
    fVar190 = (auVar24._24_4_ + auVar23._24_4_) * 1.0000002;
    auVar67._4_4_ = fVar177 * fVar177;
    auVar67._0_4_ = fVar273 * fVar273;
    auVar67._8_4_ = fVar180 * fVar180;
    auVar67._12_4_ = fVar183 * fVar183;
    auVar67._16_4_ = fVar186 * fVar186;
    auVar67._20_4_ = fVar188 * fVar188;
    auVar67._24_4_ = fVar190 * fVar190;
    auVar67._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    local_400._0_4_ = auVar39._0_4_ + auVar39._0_4_;
    local_400._4_4_ = auVar39._4_4_ + auVar39._4_4_;
    local_400._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    local_400._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_400._16_4_ = auVar39._16_4_ + auVar39._16_4_;
    local_400._20_4_ = auVar39._20_4_ + auVar39._20_4_;
    local_400._24_4_ = auVar39._24_4_ + auVar39._24_4_;
    fVar273 = auVar39._28_4_;
    local_400._28_4_ = fVar273 + fVar273;
    auVar23 = vsubps_avx(auVar40,auVar67);
    auVar68._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar68._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar68._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar68._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar68._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar68._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar68._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar68._28_4_ = fVar273;
    auVar39 = vsubps_avx(local_280,auVar68);
    auVar69._4_4_ = local_400._4_4_ * local_400._4_4_;
    auVar69._0_4_ = local_400._0_4_ * local_400._0_4_;
    auVar69._8_4_ = local_400._8_4_ * local_400._8_4_;
    auVar69._12_4_ = local_400._12_4_ * local_400._12_4_;
    auVar69._16_4_ = local_400._16_4_ * local_400._16_4_;
    auVar69._20_4_ = local_400._20_4_ * local_400._20_4_;
    auVar69._24_4_ = local_400._24_4_ * local_400._24_4_;
    auVar69._28_4_ = local_280._28_4_;
    fVar273 = auVar39._0_4_;
    fVar177 = auVar39._4_4_;
    fVar180 = auVar39._8_4_;
    fVar183 = auVar39._12_4_;
    fVar186 = auVar39._16_4_;
    fVar188 = auVar39._20_4_;
    fVar190 = auVar39._24_4_;
    auVar70._4_4_ = auVar23._4_4_ * fVar177 * 4.0;
    auVar70._0_4_ = auVar23._0_4_ * fVar273 * 4.0;
    auVar70._8_4_ = auVar23._8_4_ * fVar180 * 4.0;
    auVar70._12_4_ = auVar23._12_4_ * fVar183 * 4.0;
    auVar70._16_4_ = auVar23._16_4_ * fVar186 * 4.0;
    auVar70._20_4_ = auVar23._20_4_ * fVar188 * 4.0;
    auVar70._24_4_ = auVar23._24_4_ * fVar190 * 4.0;
    auVar70._28_4_ = 0x40800000;
    auVar129 = vsubps_avx(auVar69,auVar70);
    auVar128 = vcmpps_avx(auVar129,ZEXT832(0) << 0x20,5);
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar133._16_4_ = 0x7fffffff;
    auVar133._20_4_ = 0x7fffffff;
    auVar133._24_4_ = 0x7fffffff;
    auVar133._28_4_ = 0x7fffffff;
    local_2e0 = vandps_avx(auVar68,auVar133);
    local_340._0_4_ = fVar273 + fVar273;
    local_340._4_4_ = fVar177 + fVar177;
    local_340._8_4_ = fVar180 + fVar180;
    local_340._12_4_ = fVar183 + fVar183;
    local_340._16_4_ = fVar186 + fVar186;
    local_340._20_4_ = fVar188 + fVar188;
    local_340._24_4_ = fVar190 + fVar190;
    local_340._28_4_ = auVar39._28_4_ + auVar39._28_4_;
    local_300 = vandps_avx(auVar39,auVar133);
    uVar106 = CONCAT44(local_400._4_4_,local_400._0_4_);
    local_320._0_8_ = uVar106 ^ 0x8000000080000000;
    local_320._8_4_ = -local_400._8_4_;
    local_320._12_4_ = -local_400._12_4_;
    local_320._16_4_ = -local_400._16_4_;
    local_320._20_4_ = -local_400._20_4_;
    local_320._24_4_ = -local_400._24_4_;
    local_320._28_4_ = -local_400._28_4_;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar128 >> 0x7f,0) == '\0') &&
          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0xbf,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f])
    {
      auVar339._8_4_ = 0x7f800000;
      auVar339._0_8_ = 0x7f8000007f800000;
      auVar339._12_4_ = 0x7f800000;
      auVar339._16_4_ = 0x7f800000;
      auVar339._20_4_ = 0x7f800000;
      auVar339._24_4_ = 0x7f800000;
      auVar339._28_4_ = 0x7f800000;
      auVar164._8_4_ = 0xff800000;
      auVar164._0_8_ = 0xff800000ff800000;
      auVar164._12_4_ = 0xff800000;
      auVar164._16_4_ = 0xff800000;
      auVar164._20_4_ = 0xff800000;
      auVar164._24_4_ = 0xff800000;
      auVar164._28_4_ = 0xff800000;
      auVar131 = local_320;
    }
    else {
      auVar160 = vsqrtps_avx(auVar129);
      auVar131 = vrcpps_avx(local_340);
      auVar39 = vcmpps_avx(auVar129,ZEXT832(0) << 0x20,5);
      auVar363 = ZEXT3264(auVar39);
      fVar147 = auVar131._0_4_;
      fVar178 = auVar131._4_4_;
      auVar71._4_4_ = local_340._4_4_ * fVar178;
      auVar71._0_4_ = local_340._0_4_ * fVar147;
      fVar181 = auVar131._8_4_;
      auVar71._8_4_ = local_340._8_4_ * fVar181;
      fVar184 = auVar131._12_4_;
      auVar71._12_4_ = local_340._12_4_ * fVar184;
      fVar187 = auVar131._16_4_;
      auVar71._16_4_ = local_340._16_4_ * fVar187;
      fVar189 = auVar131._20_4_;
      auVar71._20_4_ = local_340._20_4_ * fVar189;
      fVar191 = auVar131._24_4_;
      auVar71._24_4_ = local_340._24_4_ * fVar191;
      auVar71._28_4_ = auVar129._28_4_;
      auVar134._8_4_ = 0x3f800000;
      auVar134._0_8_ = 0x3f8000003f800000;
      auVar134._12_4_ = 0x3f800000;
      auVar134._16_4_ = 0x3f800000;
      auVar134._20_4_ = 0x3f800000;
      auVar134._24_4_ = 0x3f800000;
      auVar134._28_4_ = 0x3f800000;
      auVar129 = vsubps_avx(auVar134,auVar71);
      fVar147 = fVar147 + fVar147 * auVar129._0_4_;
      fVar178 = fVar178 + fVar178 * auVar129._4_4_;
      fVar181 = fVar181 + fVar181 * auVar129._8_4_;
      fVar184 = fVar184 + fVar184 * auVar129._12_4_;
      fVar187 = fVar187 + fVar187 * auVar129._16_4_;
      fVar189 = fVar189 + fVar189 * auVar129._20_4_;
      fVar191 = fVar191 + fVar191 * auVar129._24_4_;
      auVar161 = vsubps_avx(local_320,auVar160);
      fVar292 = auVar161._0_4_ * fVar147;
      fVar299 = auVar161._4_4_ * fVar178;
      auVar72._4_4_ = fVar299;
      auVar72._0_4_ = fVar292;
      fVar300 = auVar161._8_4_ * fVar181;
      auVar72._8_4_ = fVar300;
      fVar301 = auVar161._12_4_ * fVar184;
      auVar72._12_4_ = fVar301;
      fVar302 = auVar161._16_4_ * fVar187;
      auVar72._16_4_ = fVar302;
      fVar303 = auVar161._20_4_ * fVar189;
      auVar72._20_4_ = fVar303;
      fVar305 = auVar161._24_4_ * fVar191;
      auVar72._24_4_ = fVar305;
      auVar72._28_4_ = auVar161._28_4_;
      auVar160 = vsubps_avx(auVar160,local_400);
      fVar147 = auVar160._0_4_ * fVar147;
      fVar178 = auVar160._4_4_ * fVar178;
      auVar73._4_4_ = fVar178;
      auVar73._0_4_ = fVar147;
      fVar181 = auVar160._8_4_ * fVar181;
      auVar73._8_4_ = fVar181;
      fVar184 = auVar160._12_4_ * fVar184;
      auVar73._12_4_ = fVar184;
      fVar187 = auVar160._16_4_ * fVar187;
      auVar73._16_4_ = fVar187;
      fVar189 = auVar160._20_4_ * fVar189;
      auVar73._20_4_ = fVar189;
      fVar191 = auVar160._24_4_ * fVar191;
      auVar73._24_4_ = fVar191;
      auVar73._28_4_ = auVar131._28_4_ + auVar129._28_4_;
      local_3a0 = fVar245 * (local_640._0_4_ + local_620._0_4_ * fVar292);
      fStack_39c = fVar291 * (local_640._4_4_ + local_620._4_4_ * fVar299);
      fStack_398 = fVar341 * (local_640._8_4_ + local_620._8_4_ * fVar300);
      fStack_394 = fVar401 * (local_640._12_4_ + local_620._12_4_ * fVar301);
      fStack_390 = fVar353 * (local_640._16_4_ + local_620._16_4_ * fVar302);
      fStack_38c = fVar304 * (local_640._20_4_ + local_620._20_4_ * fVar303);
      fStack_388 = fVar434 * (local_640._24_4_ + local_620._24_4_ * fVar305);
      fStack_384 = local_320._28_4_;
      local_3c0 = fVar245 * (local_640._0_4_ + local_620._0_4_ * fVar147);
      fStack_3bc = fVar291 * (local_640._4_4_ + local_620._4_4_ * fVar178);
      fStack_3b8 = fVar341 * (local_640._8_4_ + local_620._8_4_ * fVar181);
      fStack_3b4 = fVar401 * (local_640._12_4_ + local_620._12_4_ * fVar184);
      fStack_3b0 = fVar353 * (local_640._16_4_ + local_620._16_4_ * fVar187);
      fStack_3ac = fVar304 * (local_640._20_4_ + local_620._20_4_ * fVar189);
      fStack_3a8 = fVar434 * (local_640._24_4_ + local_620._24_4_ * fVar191);
      fStack_3a4 = local_320._28_4_;
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar339 = vblendvps_avx(auVar280,auVar72,auVar39);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar164 = vblendvps_avx(auVar281,auVar73,auVar39);
      auVar129 = vmaxps_avx(local_600,local_2e0);
      auVar74._4_4_ = auVar129._4_4_ * 1.9073486e-06;
      auVar74._0_4_ = auVar129._0_4_ * 1.9073486e-06;
      auVar74._8_4_ = auVar129._8_4_ * 1.9073486e-06;
      auVar74._12_4_ = auVar129._12_4_ * 1.9073486e-06;
      auVar74._16_4_ = auVar129._16_4_ * 1.9073486e-06;
      auVar74._20_4_ = auVar129._20_4_ * 1.9073486e-06;
      auVar74._24_4_ = auVar129._24_4_ * 1.9073486e-06;
      auVar74._28_4_ = auVar129._28_4_;
      auVar129 = vcmpps_avx(local_300,auVar74,1);
      auVar160 = auVar39 & auVar129;
      auVar131 = auVar339;
      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0x7f,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0xbf,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar160[0x1f] < '\0') {
        auVar128 = vandps_avx(auVar129,auVar39);
        auVar199 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
        auVar129 = vcmpps_avx(auVar23,ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar315._8_4_ = 0xff800000;
        auVar315._0_8_ = 0xff800000ff800000;
        auVar315._12_4_ = 0xff800000;
        auVar315._16_4_ = 0xff800000;
        auVar315._20_4_ = 0xff800000;
        auVar315._24_4_ = 0xff800000;
        auVar315._28_4_ = 0xff800000;
        auVar380._8_4_ = 0x7f800000;
        auVar380._0_8_ = 0x7f8000007f800000;
        auVar380._12_4_ = 0x7f800000;
        auVar380._16_4_ = 0x7f800000;
        auVar380._20_4_ = 0x7f800000;
        auVar380._24_4_ = 0x7f800000;
        auVar380._28_4_ = 0x7f800000;
        auVar23 = vblendvps_avx(auVar380,auVar315,auVar129);
        auVar252 = vpmovsxwd_avx(auVar199);
        auVar199 = vpunpckhwd_avx(auVar199,auVar199);
        auVar285._16_16_ = auVar199;
        auVar285._0_16_ = auVar252;
        auVar339 = vblendvps_avx(auVar339,auVar23,auVar285);
        auVar23 = vblendvps_avx(auVar315,auVar380,auVar129);
        auVar164 = vblendvps_avx(auVar164,auVar23,auVar285);
        auVar264._0_8_ = auVar128._0_8_ ^ 0xffffffffffffffff;
        auVar264._8_4_ = auVar128._8_4_ ^ 0xffffffff;
        auVar264._12_4_ = auVar128._12_4_ ^ 0xffffffff;
        auVar264._16_4_ = auVar128._16_4_ ^ 0xffffffff;
        auVar264._20_4_ = auVar128._20_4_ ^ 0xffffffff;
        auVar264._24_4_ = auVar128._24_4_ ^ 0xffffffff;
        auVar264._28_4_ = auVar128._28_4_ ^ 0xffffffff;
        auVar131 = vorps_avx(auVar129,auVar264);
        auVar128 = vandps_avx(auVar39,auVar131);
      }
    }
    auVar330 = ZEXT3264(local_640);
    auVar265 = ZEXT3264(auVar131);
    auVar23 = local_5e0 & auVar128;
    fVar147 = (float)local_940._0_4_;
    fVar178 = (float)local_940._4_4_;
    fVar181 = fStack_938;
    fVar184 = fStack_934;
    fVar187 = fStack_930;
    fVar189 = fStack_92c;
    fVar191 = fStack_928;
    fVar292 = fStack_924;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar135 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_420 = auVar135;
      auVar199 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar199 = vshufps_avx(auVar199,auVar199,0);
      auVar282._16_16_ = auVar199;
      auVar282._0_16_ = auVar199;
      auVar131 = vminps_avx(auVar282,auVar164);
      auVar136._0_4_ =
           fVar306 * (float)local_720._0_4_ +
           (float)local_760._0_4_ * fVar372 + (float)local_740._0_4_ * fVar388;
      auVar136._4_4_ =
           fVar316 * (float)local_720._4_4_ +
           (float)local_760._4_4_ * fVar381 + (float)local_740._4_4_ * fVar398;
      auVar136._8_4_ = fVar317 * fStack_718 + fStack_758 * fVar382 + fStack_738 * fVar402;
      auVar136._12_4_ = fVar318 * fStack_714 + fStack_754 * fVar383 + fStack_734 * fVar406;
      auVar136._16_4_ = fVar319 * fStack_710 + fStack_750 * fVar384 + fStack_730 * fVar409;
      auVar136._20_4_ = fVar320 * fStack_70c + fStack_74c * fVar385 + fStack_72c * fVar412;
      auVar136._24_4_ = fVar321 * fStack_708 + fStack_748 * fVar386 + fStack_728 * fVar415;
      auVar136._28_4_ = fVar417 + fStack_1e4 + fVar417;
      auVar129 = vrcpps_avx(auVar136);
      fVar417 = auVar129._0_4_;
      fVar299 = auVar129._4_4_;
      auVar75._4_4_ = auVar136._4_4_ * fVar299;
      auVar75._0_4_ = auVar136._0_4_ * fVar417;
      fVar300 = auVar129._8_4_;
      auVar75._8_4_ = auVar136._8_4_ * fVar300;
      fVar301 = auVar129._12_4_;
      auVar75._12_4_ = auVar136._12_4_ * fVar301;
      fVar302 = auVar129._16_4_;
      auVar75._16_4_ = auVar136._16_4_ * fVar302;
      fVar303 = auVar129._20_4_;
      auVar75._20_4_ = auVar136._20_4_ * fVar303;
      fVar305 = auVar129._24_4_;
      auVar75._24_4_ = auVar136._24_4_ * fVar305;
      auVar75._28_4_ = fStack_924 + auVar199._12_4_;
      auVar258._8_4_ = 0x3f800000;
      auVar258._0_8_ = 0x3f8000003f800000;
      auVar258._12_4_ = 0x3f800000;
      auVar258._16_4_ = 0x3f800000;
      auVar258._20_4_ = 0x3f800000;
      auVar258._24_4_ = 0x3f800000;
      auVar258._28_4_ = 0x3f800000;
      auVar265 = ZEXT3264(auVar258);
      auVar160 = vsubps_avx(auVar258,auVar75);
      auVar313._8_4_ = 0x7fffffff;
      auVar313._0_8_ = 0x7fffffff7fffffff;
      auVar313._12_4_ = 0x7fffffff;
      auVar313._16_4_ = 0x7fffffff;
      auVar313._20_4_ = 0x7fffffff;
      auVar313._24_4_ = 0x7fffffff;
      auVar313._28_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar136,auVar313);
      auVar360._8_4_ = 0x219392ef;
      auVar360._0_8_ = 0x219392ef219392ef;
      auVar360._12_4_ = 0x219392ef;
      auVar360._16_4_ = 0x219392ef;
      auVar360._20_4_ = 0x219392ef;
      auVar360._24_4_ = 0x219392ef;
      auVar360._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar23,auVar360,1);
      auVar76._4_4_ =
           (fVar299 + fVar299 * auVar160._4_4_) *
           -(fVar316 * fVar248 + fVar381 * fVar364 + fVar398 * fVar290);
      auVar76._0_4_ =
           (fVar417 + fVar417 * auVar160._0_4_) *
           -(fVar306 * fVar176 + fVar372 * fVar355 + fVar388 * fVar287);
      auVar76._8_4_ =
           (fVar300 + fVar300 * auVar160._8_4_) *
           -(fVar317 * fVar272 + fVar382 * fVar365 + fVar402 * fVar271);
      auVar76._12_4_ =
           (fVar301 + fVar301 * auVar160._12_4_) *
           -(fVar318 * fVar397 + fVar383 * fVar366 + fVar406 * fVar387);
      auVar76._16_4_ =
           (fVar302 + fVar302 * auVar160._16_4_) *
           -(fVar319 * fVar350 + fVar384 * fVar367 + fVar409 * fVar347);
      auVar76._20_4_ =
           (fVar303 + fVar303 * auVar160._20_4_) *
           -(fVar320 * fVar419 + fVar385 * fVar368 + fVar412 * fVar418);
      auVar76._24_4_ =
           (fVar305 + fVar305 * auVar160._24_4_) *
           -(fVar321 * fVar433 + fVar386 * fVar369 + fVar415 * fVar432);
      auVar76._28_4_ = auVar129._28_4_ + auVar160._28_4_;
      auVar330 = ZEXT864(0) << 0x20;
      auVar23 = vcmpps_avx(auVar136,ZEXT832(0) << 0x20,1);
      auVar23 = vorps_avx(auVar39,auVar23);
      auVar426._8_4_ = 0xff800000;
      auVar426._0_8_ = 0xff800000ff800000;
      auVar426._12_4_ = 0xff800000;
      auVar426._16_4_ = 0xff800000;
      auVar426._20_4_ = 0xff800000;
      auVar426._24_4_ = 0xff800000;
      auVar426._28_4_ = 0xff800000;
      auVar23 = vblendvps_avx(auVar76,auVar426,auVar23);
      auVar129 = vcmpps_avx(auVar136,ZEXT832(0) << 0x20,6);
      auVar39 = vorps_avx(auVar39,auVar129);
      auVar437._8_4_ = 0x7f800000;
      auVar437._0_8_ = 0x7f8000007f800000;
      auVar437._12_4_ = 0x7f800000;
      auVar437._16_4_ = 0x7f800000;
      auVar437._20_4_ = 0x7f800000;
      auVar437._24_4_ = 0x7f800000;
      auVar437._28_4_ = 0x7f800000;
      auVar39 = vblendvps_avx(auVar76,auVar437,auVar39);
      auVar129 = vmaxps_avx(local_360,auVar339);
      auVar129 = vmaxps_avx(auVar129,auVar23);
      auVar39 = vminps_avx(auVar131,auVar39);
      auVar363 = ZEXT3264(auVar39);
      auVar160 = ZEXT832(0) << 0x20;
      auVar23 = vsubps_avx(auVar160,auVar25);
      auVar25 = vsubps_avx(auVar160,auVar26);
      auVar77._4_4_ = auVar25._4_4_ * -fVar399;
      auVar77._0_4_ = auVar25._0_4_ * -fVar389;
      auVar77._8_4_ = auVar25._8_4_ * -fVar403;
      auVar77._12_4_ = auVar25._12_4_ * -fVar407;
      auVar77._16_4_ = auVar25._16_4_ * -fVar410;
      auVar77._20_4_ = auVar25._20_4_ * -fVar413;
      auVar77._24_4_ = auVar25._24_4_ * -fVar416;
      auVar77._28_4_ = auVar25._28_4_;
      auVar78._4_4_ = fVar289 * auVar23._4_4_;
      auVar78._0_4_ = fVar185 * auVar23._0_4_;
      auVar78._8_4_ = fVar269 * auVar23._8_4_;
      auVar78._12_4_ = fVar351 * auVar23._12_4_;
      auVar78._16_4_ = fVar441 * auVar23._16_4_;
      auVar78._20_4_ = fVar411 * auVar23._20_4_;
      auVar78._24_4_ = fVar430 * auVar23._24_4_;
      auVar78._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(auVar77,auVar78);
      auVar25 = vsubps_avx(auVar160,auVar28);
      auVar79._4_4_ = fVar247 * auVar25._4_4_;
      auVar79._0_4_ = fVar244 * auVar25._0_4_;
      auVar79._8_4_ = fVar270 * auVar25._8_4_;
      auVar79._12_4_ = fVar370 * auVar25._12_4_;
      auVar79._16_4_ = fVar442 * auVar25._16_4_;
      auVar79._20_4_ = fVar414 * auVar25._20_4_;
      uVar8 = auVar25._28_4_;
      auVar79._24_4_ = fVar431 * auVar25._24_4_;
      auVar79._28_4_ = uVar8;
      auVar26 = vsubps_avx(auVar23,auVar79);
      auVar80._4_4_ = (float)local_740._4_4_ * -fVar399;
      auVar80._0_4_ = (float)local_740._0_4_ * -fVar389;
      auVar80._8_4_ = fStack_738 * -fVar403;
      auVar80._12_4_ = fStack_734 * -fVar407;
      auVar80._16_4_ = fStack_730 * -fVar410;
      auVar80._20_4_ = fStack_72c * -fVar413;
      auVar80._24_4_ = fStack_728 * -fVar416;
      auVar80._28_4_ = uVar109 ^ 0x80000000;
      auVar81._4_4_ = (float)local_760._4_4_ * fVar289;
      auVar81._0_4_ = (float)local_760._0_4_ * fVar185;
      auVar81._8_4_ = fStack_758 * fVar269;
      auVar81._12_4_ = fStack_754 * fVar351;
      auVar81._16_4_ = fStack_750 * fVar441;
      auVar81._20_4_ = fStack_74c * fVar411;
      auVar81._24_4_ = fStack_748 * fVar430;
      auVar81._28_4_ = uVar8;
      auVar23 = vsubps_avx(auVar80,auVar81);
      auVar82._4_4_ = (float)local_720._4_4_ * fVar247;
      auVar82._0_4_ = (float)local_720._0_4_ * fVar244;
      auVar82._8_4_ = fStack_718 * fVar270;
      auVar82._12_4_ = fStack_714 * fVar370;
      auVar82._16_4_ = fStack_710 * fVar442;
      auVar82._20_4_ = fStack_70c * fVar414;
      auVar82._24_4_ = fStack_708 * fVar431;
      auVar82._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar23,auVar82);
      auVar23 = vrcpps_avx(auVar28);
      fVar185 = auVar23._0_4_;
      fVar244 = auVar23._4_4_;
      auVar83._4_4_ = auVar28._4_4_ * fVar244;
      auVar83._0_4_ = auVar28._0_4_ * fVar185;
      fVar287 = auVar23._8_4_;
      auVar83._8_4_ = auVar28._8_4_ * fVar287;
      fVar176 = auVar23._12_4_;
      auVar83._12_4_ = auVar28._12_4_ * fVar176;
      fVar289 = auVar23._16_4_;
      auVar83._16_4_ = auVar28._16_4_ * fVar289;
      fVar247 = auVar23._20_4_;
      auVar83._20_4_ = auVar28._20_4_ * fVar247;
      fVar290 = auVar23._24_4_;
      auVar83._24_4_ = auVar28._24_4_ * fVar290;
      auVar83._28_4_ = fStack_724;
      auVar131 = vsubps_avx(auVar258,auVar83);
      auVar23 = vandps_avx(auVar28,auVar313);
      auVar137._8_4_ = 0x219392ef;
      auVar137._0_8_ = 0x219392ef219392ef;
      auVar137._12_4_ = 0x219392ef;
      auVar137._16_4_ = 0x219392ef;
      auVar137._20_4_ = 0x219392ef;
      auVar137._24_4_ = 0x219392ef;
      auVar137._28_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar23,auVar137,1);
      auVar84._4_4_ = (fVar244 + fVar244 * auVar131._4_4_) * -auVar26._4_4_;
      auVar84._0_4_ = (fVar185 + fVar185 * auVar131._0_4_) * -auVar26._0_4_;
      auVar84._8_4_ = (fVar287 + fVar287 * auVar131._8_4_) * -auVar26._8_4_;
      auVar84._12_4_ = (fVar176 + fVar176 * auVar131._12_4_) * -auVar26._12_4_;
      auVar84._16_4_ = (fVar289 + fVar289 * auVar131._16_4_) * -auVar26._16_4_;
      auVar84._20_4_ = (fVar247 + fVar247 * auVar131._20_4_) * -auVar26._20_4_;
      auVar84._24_4_ = (fVar290 + fVar290 * auVar131._24_4_) * -auVar26._24_4_;
      auVar84._28_4_ = auVar26._28_4_ ^ 0x80000000;
      auVar23 = vcmpps_avx(auVar28,auVar160,1);
      auVar23 = vorps_avx(auVar25,auVar23);
      auVar23 = vblendvps_avx(auVar84,auVar426,auVar23);
      local_780 = vmaxps_avx(auVar129,auVar23);
      auVar23 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,6);
      auVar23 = vorps_avx(auVar25,auVar23);
      auVar23 = vblendvps_avx(auVar84,auVar437,auVar23);
      auVar128 = vandps_avx(local_5e0,auVar128);
      local_440 = vminps_avx(auVar39,auVar23);
      auVar23 = vcmpps_avx(local_780,local_440,2);
      auVar25 = auVar128 & auVar23;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar25 = vminps_avx(local_880,auVar163);
        auVar26 = vminps_avx(auVar27,auVar29);
        auVar25 = vminps_avx(auVar25,auVar26);
        auVar24 = vsubps_avx(auVar25,auVar24);
        auVar128 = vandps_avx(auVar23,auVar128);
        auVar104._4_4_ = fStack_39c;
        auVar104._0_4_ = local_3a0;
        auVar104._8_4_ = fStack_398;
        auVar104._12_4_ = fStack_394;
        auVar104._16_4_ = fStack_390;
        auVar104._20_4_ = fStack_38c;
        auVar104._24_4_ = fStack_388;
        auVar104._28_4_ = fStack_384;
        auVar23 = vminps_avx(auVar104,auVar258);
        auVar265 = ZEXT864(0) << 0x20;
        auVar23 = vmaxps_avx(auVar23,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar116 + fVar146 * (auVar23._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar144 + fVar174 * (auVar23._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar145 + fVar179 * (auVar23._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_a24 + fVar182 * (auVar23._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar116 + fVar146 * (auVar23._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar144 + fVar174 * (auVar23._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar145 + fVar179 * (auVar23._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_a24 + auVar23._28_4_ + 7.0;
        auVar103._4_4_ = fStack_3bc;
        auVar103._0_4_ = local_3c0;
        auVar103._8_4_ = fStack_3b8;
        auVar103._12_4_ = fStack_3b4;
        auVar103._16_4_ = fStack_3b0;
        auVar103._20_4_ = fStack_3ac;
        auVar103._24_4_ = fStack_3a8;
        auVar103._28_4_ = fStack_3a4;
        auVar23 = vminps_avx(auVar103,auVar258);
        auVar23 = vmaxps_avx(auVar23,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar116 + fVar146 * (auVar23._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar144 + fVar174 * (auVar23._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar145 + fVar179 * (auVar23._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_a24 + fVar182 * (auVar23._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar116 + fVar146 * (auVar23._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar144 + fVar174 * (auVar23._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar145 + fVar179 * (auVar23._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_a24 + auVar23._28_4_ + 7.0;
        auVar85._4_4_ = auVar24._4_4_ * 0.99999976;
        auVar85._0_4_ = auVar24._0_4_ * 0.99999976;
        auVar85._8_4_ = auVar24._8_4_ * 0.99999976;
        auVar85._12_4_ = auVar24._12_4_ * 0.99999976;
        auVar85._16_4_ = auVar24._16_4_ * 0.99999976;
        auVar85._20_4_ = auVar24._20_4_ * 0.99999976;
        auVar85._24_4_ = auVar24._24_4_ * 0.99999976;
        auVar85._28_4_ = 0x3f7ffffc;
        auVar23 = vmaxps_avx(ZEXT832(0) << 0x20,auVar85);
        auVar86._4_4_ = auVar23._4_4_ * auVar23._4_4_;
        auVar86._0_4_ = auVar23._0_4_ * auVar23._0_4_;
        auVar86._8_4_ = auVar23._8_4_ * auVar23._8_4_;
        auVar86._12_4_ = auVar23._12_4_ * auVar23._12_4_;
        auVar86._16_4_ = auVar23._16_4_ * auVar23._16_4_;
        auVar86._20_4_ = auVar23._20_4_ * auVar23._20_4_;
        auVar86._24_4_ = auVar23._24_4_ * auVar23._24_4_;
        auVar86._28_4_ = auVar23._28_4_;
        auVar24 = vsubps_avx(auVar40,auVar86);
        auVar87._4_4_ = auVar24._4_4_ * fVar177 * 4.0;
        auVar87._0_4_ = auVar24._0_4_ * fVar273 * 4.0;
        auVar87._8_4_ = auVar24._8_4_ * fVar180 * 4.0;
        auVar87._12_4_ = auVar24._12_4_ * fVar183 * 4.0;
        auVar87._16_4_ = auVar24._16_4_ * fVar186 * 4.0;
        auVar87._20_4_ = auVar24._20_4_ * fVar188 * 4.0;
        auVar87._24_4_ = auVar24._24_4_ * fVar190 * 4.0;
        auVar87._28_4_ = auVar23._28_4_;
        auVar25 = vsubps_avx(auVar69,auVar87);
        auVar23 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0x7f,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0xbf,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar23[0x1f]) {
          auVar308 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar296 = ZEXT828(0) << 0x20;
          auVar278 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_a40 = ZEXT832(0) << 0x20;
          _local_be0 = local_a40._0_28_;
          auVar328._8_4_ = 0x7f800000;
          auVar328._0_8_ = 0x7f8000007f800000;
          auVar328._12_4_ = 0x7f800000;
          auVar328._16_4_ = 0x7f800000;
          auVar328._20_4_ = 0x7f800000;
          auVar328._24_4_ = 0x7f800000;
          auVar328._28_4_ = 0x7f800000;
          auVar379._8_4_ = 0xff800000;
          auVar379._0_8_ = 0xff800000ff800000;
          auVar379._12_4_ = 0xff800000;
          auVar379._16_4_ = 0xff800000;
          auVar379._20_4_ = 0xff800000;
          auVar379._24_4_ = 0xff800000;
          auVar379._28_4_ = 0xff800000;
          auVar33 = auVar24;
        }
        else {
          auVar26 = vrcpps_avx(local_340);
          fVar273 = auVar26._0_4_;
          auVar259._0_4_ = local_340._0_4_ * fVar273;
          fVar185 = auVar26._4_4_;
          auVar259._4_4_ = local_340._4_4_ * fVar185;
          fVar244 = auVar26._8_4_;
          auVar259._8_4_ = local_340._8_4_ * fVar244;
          fVar287 = auVar26._12_4_;
          auVar259._12_4_ = local_340._12_4_ * fVar287;
          fVar176 = auVar26._16_4_;
          auVar259._16_4_ = local_340._16_4_ * fVar176;
          fVar289 = auVar26._20_4_;
          auVar259._20_4_ = local_340._20_4_ * fVar289;
          fVar247 = auVar26._24_4_;
          auVar259._24_4_ = local_340._24_4_ * fVar247;
          auVar259._28_4_ = 0;
          auVar28 = vsubps_avx(auVar258,auVar259);
          auVar27 = vsqrtps_avx(auVar25);
          fVar273 = fVar273 + fVar273 * auVar28._0_4_;
          fVar185 = fVar185 + fVar185 * auVar28._4_4_;
          fVar244 = fVar244 + fVar244 * auVar28._8_4_;
          fVar287 = fVar287 + fVar287 * auVar28._12_4_;
          fVar176 = fVar176 + fVar176 * auVar28._16_4_;
          fVar289 = fVar289 + fVar289 * auVar28._20_4_;
          fVar247 = fVar247 + fVar247 * auVar28._24_4_;
          auVar29 = vsubps_avx(local_320,auVar27);
          fVar370 = auVar29._0_4_ * fVar273;
          fVar387 = auVar29._4_4_ * fVar185;
          auVar88._4_4_ = fVar387;
          auVar88._0_4_ = fVar370;
          fVar397 = auVar29._8_4_ * fVar244;
          auVar88._8_4_ = fVar397;
          fVar441 = auVar29._12_4_ * fVar287;
          auVar88._12_4_ = fVar441;
          fVar442 = auVar29._16_4_ * fVar176;
          auVar88._16_4_ = fVar442;
          fVar347 = auVar29._20_4_ * fVar289;
          auVar88._20_4_ = fVar347;
          fVar350 = auVar29._24_4_ * fVar247;
          auVar88._24_4_ = fVar350;
          auVar88._28_4_ = fStack_744;
          auVar29 = vsubps_avx(auVar27,local_400);
          fVar273 = auVar29._0_4_ * fVar273;
          fVar185 = auVar29._4_4_ * fVar185;
          auVar89._4_4_ = fVar185;
          auVar89._0_4_ = fVar273;
          fVar244 = auVar29._8_4_ * fVar244;
          auVar89._8_4_ = fVar244;
          fVar287 = auVar29._12_4_ * fVar287;
          auVar89._12_4_ = fVar287;
          fVar176 = auVar29._16_4_ * fVar176;
          auVar89._16_4_ = fVar176;
          fVar289 = auVar29._20_4_ * fVar289;
          auVar89._20_4_ = fVar289;
          fVar247 = auVar29._24_4_ * fVar247;
          auVar89._24_4_ = fVar247;
          auVar89._28_4_ = 0x7f800000;
          fVar290 = fVar245 * (fVar370 * local_620._0_4_ + local_640._0_4_);
          fVar248 = fVar291 * (fVar387 * local_620._4_4_ + local_640._4_4_);
          fVar269 = fVar341 * (fVar397 * local_620._8_4_ + local_640._8_4_);
          fVar270 = fVar401 * (fVar441 * local_620._12_4_ + local_640._12_4_);
          fVar271 = fVar353 * (fVar442 * local_620._16_4_ + local_640._16_4_);
          fVar272 = fVar304 * (fVar347 * local_620._20_4_ + local_640._20_4_);
          fVar351 = fVar434 * (fVar350 * local_620._24_4_ + local_640._24_4_);
          auVar33._4_4_ = fVar340;
          auVar33._0_4_ = fVar332;
          auVar33._8_4_ = fVar342;
          auVar33._12_4_ = fVar344;
          auVar33._16_4_ = fVar346;
          auVar33._20_4_ = fVar349;
          auVar33._24_4_ = fVar352;
          auVar33._28_4_ = fVar354;
          auVar165._0_4_ = fVar332 + fVar286 * fVar290;
          auVar165._4_4_ = fVar340 + fVar246 * fVar248;
          auVar165._8_4_ = fVar342 + fVar267 * fVar269;
          auVar165._12_4_ = fVar344 + fVar348 * fVar270;
          auVar165._16_4_ = fVar346 + fVar371 * fVar271;
          auVar165._20_4_ = fVar349 + fVar408 * fVar272;
          auVar165._24_4_ = fVar352 + fVar429 * fVar351;
          auVar165._28_4_ = fVar354 + auVar26._28_4_ + auVar28._28_4_ + local_640._28_4_;
          auVar90._4_4_ = fVar387 * (float)local_720._4_4_;
          auVar90._0_4_ = fVar370 * (float)local_720._0_4_;
          auVar90._8_4_ = fVar397 * fStack_718;
          auVar90._12_4_ = fVar441 * fStack_714;
          auVar90._16_4_ = fVar442 * fStack_710;
          auVar90._20_4_ = fVar347 * fStack_70c;
          auVar90._24_4_ = fVar350 * fStack_708;
          auVar90._28_4_ = auVar27._28_4_;
          auVar28 = vsubps_avx(auVar90,auVar165);
          auVar283._0_4_ = local_920 + fVar175 * fVar290;
          auVar283._4_4_ = fStack_91c + fVar288 * fVar248;
          auVar283._8_4_ = fStack_918 + fVar249 * fVar269;
          auVar283._12_4_ = fStack_914 + fVar343 * fVar270;
          auVar283._16_4_ = fStack_910 + fVar405 * fVar271;
          auVar283._20_4_ = fStack_90c + fVar400 * fVar272;
          auVar283._24_4_ = fStack_908 + fVar427 * fVar351;
          auVar283._28_4_ = fStack_904 + auVar27._28_4_;
          auVar91._4_4_ = (float)local_760._4_4_ * fVar387;
          auVar91._0_4_ = (float)local_760._0_4_ * fVar370;
          auVar91._8_4_ = fStack_758 * fVar397;
          auVar91._12_4_ = fStack_754 * fVar441;
          auVar91._16_4_ = fStack_750 * fVar442;
          auVar91._20_4_ = fStack_74c * fVar347;
          auVar91._24_4_ = fStack_748 * fVar350;
          auVar91._28_4_ = 0x3e000000;
          auVar26 = vsubps_avx(auVar91,auVar283);
          _local_be0 = auVar26._0_28_;
          auVar260._0_4_ = fVar192 + fVar243 * fVar290;
          auVar260._4_4_ = fVar216 + fVar268 * fVar248;
          auVar260._8_4_ = fVar217 + fVar266 * fVar269;
          auVar260._12_4_ = fVar218 + fVar345 * fVar270;
          auVar260._16_4_ = fVar219 + fVar322 * fVar271;
          auVar260._20_4_ = fVar220 + fVar404 * fVar272;
          auVar260._24_4_ = fVar221 + fVar428 * fVar351;
          auVar260._28_4_ = fVar222 + auVar29._28_4_;
          auVar92._4_4_ = (float)local_740._4_4_ * fVar387;
          auVar92._0_4_ = (float)local_740._0_4_ * fVar370;
          auVar92._8_4_ = fStack_738 * fVar397;
          auVar92._12_4_ = fStack_734 * fVar441;
          auVar92._16_4_ = fStack_730 * fVar442;
          auVar92._20_4_ = fStack_72c * fVar347;
          auVar92._24_4_ = fStack_728 * fVar350;
          auVar92._28_4_ = 0x3e000000;
          _local_a40 = vsubps_avx(auVar92,auVar260);
          fVar245 = fVar245 * (fVar273 * local_620._0_4_ + local_640._0_4_);
          fVar291 = fVar291 * (fVar185 * local_620._4_4_ + local_640._4_4_);
          fVar341 = fVar341 * (fVar244 * local_620._8_4_ + local_640._8_4_);
          fVar401 = fVar401 * (fVar287 * local_620._12_4_ + local_640._12_4_);
          fVar353 = fVar353 * (fVar176 * local_620._16_4_ + local_640._16_4_);
          fVar304 = fVar304 * (fVar289 * local_620._20_4_ + local_640._20_4_);
          fVar434 = fVar434 * (fVar247 * local_620._24_4_ + local_640._24_4_);
          auVar261._0_4_ = fVar332 + fVar286 * fVar245;
          auVar261._4_4_ = fVar340 + fVar246 * fVar291;
          auVar261._8_4_ = fVar342 + fVar267 * fVar341;
          auVar261._12_4_ = fVar344 + fVar348 * fVar401;
          auVar261._16_4_ = fVar346 + fVar371 * fVar353;
          auVar261._20_4_ = fVar349 + fVar408 * fVar304;
          auVar261._24_4_ = fVar352 + fVar429 * fVar434;
          auVar261._28_4_ = fVar354 + local_a40._28_4_ + local_640._28_4_;
          auVar93._4_4_ = fVar185 * (float)local_720._4_4_;
          auVar93._0_4_ = fVar273 * (float)local_720._0_4_;
          auVar93._8_4_ = fVar244 * fStack_718;
          auVar93._12_4_ = fVar287 * fStack_714;
          auVar93._16_4_ = fVar176 * fStack_710;
          auVar93._20_4_ = fVar289 * fStack_70c;
          auVar93._24_4_ = fVar247 * fStack_708;
          auVar93._28_4_ = fStack_704;
          auVar26 = vsubps_avx(auVar93,auVar261);
          auVar265 = ZEXT3264(auVar26);
          auVar314._0_4_ = local_920 + fVar175 * fVar245;
          auVar314._4_4_ = fStack_91c + fVar288 * fVar291;
          auVar314._8_4_ = fStack_918 + fVar249 * fVar341;
          auVar314._12_4_ = fStack_914 + fVar343 * fVar401;
          auVar314._16_4_ = fStack_910 + fVar405 * fVar353;
          auVar314._20_4_ = fStack_90c + fVar400 * fVar304;
          auVar314._24_4_ = fStack_908 + fVar427 * fVar434;
          auVar314._28_4_ = fStack_904 + fStack_704;
          auVar94._4_4_ = (float)local_760._4_4_ * fVar185;
          auVar94._0_4_ = (float)local_760._0_4_ * fVar273;
          auVar94._8_4_ = fStack_758 * fVar244;
          auVar94._12_4_ = fStack_754 * fVar287;
          auVar94._16_4_ = fStack_750 * fVar176;
          auVar94._20_4_ = fStack_74c * fVar289;
          auVar94._24_4_ = fStack_748 * fVar247;
          auVar94._28_4_ = local_2c0._28_4_;
          auVar26 = vsubps_avx(auVar94,auVar314);
          auVar308 = auVar26._0_28_;
          auVar297._0_4_ = fVar192 + fVar243 * fVar245;
          auVar297._4_4_ = fVar216 + fVar268 * fVar291;
          auVar297._8_4_ = fVar217 + fVar266 * fVar341;
          auVar297._12_4_ = fVar218 + fVar345 * fVar401;
          auVar297._16_4_ = fVar219 + fVar322 * fVar353;
          auVar297._20_4_ = fVar220 + fVar404 * fVar304;
          auVar297._24_4_ = fVar221 + fVar428 * fVar434;
          auVar297._28_4_ = fVar222 + 0.125;
          auVar95._4_4_ = (float)local_740._4_4_ * fVar185;
          auVar95._0_4_ = (float)local_740._0_4_ * fVar273;
          auVar95._8_4_ = fStack_738 * fVar244;
          auVar95._12_4_ = fStack_734 * fVar287;
          auVar95._16_4_ = fStack_730 * fVar176;
          auVar95._20_4_ = fStack_72c * fVar289;
          auVar95._24_4_ = fStack_728 * fVar247;
          auVar95._28_4_ = local_2c0._28_4_;
          auVar26 = vsubps_avx(auVar95,auVar297);
          auVar296 = auVar26._0_28_;
          auVar25 = vcmpps_avx(auVar25,_DAT_01f7b000,5);
          auVar329._8_4_ = 0x7f800000;
          auVar329._0_8_ = 0x7f8000007f800000;
          auVar329._12_4_ = 0x7f800000;
          auVar329._16_4_ = 0x7f800000;
          auVar329._20_4_ = 0x7f800000;
          auVar329._24_4_ = 0x7f800000;
          auVar329._28_4_ = 0x7f800000;
          auVar328 = vblendvps_avx(auVar329,auVar88,auVar25);
          auVar26 = vmaxps_avx(local_600,local_2e0);
          auVar96._4_4_ = auVar26._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar26._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar26._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar26._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar26._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar26._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar26._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar26._28_4_;
          auVar26 = vcmpps_avx(local_300,auVar96,1);
          auVar361._8_4_ = 0xff800000;
          auVar361._0_8_ = 0xff800000ff800000;
          auVar361._12_4_ = 0xff800000;
          auVar361._16_4_ = 0xff800000;
          auVar361._20_4_ = 0xff800000;
          auVar361._24_4_ = 0xff800000;
          auVar361._28_4_ = 0xff800000;
          auVar379 = vblendvps_avx(auVar361,auVar89,auVar25);
          auVar27 = auVar25 & auVar26;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar23 = vandps_avx(auVar26,auVar25);
            auVar199 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
            auVar26 = vcmpps_avx(auVar24,_DAT_01f7b000,2);
            auVar173._8_4_ = 0xff800000;
            auVar173._0_8_ = 0xff800000ff800000;
            auVar173._12_4_ = 0xff800000;
            auVar173._16_4_ = 0xff800000;
            auVar173._20_4_ = 0xff800000;
            auVar173._24_4_ = 0xff800000;
            auVar173._28_4_ = 0xff800000;
            auVar362._8_4_ = 0x7f800000;
            auVar362._0_8_ = 0x7f8000007f800000;
            auVar362._12_4_ = 0x7f800000;
            auVar362._16_4_ = 0x7f800000;
            auVar362._20_4_ = 0x7f800000;
            auVar362._24_4_ = 0x7f800000;
            auVar362._28_4_ = 0x7f800000;
            auVar24 = vblendvps_avx(auVar362,auVar173,auVar26);
            auVar252 = vpmovsxwd_avx(auVar199);
            auVar199 = vpunpckhwd_avx(auVar199,auVar199);
            auVar438._16_16_ = auVar199;
            auVar438._0_16_ = auVar252;
            auVar328 = vblendvps_avx(auVar328,auVar24,auVar438);
            auVar24 = vblendvps_avx(auVar173,auVar362,auVar26);
            auVar379 = vblendvps_avx(auVar379,auVar24,auVar438);
            auVar242._0_8_ = auVar23._0_8_ ^ 0xffffffffffffffff;
            auVar242._8_4_ = auVar23._8_4_ ^ 0xffffffff;
            auVar242._12_4_ = auVar23._12_4_ ^ 0xffffffff;
            auVar242._16_4_ = auVar23._16_4_ ^ 0xffffffff;
            auVar242._20_4_ = auVar23._20_4_ ^ 0xffffffff;
            auVar242._24_4_ = auVar23._24_4_ ^ 0xffffffff;
            auVar242._28_4_ = auVar23._28_4_ ^ 0xffffffff;
            auVar33 = vorps_avx(auVar26,auVar242);
            auVar23 = vandps_avx(auVar25,auVar33);
          }
          auVar278 = auVar28._0_28_;
        }
        _local_4a0 = local_780;
        local_480 = vminps_avx(local_440,auVar328);
        auVar25 = vmaxps_avx(local_780,auVar379);
        _local_460 = auVar25;
        auVar24 = vcmpps_avx(local_780,local_480,2);
        auVar330 = ZEXT3264(auVar24);
        local_680 = vandps_avx(auVar24,auVar128);
        auVar363 = ZEXT3264(local_680);
        auVar24 = vcmpps_avx(auVar25,local_440,2);
        auVar128 = vandps_avx(auVar128,auVar24);
        auVar24 = vorps_avx(local_680,auVar128);
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          auVar330 = ZEXT3264(_local_740);
          auVar213._0_8_ = auVar23._0_8_ ^ 0xffffffffffffffff;
          auVar213._8_4_ = auVar23._8_4_ ^ 0xffffffff;
          auVar213._12_4_ = auVar23._12_4_ ^ 0xffffffff;
          auVar213._16_4_ = auVar23._16_4_ ^ 0xffffffff;
          auVar213._20_4_ = auVar23._20_4_ ^ 0xffffffff;
          auVar213._24_4_ = auVar23._24_4_ ^ 0xffffffff;
          auVar213._28_4_ = auVar23._28_4_ ^ 0xffffffff;
          auVar139._0_4_ =
               (float)local_720._0_4_ * auVar265._0_4_ +
               (float)local_760._0_4_ * auVar308._0_4_ + (float)local_740._0_4_ * auVar296._0_4_;
          auVar139._4_4_ =
               (float)local_720._4_4_ * auVar265._4_4_ +
               (float)local_760._4_4_ * auVar308._4_4_ + (float)local_740._4_4_ * auVar296._4_4_;
          auVar139._8_4_ =
               fStack_718 * auVar265._8_4_ +
               fStack_758 * auVar308._8_4_ + fStack_738 * auVar296._8_4_;
          auVar139._12_4_ =
               fStack_714 * auVar265._12_4_ +
               fStack_754 * auVar308._12_4_ + fStack_734 * auVar296._12_4_;
          auVar139._16_4_ =
               fStack_710 * auVar265._16_4_ +
               fStack_750 * auVar308._16_4_ + fStack_730 * auVar296._16_4_;
          auVar139._20_4_ =
               fStack_70c * auVar265._20_4_ +
               fStack_74c * auVar308._20_4_ + fStack_72c * auVar296._20_4_;
          auVar139._24_4_ =
               fStack_708 * auVar265._24_4_ +
               fStack_748 * auVar308._24_4_ + fStack_728 * auVar296._24_4_;
          auVar139._28_4_ = auVar33._28_4_ + auVar128._28_4_ + auVar24._28_4_;
          auVar262._8_4_ = 0x7fffffff;
          auVar262._0_8_ = 0x7fffffff7fffffff;
          auVar262._12_4_ = 0x7fffffff;
          auVar262._16_4_ = 0x7fffffff;
          auVar262._20_4_ = 0x7fffffff;
          auVar262._24_4_ = 0x7fffffff;
          auVar262._28_4_ = 0x7fffffff;
          auVar23 = vandps_avx(auVar139,auVar262);
          auVar298._8_4_ = 0x3e99999a;
          auVar298._0_8_ = 0x3e99999a3e99999a;
          auVar298._12_4_ = 0x3e99999a;
          auVar298._16_4_ = 0x3e99999a;
          auVar298._20_4_ = 0x3e99999a;
          auVar298._24_4_ = 0x3e99999a;
          auVar298._28_4_ = 0x3e99999a;
          auVar23 = vcmpps_avx(auVar23,auVar298,1);
          local_6c0 = vorps_avx(auVar23,auVar213);
          auVar140._0_4_ =
               (float)local_720._0_4_ * auVar278._0_4_ +
               (float)local_760._0_4_ * (float)local_be0._0_4_ +
               (float)local_740._0_4_ * (float)local_a40._0_4_;
          auVar140._4_4_ =
               (float)local_720._4_4_ * auVar278._4_4_ +
               (float)local_760._4_4_ * (float)local_be0._4_4_ +
               (float)local_740._4_4_ * (float)local_a40._4_4_;
          auVar140._8_4_ =
               fStack_718 * auVar278._8_4_ + fStack_758 * fStack_bd8 + fStack_738 * fStack_a38;
          auVar140._12_4_ =
               fStack_714 * auVar278._12_4_ + fStack_754 * fStack_bd4 + fStack_734 * fStack_a34;
          auVar140._16_4_ =
               fStack_710 * auVar278._16_4_ + fStack_750 * fStack_bd0 + fStack_730 * fStack_a30;
          auVar140._20_4_ =
               fStack_70c * auVar278._20_4_ + fStack_74c * fStack_bcc + fStack_72c * fStack_a2c;
          auVar140._24_4_ =
               fStack_708 * auVar278._24_4_ + fStack_748 * fStack_bc8 + fStack_728 * fStack_a28;
          auVar140._28_4_ = local_6c0._28_4_ + fStack_704 + auVar33._28_4_;
          auVar23 = vandps_avx(auVar140,auVar262);
          auVar23 = vcmpps_avx(auVar23,auVar298,1);
          auVar23 = vorps_avx(auVar23,auVar213);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar214._8_4_ = 2;
          auVar214._0_8_ = 0x200000002;
          auVar214._12_4_ = 2;
          auVar214._16_4_ = 2;
          auVar214._20_4_ = 2;
          auVar214._24_4_ = 2;
          auVar214._28_4_ = 2;
          auVar23 = vblendvps_avx(auVar214,auVar166,auVar23);
          local_6e0 = ZEXT432(local_c88);
          local_700 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar199 = vpcmpgtd_avx(auVar23._16_16_,local_700);
          auStack_6f0 = auVar30._16_16_;
          auVar252 = vpcmpgtd_avx(auVar23._0_16_,local_700);
          auVar167._16_16_ = auVar199;
          auVar167._0_16_ = auVar252;
          local_6a0 = vblendps_avx(ZEXT1632(auVar252),auVar167,0xf0);
          local_4c0 = vandnps_avx(local_6a0,local_680);
          local_8a0._4_4_ = local_780._4_4_ + (float)local_940._4_4_;
          local_8a0._0_4_ = local_780._0_4_ + (float)local_940._0_4_;
          fStack_898 = local_780._8_4_ + fStack_938;
          fStack_894 = local_780._12_4_ + fStack_934;
          fStack_890 = local_780._16_4_ + fStack_930;
          fStack_88c = local_780._20_4_ + fStack_92c;
          fStack_888 = local_780._24_4_ + fStack_928;
          fStack_884 = local_780._28_4_ + fStack_924;
          local_2c0 = auVar130;
          while( true ) {
            local_ab0 = auVar38._0_4_;
            fStack_aac = auVar38._4_4_;
            fStack_aa8 = auVar38._8_4_;
            fStack_aa4 = auVar38._12_4_;
            local_bc0 = auVar37._0_4_;
            fStack_bbc = auVar37._4_4_;
            fStack_bb8 = auVar37._8_4_;
            fStack_bb4 = auVar37._12_4_;
            local_bb0._0_4_ = auVar36._0_4_;
            local_bb0._4_4_ = auVar36._4_4_;
            fStack_ba8 = auVar36._8_4_;
            fStack_ba4 = auVar36._12_4_;
            if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4c0 >> 0x7f,0) == '\0') &&
                  (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4c0 >> 0xbf,0) == '\0') &&
                (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4c0[0x1f]) break;
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar23 = vblendvps_avx(auVar168,local_780,local_4c0);
            auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar24 = vminps_avx(auVar23,auVar24);
            auVar26 = vshufpd_avx(auVar24,auVar24,5);
            auVar24 = vminps_avx(auVar24,auVar26);
            auVar26 = vperm2f128_avx(auVar24,auVar24,1);
            auVar24 = vminps_avx(auVar24,auVar26);
            auVar24 = vcmpps_avx(auVar23,auVar24,0);
            auVar26 = local_4c0 & auVar24;
            auVar23 = local_4c0;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar23 = vandps_avx(auVar24,local_4c0);
            }
            uVar105 = vmovmskps_avx(auVar23);
            uVar109 = 0;
            if (uVar105 != 0) {
              for (; (uVar105 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            uVar106 = (ulong)uVar109;
            *(undefined4 *)(local_4c0 + uVar106 * 4) = 0;
            fVar273 = local_1a0[uVar106];
            uVar109 = *(uint *)(local_4a0 + uVar106 * 4);
            fVar175 = auVar34._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              auVar330 = ZEXT1664(auVar330._0_16_);
              fVar175 = sqrtf((float)local_960._0_4_);
              uVar106 = extraout_RAX;
            }
            auVar252 = vminps_avx(auVar36,auVar37);
            auVar199 = vmaxps_avx(auVar36,auVar37);
            auVar227 = vminps_avx(_local_a20,auVar38);
            auVar194 = vminps_avx(auVar252,auVar227);
            auVar252 = vmaxps_avx(_local_a20,auVar38);
            auVar227 = vmaxps_avx(auVar199,auVar252);
            auVar226._8_4_ = 0x7fffffff;
            auVar226._0_8_ = 0x7fffffff7fffffff;
            auVar226._12_4_ = 0x7fffffff;
            auVar199 = vandps_avx(auVar194,auVar226);
            auVar252 = vandps_avx(auVar227,auVar226);
            auVar199 = vmaxps_avx(auVar199,auVar252);
            auVar252 = vmovshdup_avx(auVar199);
            auVar252 = vmaxss_avx(auVar252,auVar199);
            auVar199 = vshufpd_avx(auVar199,auVar199,1);
            auVar199 = vmaxss_avx(auVar199,auVar252);
            local_920 = auVar199._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar175 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar227,auVar227,0xff);
            auVar199 = vinsertps_avx(ZEXT416(uVar109),ZEXT416((uint)fVar273),0x10);
            auVar363 = ZEXT1664(auVar199);
            uVar112 = 0;
            while( true ) {
              auVar199 = auVar363._0_16_;
              bVar115 = (byte)uVar106;
              if (uVar112 == 5) break;
              auVar252 = vshufps_avx(auVar199,auVar199,0);
              auVar119._0_4_ = auVar252._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar119._4_4_ = auVar252._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar119._8_4_ = auVar252._8_4_ * fStack_948 + 0.0;
              auVar119._12_4_ = auVar252._12_4_ * fStack_944 + 0.0;
              auVar252 = vmovshdup_avx(auVar199);
              fVar244 = auVar252._0_4_;
              local_980._0_4_ = 1.0 - fVar244;
              fVar175 = fVar244 * 3.0;
              fVar273 = fVar175 + -5.0;
              fVar243 = (float)local_980._0_4_ * (float)local_980._0_4_;
              auVar252 = ZEXT416((uint)(fVar244 * fVar244 * -(float)local_980._0_4_ * 0.5));
              auVar252 = vshufps_avx(auVar252,auVar252,0);
              auVar227 = ZEXT416((uint)((fVar243 * ((float)local_980._0_4_ * 3.0 + -5.0) + 2.0) *
                                       0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar194 = ZEXT416((uint)((fVar244 * fVar244 * fVar273 + 2.0) * 0.5));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar120 = ZEXT416((uint)((float)local_980._0_4_ * (float)local_980._0_4_ * -fVar244 *
                                       0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar195._0_4_ =
                   auVar120._0_4_ * (float)local_bb0._0_4_ +
                   auVar194._0_4_ * local_bc0 +
                   auVar227._0_4_ * (float)local_a20._0_4_ + auVar252._0_4_ * local_ab0;
              auVar195._4_4_ =
                   auVar120._4_4_ * (float)local_bb0._4_4_ +
                   auVar194._4_4_ * fStack_bbc +
                   auVar227._4_4_ * (float)local_a20._4_4_ + auVar252._4_4_ * fStack_aac;
              auVar195._8_4_ =
                   auVar120._8_4_ * fStack_ba8 +
                   auVar194._8_4_ * fStack_bb8 +
                   auVar227._8_4_ * fStack_a18 + auVar252._8_4_ * fStack_aa8;
              auVar195._12_4_ =
                   auVar120._12_4_ * fStack_ba4 +
                   auVar194._12_4_ * fStack_bb4 +
                   auVar227._12_4_ * fStack_a14 + auVar252._12_4_ * fStack_aa4;
              fVar286 = (float)local_980._0_4_ * -2.0;
              _local_a40 = auVar195;
              auVar227 = vsubps_avx(auVar119,auVar195);
              auVar252 = vdpps_avx(auVar227,auVar227,0x7f);
              fVar185 = auVar252._0_4_;
              if (fVar185 < 0.0) {
                local_980._0_16_ = ZEXT416((uint)local_980._0_4_);
                local_9c0._0_4_ = fVar244 * 9.0;
                local_9e0._0_4_ = fVar273;
                local_a00._0_4_ = fVar243;
                local_860._0_4_ = fVar286;
                fVar287 = sqrtf(fVar185);
                uVar106 = extraout_RAX_00;
                fVar273 = (float)local_9e0._0_4_;
                fVar176 = (float)local_9c0._0_4_;
                fVar286 = (float)local_860._0_4_;
                fVar243 = (float)local_a00._0_4_;
              }
              else {
                auVar194 = vsqrtss_avx(auVar252,auVar252);
                fVar287 = auVar194._0_4_;
                fVar176 = fVar244 * 9.0;
              }
              auVar194 = ZEXT416((uint)((fVar244 * fVar244 + fVar244 * fVar286) * 0.5));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar120 = ZEXT416((uint)((((float)local_980._0_4_ + (float)local_980._0_4_) *
                                         (fVar175 + 2.0) +
                                        (float)local_980._0_4_ * (float)local_980._0_4_ * -3.0) *
                                       0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar196 = ZEXT416((uint)((fVar273 * (fVar244 + fVar244) + fVar244 * fVar175) * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar152 = ZEXT416((uint)((fVar244 * ((float)local_980._0_4_ + (float)local_980._0_4_)
                                        - fVar243) * 0.5));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar373._0_4_ =
                   (float)local_bb0._0_4_ * auVar152._0_4_ +
                   local_bc0 * auVar196._0_4_ +
                   local_ab0 * auVar194._0_4_ + (float)local_a20._0_4_ * auVar120._0_4_;
              auVar373._4_4_ =
                   (float)local_bb0._4_4_ * auVar152._4_4_ +
                   fStack_bbc * auVar196._4_4_ +
                   fStack_aac * auVar194._4_4_ + (float)local_a20._4_4_ * auVar120._4_4_;
              auVar373._8_4_ =
                   fStack_ba8 * auVar152._8_4_ +
                   fStack_bb8 * auVar196._8_4_ +
                   fStack_aa8 * auVar194._8_4_ + fStack_a18 * auVar120._8_4_;
              auVar373._12_4_ =
                   fStack_ba4 * auVar152._12_4_ +
                   fStack_bb4 * auVar196._12_4_ +
                   fStack_aa4 * auVar194._12_4_ + fStack_a14 * auVar120._12_4_;
              auVar152 = vpermilps_avx(ZEXT416((uint)(fVar175 + -1.0)),0);
              auVar9 = vpermilps_avx(ZEXT416((uint)(fVar244 * -9.0 + 4.0)),0);
              auVar194 = vshufps_avx(ZEXT416((uint)(fVar176 + -5.0)),ZEXT416((uint)(fVar176 + -5.0))
                                     ,0);
              auVar120 = ZEXT416((uint)(fVar244 * -3.0 + 2.0));
              auVar196 = vshufps_avx(auVar120,auVar120,0);
              auVar120 = vdpps_avx(auVar373,auVar373,0x7f);
              auVar153._0_4_ =
                   (float)local_bb0._0_4_ * auVar196._0_4_ +
                   local_bc0 * auVar194._0_4_ +
                   (float)local_a20._0_4_ * auVar9._0_4_ + local_ab0 * auVar152._0_4_;
              auVar153._4_4_ =
                   (float)local_bb0._4_4_ * auVar196._4_4_ +
                   fStack_bbc * auVar194._4_4_ +
                   (float)local_a20._4_4_ * auVar9._4_4_ + fStack_aac * auVar152._4_4_;
              auVar153._8_4_ =
                   fStack_ba8 * auVar196._8_4_ +
                   fStack_bb8 * auVar194._8_4_ +
                   fStack_a18 * auVar9._8_4_ + fStack_aa8 * auVar152._8_4_;
              auVar153._12_4_ =
                   fStack_ba4 * auVar196._12_4_ +
                   fStack_bb4 * auVar194._12_4_ +
                   fStack_a14 * auVar9._12_4_ + fStack_aa4 * auVar152._12_4_;
              auVar194 = vblendps_avx(auVar120,_DAT_01f45a50,0xe);
              auVar196 = vrsqrtss_avx(auVar194,auVar194);
              fVar175 = auVar196._0_4_;
              fVar273 = auVar120._0_4_;
              auVar196 = vdpps_avx(auVar373,auVar153,0x7f);
              auVar152 = vshufps_avx(auVar120,auVar120,0);
              auVar154._0_4_ = auVar153._0_4_ * auVar152._0_4_;
              auVar154._4_4_ = auVar153._4_4_ * auVar152._4_4_;
              auVar154._8_4_ = auVar153._8_4_ * auVar152._8_4_;
              auVar154._12_4_ = auVar153._12_4_ * auVar152._12_4_;
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar253._0_4_ = auVar373._0_4_ * auVar196._0_4_;
              auVar253._4_4_ = auVar373._4_4_ * auVar196._4_4_;
              auVar253._8_4_ = auVar373._8_4_ * auVar196._8_4_;
              auVar253._12_4_ = auVar373._12_4_ * auVar196._12_4_;
              auVar9 = vsubps_avx(auVar154,auVar253);
              auVar196 = vrcpss_avx(auVar194,auVar194);
              auVar194 = vmaxss_avx(ZEXT416((uint)local_920),
                                    ZEXT416((uint)(auVar363._0_4_ * (float)local_9a0._0_4_)));
              auVar196 = ZEXT416((uint)(auVar196._0_4_ * (2.0 - fVar273 * auVar196._0_4_)));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              uVar97 = CONCAT44(auVar373._4_4_,auVar373._0_4_);
              auVar307._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar307._8_4_ = -auVar373._8_4_;
              auVar307._12_4_ = -auVar373._12_4_;
              auVar152 = ZEXT416((uint)(fVar175 * 1.5 + fVar273 * -0.5 * fVar175 * fVar175 * fVar175
                                       ));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar228._0_4_ = auVar152._0_4_ * auVar9._0_4_ * auVar196._0_4_;
              auVar228._4_4_ = auVar152._4_4_ * auVar9._4_4_ * auVar196._4_4_;
              auVar228._8_4_ = auVar152._8_4_ * auVar9._8_4_ * auVar196._8_4_;
              auVar228._12_4_ = auVar152._12_4_ * auVar9._12_4_ * auVar196._12_4_;
              local_980._0_4_ = auVar373._0_4_ * auVar152._0_4_;
              local_980._4_4_ = auVar373._4_4_ * auVar152._4_4_;
              local_980._8_4_ = auVar373._8_4_ * auVar152._8_4_;
              local_980._12_4_ = auVar373._12_4_ * auVar152._12_4_;
              if (fVar273 < 0.0) {
                fVar273 = sqrtf(fVar273);
                uVar106 = extraout_RAX_01;
              }
              else {
                auVar120 = vsqrtss_avx(auVar120,auVar120);
                fVar273 = auVar120._0_4_;
              }
              auVar120 = vdpps_avx(auVar227,local_980._0_16_,0x7f);
              fVar273 = (local_920 / fVar273) * (fVar287 + 1.0) +
                        auVar194._0_4_ + fVar287 * local_920;
              auVar196 = vdpps_avx(auVar307,local_980._0_16_,0x7f);
              auVar152 = vdpps_avx(auVar227,auVar228,0x7f);
              auVar9 = vdpps_avx(_local_950,local_980._0_16_,0x7f);
              auVar10 = vdpps_avx(auVar227,auVar307,0x7f);
              fVar175 = auVar196._0_4_ + auVar152._0_4_;
              fVar243 = auVar120._0_4_;
              auVar121._0_4_ = fVar243 * fVar243;
              auVar121._4_4_ = auVar120._4_4_ * auVar120._4_4_;
              auVar121._8_4_ = auVar120._8_4_ * auVar120._8_4_;
              auVar121._12_4_ = auVar120._12_4_ * auVar120._12_4_;
              auVar152 = vsubps_avx(auVar252,auVar121);
              local_980._0_16_ = ZEXT416((uint)fVar175);
              auVar196 = vdpps_avx(auVar227,_local_950,0x7f);
              fVar286 = auVar10._0_4_ - fVar243 * fVar175;
              fVar243 = auVar196._0_4_ - fVar243 * auVar9._0_4_;
              auVar196 = vrsqrtss_avx(auVar152,auVar152);
              fVar244 = auVar152._0_4_;
              fVar175 = auVar196._0_4_;
              fVar175 = fVar175 * 1.5 + fVar244 * -0.5 * fVar175 * fVar175 * fVar175;
              if (fVar244 < 0.0) {
                local_9c0._0_4_ = fVar286;
                local_9e0._0_4_ = fVar243;
                local_a00._0_4_ = fVar175;
                fVar244 = sqrtf(fVar244);
                uVar106 = extraout_RAX_02;
                fVar175 = (float)local_a00._0_4_;
                fVar286 = (float)local_9c0._0_4_;
                fVar243 = (float)local_9e0._0_4_;
              }
              else {
                auVar196 = vsqrtss_avx(auVar152,auVar152);
                fVar244 = auVar196._0_4_;
              }
              auVar330 = ZEXT1664(auVar252);
              auVar10 = vpermilps_avx(_local_a40,0xff);
              auVar11 = vshufps_avx(auVar373,auVar373,0xff);
              fVar286 = fVar286 * fVar175 - auVar11._0_4_;
              auVar254._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar9._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar9._12_4_ ^ 0x80000000;
              auVar275._0_4_ = -fVar286;
              auVar275._4_4_ = 0x80000000;
              auVar275._8_4_ = 0x80000000;
              auVar275._12_4_ = 0x80000000;
              auVar196 = vinsertps_avx(auVar275,ZEXT416((uint)(fVar243 * fVar175)),0x1c);
              auVar9 = vmovsldup_avx(ZEXT416((uint)(local_980._0_4_ * fVar243 * fVar175 -
                                                   auVar9._0_4_ * fVar286)));
              auVar196 = vdivps_avx(auVar196,auVar9);
              auVar152 = vinsertps_avx(local_980._0_16_,auVar254,0x10);
              auVar152 = vdivps_avx(auVar152,auVar9);
              auVar9 = vmovsldup_avx(auVar120);
              auVar155 = ZEXT416((uint)(fVar244 - auVar10._0_4_));
              auVar10 = vmovsldup_avx(auVar155);
              auVar197._0_4_ = auVar9._0_4_ * auVar196._0_4_ + auVar10._0_4_ * auVar152._0_4_;
              auVar197._4_4_ = auVar9._4_4_ * auVar196._4_4_ + auVar10._4_4_ * auVar152._4_4_;
              auVar197._8_4_ = auVar9._8_4_ * auVar196._8_4_ + auVar10._8_4_ * auVar152._8_4_;
              auVar197._12_4_ = auVar9._12_4_ * auVar196._12_4_ + auVar10._12_4_ * auVar152._12_4_;
              auVar196 = vsubps_avx(auVar199,auVar197);
              auVar363 = ZEXT1664(auVar196);
              auVar198._8_4_ = 0x7fffffff;
              auVar198._0_8_ = 0x7fffffff7fffffff;
              auVar198._12_4_ = 0x7fffffff;
              auVar199 = vandps_avx(auVar120,auVar198);
              if (auVar199._0_4_ < fVar273) {
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar199 = vandps_avx(auVar155,auVar229);
                if (auVar199._0_4_ <
                    (float)local_880._0_4_ * 1.9073486e-06 + auVar194._0_4_ + fVar273) {
                  bVar114 = uVar112 < 5;
                  fVar273 = auVar196._0_4_ + (float)local_8f0._0_4_;
                  if ((fVar223 <= fVar273) &&
                     (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar273 <= fVar175)) {
                    auVar199 = vmovshdup_avx(auVar196);
                    bVar115 = 0;
                    if ((auVar199._0_4_ < 0.0) || (1.0 < auVar199._0_4_)) goto LAB_00b37a5d;
                    auVar199 = vrsqrtss_avx(auVar252,auVar252);
                    fVar243 = auVar199._0_4_;
                    pGVar18 = (context->scene->geometries).items[uVar110].ptr;
                    if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar115 = 1, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar199 = ZEXT416((uint)(fVar243 * 1.5 +
                                                 fVar185 * -0.5 * fVar243 * fVar243 * fVar243));
                        auVar199 = vshufps_avx(auVar199,auVar199,0);
                        local_ae0 = auVar227._0_4_;
                        fStack_adc = auVar227._4_4_;
                        fStack_ad8 = auVar227._8_4_;
                        fStack_ad4 = auVar227._12_4_;
                        auVar200._0_4_ = auVar199._0_4_ * local_ae0;
                        auVar200._4_4_ = auVar199._4_4_ * fStack_adc;
                        auVar200._8_4_ = auVar199._8_4_ * fStack_ad8;
                        auVar200._12_4_ = auVar199._12_4_ * fStack_ad4;
                        auVar122._0_4_ = auVar373._0_4_ + auVar11._0_4_ * auVar200._0_4_;
                        auVar122._4_4_ = auVar373._4_4_ + auVar11._4_4_ * auVar200._4_4_;
                        auVar122._8_4_ = auVar373._8_4_ + auVar11._8_4_ * auVar200._8_4_;
                        auVar122._12_4_ = auVar373._12_4_ + auVar11._12_4_ * auVar200._12_4_;
                        auVar199 = vshufps_avx(auVar200,auVar200,0xc9);
                        auVar227 = vshufps_avx(auVar373,auVar373,0xc9);
                        auVar201._0_4_ = auVar227._0_4_ * auVar200._0_4_;
                        auVar201._4_4_ = auVar227._4_4_ * auVar200._4_4_;
                        auVar201._8_4_ = auVar227._8_4_ * auVar200._8_4_;
                        auVar201._12_4_ = auVar227._12_4_ * auVar200._12_4_;
                        auVar230._0_4_ = auVar373._0_4_ * auVar199._0_4_;
                        auVar230._4_4_ = auVar373._4_4_ * auVar199._4_4_;
                        auVar230._8_4_ = auVar373._8_4_ * auVar199._8_4_;
                        auVar230._12_4_ = auVar373._12_4_ * auVar199._12_4_;
                        auVar194 = vsubps_avx(auVar230,auVar201);
                        auVar199 = vshufps_avx(auVar194,auVar194,0xc9);
                        auVar227 = vshufps_avx(auVar122,auVar122,0xc9);
                        auVar231._0_4_ = auVar227._0_4_ * auVar199._0_4_;
                        auVar231._4_4_ = auVar227._4_4_ * auVar199._4_4_;
                        auVar231._8_4_ = auVar227._8_4_ * auVar199._8_4_;
                        auVar231._12_4_ = auVar227._12_4_ * auVar199._12_4_;
                        auVar199 = vshufps_avx(auVar194,auVar194,0xd2);
                        auVar123._0_4_ = auVar122._0_4_ * auVar199._0_4_;
                        auVar123._4_4_ = auVar122._4_4_ * auVar199._4_4_;
                        auVar123._8_4_ = auVar122._8_4_ * auVar199._8_4_;
                        auVar123._12_4_ = auVar122._12_4_ * auVar199._12_4_;
                        auVar199 = vsubps_avx(auVar231,auVar123);
                        local_7f0 = vshufps_avx(auVar196,auVar196,0x55);
                        local_820 = (RTCHitN  [16])vshufps_avx(auVar199,auVar199,0x55);
                        auStack_810 = vshufps_avx(auVar199,auVar199,0xaa);
                        local_800 = vshufps_avx(auVar199,auVar199,0);
                        local_7e0 = ZEXT816(0) << 0x20;
                        local_7d0 = local_840._0_8_;
                        uStack_7c8 = local_840._8_8_;
                        local_7c0 = local_830;
                        vcmpps_avx(ZEXT1632(local_830),ZEXT1632(local_830),0xf);
                        uStack_7ac = context->user->instID[0];
                        local_7b0 = uStack_7ac;
                        uStack_7a8 = uStack_7ac;
                        uStack_7a4 = uStack_7ac;
                        uStack_7a0 = context->user->instPrimID[0];
                        uStack_79c = uStack_7a0;
                        uStack_798 = uStack_7a0;
                        uStack_794 = uStack_7a0;
                        *(float *)(ray + k * 4 + 0x80) = fVar273;
                        auVar199 = *(undefined1 (*) [16])
                                    (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_8c0._0_16_ = auVar199;
                        local_a70.valid = (int *)local_8c0;
                        local_a70.geometryUserPtr = pGVar18->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_820;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar330 = ZEXT1664(auVar252);
                          auVar363 = ZEXT1664(auVar196);
                          (*pGVar18->occlusionFilterN)(&local_a70);
                          auVar199 = local_8c0._0_16_;
                        }
                        if (auVar199 == (undefined1  [16])0x0) {
                          auVar199 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar199 = auVar199 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var22 = context->args->filter;
                          if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar330 = ZEXT1664(auVar330._0_16_);
                            auVar363 = ZEXT1664(auVar363._0_16_);
                            (*p_Var22)(&local_a70);
                            auVar199 = local_8c0._0_16_;
                          }
                          auVar252 = vpcmpeqd_avx(auVar199,_DAT_01f45a50);
                          auVar199 = auVar252 ^ _DAT_01f46b70;
                          auVar202._8_4_ = 0xff800000;
                          auVar202._0_8_ = 0xff800000ff800000;
                          auVar202._12_4_ = 0xff800000;
                          auVar252 = vblendvps_avx(auVar202,*(undefined1 (*) [16])
                                                             (local_a70.ray + 0x80),auVar252);
                          *(undefined1 (*) [16])(local_a70.ray + 0x80) = auVar252;
                        }
                        auVar156._8_8_ = 0x100000001;
                        auVar156._0_8_ = 0x100000001;
                        bVar115 = (auVar156 & auVar199) != (undefined1  [16])0x0;
                        if (!(bool)bVar115) {
                          *(float *)(ray + k * 4 + 0x80) = fVar175;
                        }
                      }
                      goto LAB_00b37a5d;
                    }
                  }
                  bVar115 = 0;
                  goto LAB_00b37a5d;
                }
              }
              uVar112 = uVar112 + 1;
            }
            bVar114 = false;
LAB_00b37a5d:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar135._4_4_ = uVar8;
            auVar135._0_4_ = uVar8;
            auVar135._8_4_ = uVar8;
            auVar135._12_4_ = uVar8;
            auVar135._16_4_ = uVar8;
            auVar135._20_4_ = uVar8;
            auVar135._24_4_ = uVar8;
            auVar135._28_4_ = uVar8;
            bVar113 = bVar113 | bVar114 & bVar115;
            auVar23 = vcmpps_avx(_local_8a0,auVar135,2);
            local_4c0 = vandps_avx(auVar23,local_4c0);
          }
          auVar141._0_4_ = auVar25._0_4_ + (float)local_940._0_4_;
          auVar141._4_4_ = auVar25._4_4_ + (float)local_940._4_4_;
          auVar141._8_4_ = auVar25._8_4_ + fStack_938;
          auVar141._12_4_ = auVar25._12_4_ + fStack_934;
          auVar141._16_4_ = auVar25._16_4_ + fStack_930;
          auVar141._20_4_ = auVar25._20_4_ + fStack_92c;
          auVar141._24_4_ = auVar25._24_4_ + fStack_928;
          auVar141._28_4_ = auVar25._28_4_ + fStack_924;
          auVar199 = vshufps_avx(auVar135._0_16_,auVar135._0_16_,0);
          auVar169._16_16_ = auVar199;
          auVar169._0_16_ = auVar199;
          auVar23 = vcmpps_avx(auVar141,auVar169,2);
          _local_8a0 = vandps_avx(auVar23,auVar128);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar128 = vblendvps_avx(auVar170,auVar142,local_6c0);
          auVar199 = vpcmpgtd_avx(auVar128._16_16_,local_700);
          auVar252 = vpshufd_avx(local_6e0._0_16_,0);
          auVar252 = vpcmpgtd_avx(auVar128._0_16_,auVar252);
          auVar171._16_16_ = auVar199;
          auVar171._0_16_ = auVar252;
          auVar128 = vblendps_avx(ZEXT1632(auVar252),auVar171,0xf0);
          local_8c0 = vandnps_avx(auVar128,_local_8a0);
          local_780 = _local_460;
          local_b40._4_4_ = (float)local_940._4_4_ + (float)local_460._4_4_;
          local_b40._0_4_ = (float)local_940._0_4_ + (float)local_460._0_4_;
          fStack_b38 = fStack_938 + fStack_458;
          fStack_b34 = fStack_934 + fStack_454;
          fStack_b30 = fStack_930 + fStack_450;
          fStack_b2c = fStack_92c + fStack_44c;
          fStack_b28 = fStack_928 + fStack_448;
          fStack_b24 = fStack_924 + fStack_444;
          for (; (((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_8c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_8c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_8c0 >> 0x7f,0) != '\0') ||
                   (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_8c0 >> 0xbf,0) != '\0') ||
                 (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_8c0[0x1f] < '\0'; local_8c0 = vandps_avx(auVar23,local_8c0)) {
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar23 = vblendvps_avx(auVar172,local_780,local_8c0);
            auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar24 = vminps_avx(auVar23,auVar24);
            auVar25 = vshufpd_avx(auVar24,auVar24,5);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar25 = vperm2f128_avx(auVar24,auVar24,1);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar24 = vcmpps_avx(auVar23,auVar24,0);
            auVar25 = local_8c0 & auVar24;
            auVar23 = local_8c0;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar23 = vandps_avx(auVar24,local_8c0);
            }
            uVar105 = vmovmskps_avx(auVar23);
            uVar109 = 0;
            if (uVar105 != 0) {
              for (; (uVar105 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            uVar106 = (ulong)uVar109;
            *(undefined4 *)(local_8c0 + uVar106 * 4) = 0;
            fVar273 = local_1c0[uVar106];
            uVar109 = *(uint *)(local_440 + uVar106 * 4);
            fVar175 = auVar150._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              auVar330 = ZEXT1664(auVar330._0_16_);
              fVar175 = sqrtf((float)local_960._0_4_);
              uVar106 = extraout_RAX_03;
            }
            auVar252 = vminps_avx(auVar36,auVar37);
            auVar199 = vmaxps_avx(auVar36,auVar37);
            auVar227 = vminps_avx(_local_a20,auVar38);
            auVar194 = vminps_avx(auVar252,auVar227);
            auVar252 = vmaxps_avx(_local_a20,auVar38);
            auVar227 = vmaxps_avx(auVar199,auVar252);
            auVar232._8_4_ = 0x7fffffff;
            auVar232._0_8_ = 0x7fffffff7fffffff;
            auVar232._12_4_ = 0x7fffffff;
            auVar199 = vandps_avx(auVar194,auVar232);
            auVar252 = vandps_avx(auVar227,auVar232);
            auVar199 = vmaxps_avx(auVar199,auVar252);
            auVar252 = vmovshdup_avx(auVar199);
            auVar252 = vmaxss_avx(auVar252,auVar199);
            auVar199 = vshufpd_avx(auVar199,auVar199,1);
            auVar199 = vmaxss_avx(auVar199,auVar252);
            local_920 = auVar199._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar175 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar227,auVar227,0xff);
            auVar199 = vinsertps_avx(ZEXT416(uVar109),ZEXT416((uint)fVar273),0x10);
            auVar363 = ZEXT1664(auVar199);
            uVar112 = 0;
            while( true ) {
              auVar199 = auVar363._0_16_;
              bVar115 = (byte)uVar106;
              if (uVar112 == 5) break;
              auVar252 = vshufps_avx(auVar199,auVar199,0);
              auVar124._0_4_ = auVar252._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar124._4_4_ = auVar252._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar124._8_4_ = auVar252._8_4_ * fStack_948 + 0.0;
              auVar124._12_4_ = auVar252._12_4_ * fStack_944 + 0.0;
              auVar252 = vmovshdup_avx(auVar199);
              fVar244 = auVar252._0_4_;
              fVar286 = 1.0 - fVar244;
              fVar175 = fVar244 * 3.0;
              fVar273 = fVar175 + -5.0;
              fVar243 = fVar286 * fVar286;
              auVar252 = ZEXT416((uint)(fVar244 * fVar244 * -fVar286 * 0.5));
              auVar252 = vshufps_avx(auVar252,auVar252,0);
              auVar227 = ZEXT416((uint)((fVar243 * (fVar286 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar194 = ZEXT416((uint)((fVar244 * fVar244 * fVar273 + 2.0) * 0.5));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar120 = ZEXT416((uint)(fVar286 * fVar286 * -fVar244 * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar203._0_4_ =
                   auVar120._0_4_ * (float)local_bb0._0_4_ +
                   auVar194._0_4_ * local_bc0 +
                   auVar227._0_4_ * (float)local_a20._0_4_ + auVar252._0_4_ * local_ab0;
              auVar203._4_4_ =
                   auVar120._4_4_ * (float)local_bb0._4_4_ +
                   auVar194._4_4_ * fStack_bbc +
                   auVar227._4_4_ * (float)local_a20._4_4_ + auVar252._4_4_ * fStack_aac;
              auVar203._8_4_ =
                   auVar120._8_4_ * fStack_ba8 +
                   auVar194._8_4_ * fStack_bb8 +
                   auVar227._8_4_ * fStack_a18 + auVar252._8_4_ * fStack_aa8;
              auVar203._12_4_ =
                   auVar120._12_4_ * fStack_ba4 +
                   auVar194._12_4_ * fStack_bb4 +
                   auVar227._12_4_ * fStack_a14 + auVar252._12_4_ * fStack_aa4;
              _local_a40 = auVar203;
              auVar227 = vsubps_avx(auVar124,auVar203);
              auVar252 = vdpps_avx(auVar227,auVar227,0x7f);
              fVar185 = auVar252._0_4_;
              if (fVar185 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar286);
                local_9c0._0_4_ = fVar244 * 9.0;
                local_9e0._0_4_ = fVar273;
                local_a00._0_4_ = fVar243;
                local_860._0_4_ = fVar286 * -2.0;
                fVar287 = sqrtf(fVar185);
                uVar106 = extraout_RAX_04;
                fVar245 = (float)local_9c0._0_4_;
                fVar176 = (float)local_860._0_4_;
                fVar273 = (float)local_9e0._0_4_;
                fVar243 = (float)local_a00._0_4_;
                fVar286 = (float)local_9a0._0_4_;
              }
              else {
                auVar194 = vsqrtss_avx(auVar252,auVar252);
                fVar287 = auVar194._0_4_;
                fVar245 = fVar244 * 9.0;
                fVar176 = fVar286 * -2.0;
              }
              auVar194 = ZEXT416((uint)((fVar244 * fVar244 + fVar244 * fVar176) * 0.5));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar120 = ZEXT416((uint)(((fVar286 + fVar286) * (fVar175 + 2.0) +
                                        fVar286 * fVar286 * -3.0) * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar196 = ZEXT416((uint)((fVar273 * (fVar244 + fVar244) + fVar244 * fVar175) * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar152 = ZEXT416((uint)((fVar244 * (fVar286 + fVar286) - fVar243) * 0.5));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar374._0_4_ =
                   (float)local_bb0._0_4_ * auVar152._0_4_ +
                   local_bc0 * auVar196._0_4_ +
                   local_ab0 * auVar194._0_4_ + (float)local_a20._0_4_ * auVar120._0_4_;
              auVar374._4_4_ =
                   (float)local_bb0._4_4_ * auVar152._4_4_ +
                   fStack_bbc * auVar196._4_4_ +
                   fStack_aac * auVar194._4_4_ + (float)local_a20._4_4_ * auVar120._4_4_;
              auVar374._8_4_ =
                   fStack_ba8 * auVar152._8_4_ +
                   fStack_bb8 * auVar196._8_4_ +
                   fStack_aa8 * auVar194._8_4_ + fStack_a18 * auVar120._8_4_;
              auVar374._12_4_ =
                   fStack_ba4 * auVar152._12_4_ +
                   fStack_bb4 * auVar196._12_4_ +
                   fStack_aa4 * auVar194._12_4_ + fStack_a14 * auVar120._12_4_;
              auVar152 = vpermilps_avx(ZEXT416((uint)(fVar175 + -1.0)),0);
              auVar9 = vpermilps_avx(ZEXT416((uint)(fVar244 * -9.0 + 4.0)),0);
              auVar194 = vshufps_avx(ZEXT416((uint)(fVar245 + -5.0)),ZEXT416((uint)(fVar245 + -5.0))
                                     ,0);
              auVar120 = ZEXT416((uint)(fVar244 * -3.0 + 2.0));
              auVar196 = vshufps_avx(auVar120,auVar120,0);
              auVar120 = vdpps_avx(auVar374,auVar374,0x7f);
              auVar157._0_4_ =
                   (float)local_bb0._0_4_ * auVar196._0_4_ +
                   local_bc0 * auVar194._0_4_ +
                   (float)local_a20._0_4_ * auVar9._0_4_ + local_ab0 * auVar152._0_4_;
              auVar157._4_4_ =
                   (float)local_bb0._4_4_ * auVar196._4_4_ +
                   fStack_bbc * auVar194._4_4_ +
                   (float)local_a20._4_4_ * auVar9._4_4_ + fStack_aac * auVar152._4_4_;
              auVar157._8_4_ =
                   fStack_ba8 * auVar196._8_4_ +
                   fStack_bb8 * auVar194._8_4_ +
                   fStack_a18 * auVar9._8_4_ + fStack_aa8 * auVar152._8_4_;
              auVar157._12_4_ =
                   fStack_ba4 * auVar196._12_4_ +
                   fStack_bb4 * auVar194._12_4_ +
                   fStack_a14 * auVar9._12_4_ + fStack_aa4 * auVar152._12_4_;
              auVar194 = vblendps_avx(auVar120,_DAT_01f45a50,0xe);
              auVar196 = vrsqrtss_avx(auVar194,auVar194);
              fVar175 = auVar196._0_4_;
              fVar273 = auVar120._0_4_;
              auVar196 = vdpps_avx(auVar374,auVar157,0x7f);
              auVar152 = vshufps_avx(auVar120,auVar120,0);
              auVar158._0_4_ = auVar157._0_4_ * auVar152._0_4_;
              auVar158._4_4_ = auVar157._4_4_ * auVar152._4_4_;
              auVar158._8_4_ = auVar157._8_4_ * auVar152._8_4_;
              auVar158._12_4_ = auVar157._12_4_ * auVar152._12_4_;
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar255._0_4_ = auVar374._0_4_ * auVar196._0_4_;
              auVar255._4_4_ = auVar374._4_4_ * auVar196._4_4_;
              auVar255._8_4_ = auVar374._8_4_ * auVar196._8_4_;
              auVar255._12_4_ = auVar374._12_4_ * auVar196._12_4_;
              auVar9 = vsubps_avx(auVar158,auVar255);
              auVar196 = vrcpss_avx(auVar194,auVar194);
              auVar194 = vmaxss_avx(ZEXT416((uint)local_920),
                                    ZEXT416((uint)(auVar363._0_4_ * (float)local_980._0_4_)));
              auVar196 = ZEXT416((uint)(auVar196._0_4_ * (2.0 - fVar273 * auVar196._0_4_)));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              uVar97 = CONCAT44(auVar374._4_4_,auVar374._0_4_);
              auVar276._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar276._8_4_ = -auVar374._8_4_;
              auVar276._12_4_ = -auVar374._12_4_;
              auVar152 = ZEXT416((uint)(fVar175 * 1.5 + fVar273 * -0.5 * fVar175 * fVar175 * fVar175
                                       ));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar233._0_4_ = auVar152._0_4_ * auVar9._0_4_ * auVar196._0_4_;
              auVar233._4_4_ = auVar152._4_4_ * auVar9._4_4_ * auVar196._4_4_;
              auVar233._8_4_ = auVar152._8_4_ * auVar9._8_4_ * auVar196._8_4_;
              auVar233._12_4_ = auVar152._12_4_ * auVar9._12_4_ * auVar196._12_4_;
              auVar295._0_4_ = auVar374._0_4_ * auVar152._0_4_;
              auVar295._4_4_ = auVar374._4_4_ * auVar152._4_4_;
              auVar295._8_4_ = auVar374._8_4_ * auVar152._8_4_;
              auVar295._12_4_ = auVar374._12_4_ * auVar152._12_4_;
              if (fVar273 < 0.0) {
                local_9a0._0_16_ = auVar295;
                fVar273 = sqrtf(fVar273);
                uVar106 = extraout_RAX_05;
                auVar295 = local_9a0._0_16_;
              }
              else {
                auVar120 = vsqrtss_avx(auVar120,auVar120);
                fVar273 = auVar120._0_4_;
              }
              auVar120 = vdpps_avx(auVar227,auVar295,0x7f);
              fVar273 = (local_920 / fVar273) * (fVar287 + 1.0) +
                        fVar287 * local_920 + auVar194._0_4_;
              auVar196 = vdpps_avx(auVar276,auVar295,0x7f);
              auVar152 = vdpps_avx(auVar227,auVar233,0x7f);
              auVar9 = vdpps_avx(_local_950,auVar295,0x7f);
              auVar10 = vdpps_avx(auVar227,auVar276,0x7f);
              fVar175 = auVar196._0_4_ + auVar152._0_4_;
              fVar243 = auVar120._0_4_;
              auVar125._0_4_ = fVar243 * fVar243;
              auVar125._4_4_ = auVar120._4_4_ * auVar120._4_4_;
              auVar125._8_4_ = auVar120._8_4_ * auVar120._8_4_;
              auVar125._12_4_ = auVar120._12_4_ * auVar120._12_4_;
              auVar152 = vsubps_avx(auVar252,auVar125);
              auVar196 = vdpps_avx(auVar227,_local_950,0x7f);
              fVar286 = auVar10._0_4_ - fVar243 * fVar175;
              fVar244 = auVar196._0_4_ - fVar243 * auVar9._0_4_;
              auVar196 = vrsqrtss_avx(auVar152,auVar152);
              fVar287 = auVar152._0_4_;
              fVar243 = auVar196._0_4_;
              fVar243 = fVar243 * 1.5 + fVar287 * -0.5 * fVar243 * fVar243 * fVar243;
              if (fVar287 < 0.0) {
                local_9a0._0_16_ = auVar120;
                local_9c0._0_4_ = fVar286;
                local_9e0._0_4_ = fVar244;
                local_a00._0_4_ = fVar243;
                fVar287 = sqrtf(fVar287);
                uVar106 = extraout_RAX_06;
                fVar243 = (float)local_a00._0_4_;
                fVar286 = (float)local_9c0._0_4_;
                fVar244 = (float)local_9e0._0_4_;
                auVar120 = local_9a0._0_16_;
              }
              else {
                auVar196 = vsqrtss_avx(auVar152,auVar152);
                fVar287 = auVar196._0_4_;
              }
              auVar330 = ZEXT1664(auVar252);
              auVar10 = vpermilps_avx(_local_a40,0xff);
              auVar11 = vshufps_avx(auVar374,auVar374,0xff);
              fVar286 = fVar286 * fVar243 - auVar11._0_4_;
              auVar256._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar9._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar9._12_4_ ^ 0x80000000;
              auVar277._0_4_ = -fVar286;
              auVar277._4_4_ = 0x80000000;
              auVar277._8_4_ = 0x80000000;
              auVar277._12_4_ = 0x80000000;
              auVar196 = vinsertps_avx(auVar277,ZEXT416((uint)(fVar244 * fVar243)),0x1c);
              auVar9 = vmovsldup_avx(ZEXT416((uint)(fVar175 * fVar244 * fVar243 -
                                                   auVar9._0_4_ * fVar286)));
              auVar196 = vdivps_avx(auVar196,auVar9);
              auVar152 = vinsertps_avx(ZEXT416((uint)fVar175),auVar256,0x10);
              auVar152 = vdivps_avx(auVar152,auVar9);
              auVar9 = vmovsldup_avx(auVar120);
              auVar155 = ZEXT416((uint)(fVar287 - auVar10._0_4_));
              auVar10 = vmovsldup_avx(auVar155);
              auVar204._0_4_ = auVar9._0_4_ * auVar196._0_4_ + auVar10._0_4_ * auVar152._0_4_;
              auVar204._4_4_ = auVar9._4_4_ * auVar196._4_4_ + auVar10._4_4_ * auVar152._4_4_;
              auVar204._8_4_ = auVar9._8_4_ * auVar196._8_4_ + auVar10._8_4_ * auVar152._8_4_;
              auVar204._12_4_ = auVar9._12_4_ * auVar196._12_4_ + auVar10._12_4_ * auVar152._12_4_;
              auVar196 = vsubps_avx(auVar199,auVar204);
              auVar363 = ZEXT1664(auVar196);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar199 = vandps_avx(auVar120,auVar205);
              if (auVar199._0_4_ < fVar273) {
                auVar234._8_4_ = 0x7fffffff;
                auVar234._0_8_ = 0x7fffffff7fffffff;
                auVar234._12_4_ = 0x7fffffff;
                auVar199 = vandps_avx(auVar155,auVar234);
                if (auVar199._0_4_ <
                    (float)local_880._0_4_ * 1.9073486e-06 + auVar194._0_4_ + fVar273) {
                  bVar114 = uVar112 < 5;
                  fVar273 = auVar196._0_4_ + (float)local_8f0._0_4_;
                  if ((fVar223 <= fVar273) &&
                     (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar273 <= fVar175)) {
                    auVar199 = vmovshdup_avx(auVar196);
                    bVar115 = 0;
                    if (0.0 <= auVar199._0_4_) {
                      if (auVar199._0_4_ <= 1.0) {
                        auVar199 = vrsqrtss_avx(auVar252,auVar252);
                        fVar243 = auVar199._0_4_;
                        pGVar18 = (context->scene->geometries).items[uVar110].ptr;
                        if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                          bVar115 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar115 = 1, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0))
                        {
                          auVar199 = ZEXT416((uint)(fVar243 * 1.5 +
                                                   fVar185 * -0.5 * fVar243 * fVar243 * fVar243));
                          auVar199 = vshufps_avx(auVar199,auVar199,0);
                          local_ae0 = auVar227._0_4_;
                          fStack_adc = auVar227._4_4_;
                          fStack_ad8 = auVar227._8_4_;
                          fStack_ad4 = auVar227._12_4_;
                          auVar206._0_4_ = auVar199._0_4_ * local_ae0;
                          auVar206._4_4_ = auVar199._4_4_ * fStack_adc;
                          auVar206._8_4_ = auVar199._8_4_ * fStack_ad8;
                          auVar206._12_4_ = auVar199._12_4_ * fStack_ad4;
                          auVar126._0_4_ = auVar374._0_4_ + auVar11._0_4_ * auVar206._0_4_;
                          auVar126._4_4_ = auVar374._4_4_ + auVar11._4_4_ * auVar206._4_4_;
                          auVar126._8_4_ = auVar374._8_4_ + auVar11._8_4_ * auVar206._8_4_;
                          auVar126._12_4_ = auVar374._12_4_ + auVar11._12_4_ * auVar206._12_4_;
                          auVar199 = vshufps_avx(auVar206,auVar206,0xc9);
                          auVar227 = vshufps_avx(auVar374,auVar374,0xc9);
                          auVar207._0_4_ = auVar227._0_4_ * auVar206._0_4_;
                          auVar207._4_4_ = auVar227._4_4_ * auVar206._4_4_;
                          auVar207._8_4_ = auVar227._8_4_ * auVar206._8_4_;
                          auVar207._12_4_ = auVar227._12_4_ * auVar206._12_4_;
                          auVar235._0_4_ = auVar374._0_4_ * auVar199._0_4_;
                          auVar235._4_4_ = auVar374._4_4_ * auVar199._4_4_;
                          auVar235._8_4_ = auVar374._8_4_ * auVar199._8_4_;
                          auVar235._12_4_ = auVar374._12_4_ * auVar199._12_4_;
                          auVar194 = vsubps_avx(auVar235,auVar207);
                          auVar199 = vshufps_avx(auVar194,auVar194,0xc9);
                          auVar227 = vshufps_avx(auVar126,auVar126,0xc9);
                          auVar236._0_4_ = auVar227._0_4_ * auVar199._0_4_;
                          auVar236._4_4_ = auVar227._4_4_ * auVar199._4_4_;
                          auVar236._8_4_ = auVar227._8_4_ * auVar199._8_4_;
                          auVar236._12_4_ = auVar227._12_4_ * auVar199._12_4_;
                          auVar199 = vshufps_avx(auVar194,auVar194,0xd2);
                          auVar127._0_4_ = auVar126._0_4_ * auVar199._0_4_;
                          auVar127._4_4_ = auVar126._4_4_ * auVar199._4_4_;
                          auVar127._8_4_ = auVar126._8_4_ * auVar199._8_4_;
                          auVar127._12_4_ = auVar126._12_4_ * auVar199._12_4_;
                          auVar199 = vsubps_avx(auVar236,auVar127);
                          local_7f0 = vshufps_avx(auVar196,auVar196,0x55);
                          local_820 = (RTCHitN  [16])vshufps_avx(auVar199,auVar199,0x55);
                          auStack_810 = vshufps_avx(auVar199,auVar199,0xaa);
                          local_800 = vshufps_avx(auVar199,auVar199,0);
                          local_7e0 = ZEXT816(0) << 0x20;
                          local_7d0 = local_840._0_8_;
                          uStack_7c8 = local_840._8_8_;
                          local_7c0 = local_830;
                          vcmpps_avx(ZEXT1632(local_830),ZEXT1632(local_830),0xf);
                          uStack_7ac = context->user->instID[0];
                          local_7b0 = uStack_7ac;
                          uStack_7a8 = uStack_7ac;
                          uStack_7a4 = uStack_7ac;
                          uStack_7a0 = context->user->instPrimID[0];
                          uStack_79c = uStack_7a0;
                          uStack_798 = uStack_7a0;
                          uStack_794 = uStack_7a0;
                          *(float *)(ray + k * 4 + 0x80) = fVar273;
                          local_8e0 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                          local_a70.valid = (int *)local_8e0;
                          local_a70.geometryUserPtr = pGVar18->userPtr;
                          local_a70.context = context->user;
                          local_a70.hit = local_820;
                          local_a70.N = 4;
                          local_a70.ray = (RTCRayN *)ray;
                          if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar330 = ZEXT1664(auVar252);
                            auVar363 = ZEXT1664(auVar196);
                            (*pGVar18->occlusionFilterN)(&local_a70);
                          }
                          if (local_8e0 == (undefined1  [16])0x0) {
                            auVar199 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                            auVar199 = auVar199 ^ _DAT_01f46b70;
                          }
                          else {
                            p_Var22 = context->args->filter;
                            if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar330 = ZEXT1664(auVar330._0_16_);
                              auVar363 = ZEXT1664(auVar363._0_16_);
                              (*p_Var22)(&local_a70);
                            }
                            auVar252 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                            auVar199 = auVar252 ^ _DAT_01f46b70;
                            auVar208._8_4_ = 0xff800000;
                            auVar208._0_8_ = 0xff800000ff800000;
                            auVar208._12_4_ = 0xff800000;
                            auVar252 = vblendvps_avx(auVar208,*(undefined1 (*) [16])
                                                               (local_a70.ray + 0x80),auVar252);
                            *(undefined1 (*) [16])(local_a70.ray + 0x80) = auVar252;
                          }
                          auVar159._8_8_ = 0x100000001;
                          auVar159._0_8_ = 0x100000001;
                          bVar115 = (auVar159 & auVar199) != (undefined1  [16])0x0;
                          if (!(bool)bVar115) {
                            *(float *)(ray + k * 4 + 0x80) = fVar175;
                          }
                        }
                      }
                      goto LAB_00b38619;
                    }
                  }
                  bVar115 = 0;
                  goto LAB_00b38619;
                }
              }
              uVar112 = uVar112 + 1;
            }
            bVar114 = false;
LAB_00b38619:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar135._4_4_ = uVar8;
            auVar135._0_4_ = uVar8;
            auVar135._8_4_ = uVar8;
            auVar135._12_4_ = uVar8;
            auVar135._16_4_ = uVar8;
            auVar135._20_4_ = uVar8;
            auVar135._24_4_ = uVar8;
            auVar135._28_4_ = uVar8;
            bVar113 = bVar113 | bVar114 & bVar115;
            auVar23 = vcmpps_avx(_local_b40,auVar135,2);
          }
          auVar23 = vandps_avx(local_6a0,local_680);
          auVar128 = vandps_avx(auVar128,_local_8a0);
          auVar215._0_4_ = (float)local_940._0_4_ + local_4a0._0_4_;
          auVar215._4_4_ = (float)local_940._4_4_ + local_4a0._4_4_;
          auVar215._8_4_ = fStack_938 + local_4a0._8_4_;
          auVar215._12_4_ = fStack_934 + local_4a0._12_4_;
          auVar215._16_4_ = fStack_930 + local_4a0._16_4_;
          auVar215._20_4_ = fStack_92c + local_4a0._20_4_;
          auVar215._24_4_ = fStack_928 + local_4a0._24_4_;
          auVar215._28_4_ = fStack_924 + local_4a0._28_4_;
          auVar199 = vshufps_avx(auVar135._0_16_,auVar135._0_16_,0);
          auVar263._16_16_ = auVar199;
          auVar263._0_16_ = auVar199;
          auVar24 = vcmpps_avx(auVar215,auVar263,2);
          auVar23 = vandps_avx(auVar24,auVar23);
          auVar284._0_4_ = (float)local_940._0_4_ + local_460._0_4_;
          auVar284._4_4_ = (float)local_940._4_4_ + local_460._4_4_;
          auVar284._8_4_ = fStack_938 + local_460._8_4_;
          auVar284._12_4_ = fStack_934 + local_460._12_4_;
          auVar284._16_4_ = fStack_930 + local_460._16_4_;
          auVar284._20_4_ = fStack_92c + local_460._20_4_;
          auVar284._24_4_ = fStack_928 + local_460._24_4_;
          auVar284._28_4_ = fStack_924 + local_460._28_4_;
          auVar24 = vcmpps_avx(auVar284,auVar263,2);
          auVar265 = ZEXT3264(auVar24);
          auVar128 = vandps_avx(auVar24,auVar128);
          auVar128 = vorps_avx(auVar23,auVar128);
          fVar147 = (float)local_940._0_4_;
          fVar178 = (float)local_940._4_4_;
          fVar181 = fStack_938;
          fVar184 = fStack_934;
          fVar187 = fStack_930;
          fVar189 = fStack_92c;
          fVar191 = fStack_928;
          fVar292 = fStack_924;
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            uVar112 = (ulong)uVar108;
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar128;
            auVar128 = vblendvps_avx(_local_460,_local_4a0,auVar23);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar128;
            uVar106 = vmovlps_avx(local_650);
            (&uStack_140)[uVar112 * 0xc] = uVar106;
            auStack_138[uVar112 * 0x18] = local_c88 + 1;
            uVar108 = uVar108 + 1;
          }
        }
      }
    }
    do {
      uVar109 = uVar108;
      if (uVar109 == 0) {
        if (bVar113 != 0) goto LAB_00b38b2b;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar143._4_4_ = uVar8;
        auVar143._0_4_ = uVar8;
        auVar143._8_4_ = uVar8;
        auVar143._12_4_ = uVar8;
        auVar143._16_4_ = uVar8;
        auVar143._20_4_ = uVar8;
        auVar143._24_4_ = uVar8;
        auVar143._28_4_ = uVar8;
        auVar128 = vcmpps_avx(local_380,auVar143,2);
        uVar110 = vmovmskps_avx(auVar128);
        uVar110 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar110;
        goto LAB_00b35e02;
      }
      uVar106 = (ulong)(uVar109 - 1);
      lVar107 = uVar106 * 0x60;
      auVar128 = *(undefined1 (*) [32])(auStack_160 + lVar107);
      auVar138._0_4_ = fVar147 + auVar128._0_4_;
      auVar138._4_4_ = fVar178 + auVar128._4_4_;
      auVar138._8_4_ = fVar181 + auVar128._8_4_;
      auVar138._12_4_ = fVar184 + auVar128._12_4_;
      auVar138._16_4_ = fVar187 + auVar128._16_4_;
      auVar138._20_4_ = fVar189 + auVar128._20_4_;
      auVar138._24_4_ = fVar191 + auVar128._24_4_;
      auVar138._28_4_ = fVar292 + auVar128._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar241._4_4_ = uVar8;
      auVar241._0_4_ = uVar8;
      auVar241._8_4_ = uVar8;
      auVar241._12_4_ = uVar8;
      auVar241._16_4_ = uVar8;
      auVar241._20_4_ = uVar8;
      auVar241._24_4_ = uVar8;
      auVar241._28_4_ = uVar8;
      auVar23 = vcmpps_avx(auVar138,auVar241,2);
      _local_820 = vandps_avx(auVar23,*(undefined1 (*) [32])(auStack_180 + lVar107));
      auVar23 = *(undefined1 (*) [32])(auStack_180 + lVar107) & auVar23;
      uVar108 = uVar109 - 1;
    } while ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar23 >> 0x7f,0) == '\0') &&
               (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar23 >> 0xbf,0) == '\0') &&
             (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar23[0x1f]);
    auVar212._8_4_ = 0x7f800000;
    auVar212._0_8_ = 0x7f8000007f800000;
    auVar212._12_4_ = 0x7f800000;
    auVar212._16_4_ = 0x7f800000;
    auVar212._20_4_ = 0x7f800000;
    auVar212._24_4_ = 0x7f800000;
    auVar212._28_4_ = 0x7f800000;
    auVar128 = vblendvps_avx(auVar212,auVar128,_local_820);
    auVar23 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar23 = vminps_avx(auVar128,auVar23);
    auVar24 = vshufpd_avx(auVar23,auVar23,5);
    auVar23 = vminps_avx(auVar23,auVar24);
    auVar24 = vperm2f128_avx(auVar23,auVar23,1);
    auVar23 = vminps_avx(auVar23,auVar24);
    auVar23 = vcmpps_avx(auVar128,auVar23,0);
    auVar24 = _local_820 & auVar23;
    auVar128 = _local_820;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar128 = vandps_avx(auVar23,_local_820);
    }
    auVar151._8_8_ = 0;
    auVar151._0_8_ = (&uStack_140)[uVar106 * 0xc];
    local_c88 = auStack_138[uVar106 * 0x18];
    uVar108 = vmovmskps_avx(auVar128);
    uVar105 = 0;
    if (uVar108 != 0) {
      for (; (uVar108 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
      }
    }
    *(undefined4 *)(local_820 + (ulong)uVar105 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar107) = _local_820;
    uVar108 = uVar109 - 1;
    if ((((((((_local_820 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_820 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_820 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_820 >> 0x7f,0) != '\0') ||
          (_local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_820 >> 0xbf,0) != '\0') ||
        (_local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_820[0x1f] < '\0') {
      uVar108 = uVar109;
    }
    auVar199 = vshufps_avx(auVar151,auVar151,0);
    auVar252 = vshufps_avx(auVar151,auVar151,0x55);
    auVar252 = vsubps_avx(auVar252,auVar199);
    local_4a0._4_4_ = auVar199._4_4_ + auVar252._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar199._0_4_ + auVar252._0_4_ * 0.0;
    fStack_498 = auVar199._8_4_ + auVar252._8_4_ * 0.2857143;
    fStack_494 = auVar199._12_4_ + auVar252._12_4_ * 0.42857146;
    fStack_490 = auVar199._0_4_ + auVar252._0_4_ * 0.5714286;
    fStack_48c = auVar199._4_4_ + auVar252._4_4_ * 0.71428573;
    fStack_488 = auVar199._8_4_ + auVar252._8_4_ * 0.8571429;
    fStack_484 = auVar199._12_4_ + auVar252._12_4_;
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar105 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }